

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersector1<4>::
     intersect_h<embree::avx::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [28];
  undefined8 uVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  Primitive PVar12;
  __int_type_conflict _Var13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [28];
  undefined1 auVar111 [28];
  undefined1 auVar112 [28];
  undefined1 auVar113 [28];
  undefined1 auVar114 [24];
  uint uVar115;
  uint uVar116;
  ulong uVar117;
  ulong uVar118;
  uint uVar119;
  long lVar120;
  long lVar121;
  RayHit *pRVar122;
  uint uVar123;
  Geometry *pGVar124;
  long lVar125;
  undefined4 uVar126;
  undefined8 unaff_R13;
  long lVar127;
  float fVar128;
  float fVar129;
  float fVar149;
  float fVar151;
  vint4 bi_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar153;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar150;
  float fVar152;
  float fVar154;
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar155;
  float fVar157;
  float fVar160;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar161;
  float fVar175;
  float fVar177;
  vint4 bi_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar162;
  float fVar176;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar182;
  float fVar184;
  float fVar185;
  float fVar187;
  undefined1 auVar166 [32];
  float fVar181;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar188;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar183;
  float fVar186;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar189;
  float fVar204;
  float fVar207;
  vint4 bi;
  float fVar210;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar190;
  float fVar191;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar218 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar205;
  float fVar208;
  float fVar211;
  undefined1 auVar201 [32];
  float fVar206;
  float fVar209;
  float fVar212;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar213;
  float fVar222;
  float fVar224;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar226;
  undefined1 auVar217 [16];
  float fVar214;
  float fVar223;
  float fVar225;
  float fVar227;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar228;
  float fVar238;
  float fVar239;
  vint4 ai_1;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  undefined1 auVar233 [16];
  float fVar241;
  float fVar242;
  float fVar244;
  float fVar245;
  undefined1 auVar235 [32];
  float fVar240;
  float fVar243;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar246;
  float fVar255;
  float fVar256;
  vint4 ai_2;
  undefined1 auVar247 [16];
  float fVar257;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar258;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [64];
  float fVar259;
  float fVar260;
  float fVar264;
  float fVar266;
  undefined1 auVar261 [16];
  float fVar265;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar262 [32];
  float fVar271;
  undefined1 auVar263 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  float fVar278;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float fVar288;
  vint4 ai;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar289;
  undefined1 auVar286 [32];
  float fVar293;
  float fVar300;
  float fVar301;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar303;
  undefined1 auVar296 [32];
  float fVar302;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar309;
  float fVar311;
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar310 [12];
  undefined1 auVar308 [64];
  float fVar312;
  float fVar314;
  float fVar315;
  undefined1 auVar313 [16];
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [64];
  float fVar328;
  float fVar333;
  undefined1 auVar329 [16];
  float fVar334;
  float fVar335;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  float fVar336;
  float fVar342;
  float fVar343;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  float fVar348;
  float fVar353;
  undefined1 auVar349 [16];
  float fVar354;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_7b4;
  RayHit *local_7b0;
  ulong local_7a8;
  uint local_79c;
  ulong local_798;
  undefined1 local_790 [8];
  undefined8 uStack_788;
  Primitive *local_780;
  Precalculations *local_778;
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5b0;
  undefined4 local_5a8;
  float local_5a4;
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  uint local_594;
  uint local_590;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [2] [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 auStack_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [8];
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_230 [16];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  uint local_1c0;
  uint local_1bc;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_140 [4];
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar232 [16];
  undefined1 auVar287 [64];
  undefined1 auVar299 [64];
  undefined1 auVar330 [16];
  undefined1 auVar350 [16];
  
  PVar12 = prim[1];
  uVar117 = (ulong)(byte)PVar12;
  auVar250 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 4 + 6)));
  local_778 = pre;
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 5 + 6)));
  lVar120 = uVar117 * 0x25;
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 6 + 6)));
  auVar279 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 0xf + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar12 * 0x10 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 0x11 + 6)));
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 0x1a + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 0x1b + 6)));
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar117 * 0x1c + 6)));
  fVar128 = *(float *)(prim + lVar120 + 0x12);
  auVar218 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar120 + 6));
  auVar337._0_4_ = fVar128 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar337._4_4_ = fVar128 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar337._8_4_ = fVar128 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar337._12_4_ = fVar128 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar229._0_4_ = auVar218._0_4_ * fVar128;
  auVar229._4_4_ = auVar218._4_4_ * fVar128;
  auVar229._8_4_ = auVar218._8_4_ * fVar128;
  auVar229._12_4_ = auVar218._12_4_ * fVar128;
  auVar218 = vcvtdq2ps_avx(auVar250);
  auVar17 = vcvtdq2ps_avx(auVar197);
  auVar18 = vcvtdq2ps_avx(auVar234);
  auVar19 = vcvtdq2ps_avx(auVar279);
  auVar20 = vcvtdq2ps_avx(auVar22);
  auVar21 = vcvtdq2ps_avx(auVar23);
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar250 = vshufps_avx(auVar337,auVar337,0);
  auVar197 = vshufps_avx(auVar337,auVar337,0x55);
  auVar234 = vshufps_avx(auVar337,auVar337,0xaa);
  fVar128 = auVar234._0_4_;
  fVar151 = auVar234._4_4_;
  fVar189 = auVar234._8_4_;
  fVar207 = auVar234._12_4_;
  fVar149 = auVar197._0_4_;
  fVar153 = auVar197._4_4_;
  fVar204 = auVar197._8_4_;
  fVar210 = auVar197._12_4_;
  fVar213 = auVar250._0_4_;
  fVar222 = auVar250._4_4_;
  fVar224 = auVar250._8_4_;
  fVar226 = auVar250._12_4_;
  auVar272._0_4_ = auVar17._0_4_ * fVar149 + auVar18._0_4_ * fVar128 + fVar213 * auVar218._0_4_;
  auVar272._4_4_ = auVar17._4_4_ * fVar153 + auVar18._4_4_ * fVar151 + fVar222 * auVar218._4_4_;
  auVar272._8_4_ = auVar17._8_4_ * fVar204 + auVar18._8_4_ * fVar189 + fVar224 * auVar218._8_4_;
  auVar272._12_4_ = auVar17._12_4_ * fVar210 + auVar18._12_4_ * fVar207 + fVar226 * auVar218._12_4_;
  auVar329._0_4_ = fVar213 * auVar19._0_4_ + auVar20._0_4_ * fVar149 + auVar21._0_4_ * fVar128;
  auVar329._4_4_ = fVar222 * auVar19._4_4_ + auVar20._4_4_ * fVar153 + auVar21._4_4_ * fVar151;
  auVar329._8_4_ = fVar224 * auVar19._8_4_ + auVar20._8_4_ * fVar204 + auVar21._8_4_ * fVar189;
  auVar329._12_4_ = fVar226 * auVar19._12_4_ + auVar20._12_4_ * fVar210 + auVar21._12_4_ * fVar207;
  auVar215._0_4_ = fVar213 * auVar131._0_4_ + fVar149 * auVar132._0_4_ + auVar164._0_4_ * fVar128;
  auVar215._4_4_ = fVar222 * auVar131._4_4_ + fVar153 * auVar132._4_4_ + auVar164._4_4_ * fVar151;
  auVar215._8_4_ = fVar224 * auVar131._8_4_ + fVar204 * auVar132._8_4_ + auVar164._8_4_ * fVar189;
  auVar215._12_4_ =
       fVar226 * auVar131._12_4_ + fVar210 * auVar132._12_4_ + auVar164._12_4_ * fVar207;
  auVar349._8_4_ = 0x7fffffff;
  auVar349._0_8_ = 0x7fffffff7fffffff;
  auVar349._12_4_ = 0x7fffffff;
  auVar250 = vandps_avx(auVar349,auVar272);
  auVar338._8_4_ = 0x219392ef;
  auVar338._0_8_ = 0x219392ef219392ef;
  auVar338._12_4_ = 0x219392ef;
  auVar250 = vcmpps_avx(auVar250,auVar338,1);
  auVar279 = vblendvps_avx(auVar272,auVar338,auVar250);
  auVar250 = vandps_avx(auVar329,auVar349);
  auVar250 = vcmpps_avx(auVar250,auVar338,1);
  auVar22 = vblendvps_avx(auVar329,auVar338,auVar250);
  auVar250 = vandps_avx(auVar349,auVar215);
  auVar250 = vcmpps_avx(auVar250,auVar338,1);
  auVar23 = vblendvps_avx(auVar215,auVar338,auVar250);
  auVar250 = vshufps_avx(auVar229,auVar229,0x55);
  auVar197 = vshufps_avx(auVar229,auVar229,0xaa);
  fVar128 = auVar197._0_4_;
  fVar149 = auVar197._4_4_;
  fVar151 = auVar197._8_4_;
  fVar153 = auVar197._12_4_;
  fVar189 = auVar250._0_4_;
  fVar204 = auVar250._4_4_;
  fVar207 = auVar250._8_4_;
  fVar210 = auVar250._12_4_;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = *(ulong *)(prim + uVar117 * 7 + 6);
  auVar250 = vpmovsxwd_avx(auVar250);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar117 * 0xb + 6);
  auVar197 = vpmovsxwd_avx(auVar197);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar117 * 9 + 6);
  auVar234 = vpmovsxwd_avx(auVar234);
  auVar130 = vshufps_avx(auVar229,auVar229,0);
  fVar213 = auVar130._0_4_;
  fVar222 = auVar130._4_4_;
  fVar224 = auVar130._8_4_;
  fVar226 = auVar130._12_4_;
  auVar230._0_4_ = fVar189 * auVar17._0_4_ + fVar128 * auVar18._0_4_ + fVar213 * auVar218._0_4_;
  auVar230._4_4_ = fVar204 * auVar17._4_4_ + fVar149 * auVar18._4_4_ + fVar222 * auVar218._4_4_;
  auVar230._8_4_ = fVar207 * auVar17._8_4_ + fVar151 * auVar18._8_4_ + fVar224 * auVar218._8_4_;
  auVar230._12_4_ = fVar210 * auVar17._12_4_ + fVar153 * auVar18._12_4_ + fVar226 * auVar218._12_4_;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + uVar117 * 0xd + 6);
  auVar218 = vpmovsxwd_avx(auVar218);
  auVar163._0_4_ = fVar189 * auVar20._0_4_ + fVar128 * auVar21._0_4_ + fVar213 * auVar19._0_4_;
  auVar163._4_4_ = fVar204 * auVar20._4_4_ + fVar149 * auVar21._4_4_ + fVar222 * auVar19._4_4_;
  auVar163._8_4_ = fVar207 * auVar20._8_4_ + fVar151 * auVar21._8_4_ + fVar224 * auVar19._8_4_;
  auVar163._12_4_ = fVar210 * auVar20._12_4_ + fVar153 * auVar21._12_4_ + fVar226 * auVar19._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar117 * 0x12 + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar130._0_4_ = fVar128 * auVar164._0_4_ + fVar189 * auVar132._0_4_ + fVar213 * auVar131._0_4_;
  auVar130._4_4_ = fVar149 * auVar164._4_4_ + fVar204 * auVar132._4_4_ + fVar222 * auVar131._4_4_;
  auVar130._8_4_ = fVar151 * auVar164._8_4_ + fVar207 * auVar132._8_4_ + fVar224 * auVar131._8_4_;
  auVar130._12_4_ =
       fVar153 * auVar164._12_4_ + fVar210 * auVar132._12_4_ + fVar226 * auVar131._12_4_;
  auVar18 = vrcpps_avx(auVar279);
  fVar189 = auVar18._0_4_;
  auVar273._0_4_ = fVar189 * auVar279._0_4_;
  fVar204 = auVar18._4_4_;
  auVar273._4_4_ = fVar204 * auVar279._4_4_;
  fVar207 = auVar18._8_4_;
  auVar273._8_4_ = fVar207 * auVar279._8_4_;
  fVar210 = auVar18._12_4_;
  auVar273._12_4_ = fVar210 * auVar279._12_4_;
  auVar339._8_4_ = 0x3f800000;
  auVar339._0_8_ = 0x3f8000003f800000;
  auVar339._12_4_ = 0x3f800000;
  auVar279 = vsubps_avx(auVar339,auVar273);
  fVar189 = fVar189 + fVar189 * auVar279._0_4_;
  fVar204 = fVar204 + fVar204 * auVar279._4_4_;
  fVar207 = fVar207 + fVar207 * auVar279._8_4_;
  fVar210 = fVar210 + fVar210 * auVar279._12_4_;
  auVar279 = vrcpps_avx(auVar22);
  fVar246 = auVar279._0_4_;
  auVar247._0_4_ = fVar246 * auVar22._0_4_;
  fVar255 = auVar279._4_4_;
  auVar247._4_4_ = fVar255 * auVar22._4_4_;
  fVar256 = auVar279._8_4_;
  auVar247._8_4_ = fVar256 * auVar22._8_4_;
  fVar257 = auVar279._12_4_;
  auVar247._12_4_ = fVar257 * auVar22._12_4_;
  auVar279 = vsubps_avx(auVar339,auVar247);
  fVar246 = fVar246 + fVar246 * auVar279._0_4_;
  fVar255 = fVar255 + fVar255 * auVar279._4_4_;
  fVar256 = fVar256 + fVar256 * auVar279._8_4_;
  fVar257 = fVar257 + fVar257 * auVar279._12_4_;
  auVar279 = vrcpps_avx(auVar23);
  fVar213 = auVar279._0_4_;
  auVar216._0_4_ = fVar213 * auVar23._0_4_;
  fVar222 = auVar279._4_4_;
  auVar216._4_4_ = fVar222 * auVar23._4_4_;
  fVar224 = auVar279._8_4_;
  auVar216._8_4_ = fVar224 * auVar23._8_4_;
  fVar226 = auVar279._12_4_;
  auVar216._12_4_ = fVar226 * auVar23._12_4_;
  auVar279 = vsubps_avx(auVar339,auVar216);
  fVar213 = fVar213 + fVar213 * auVar279._0_4_;
  fVar222 = fVar222 + fVar222 * auVar279._4_4_;
  fVar224 = fVar224 + fVar224 * auVar279._8_4_;
  fVar226 = fVar226 + fVar226 * auVar279._12_4_;
  auVar279 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar120 + 0x16)) * *(float *)(prim + lVar120 + 0x1a)))
  ;
  auVar279 = vshufps_avx(auVar279,auVar279,0);
  auVar250 = vcvtdq2ps_avx(auVar250);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar197 = vsubps_avx(auVar197,auVar250);
  fVar128 = auVar279._0_4_;
  fVar149 = auVar279._4_4_;
  fVar151 = auVar279._8_4_;
  fVar153 = auVar279._12_4_;
  auVar280._0_4_ = auVar197._0_4_ * fVar128 + auVar250._0_4_;
  auVar280._4_4_ = auVar197._4_4_ * fVar149 + auVar250._4_4_;
  auVar280._8_4_ = auVar197._8_4_ * fVar151 + auVar250._8_4_;
  auVar280._12_4_ = auVar197._12_4_ * fVar153 + auVar250._12_4_;
  auVar250 = vcvtdq2ps_avx(auVar234);
  auVar197 = vcvtdq2ps_avx(auVar218);
  auVar197 = vsubps_avx(auVar197,auVar250);
  auVar294._0_4_ = auVar197._0_4_ * fVar128 + auVar250._0_4_;
  auVar294._4_4_ = auVar197._4_4_ * fVar149 + auVar250._4_4_;
  auVar294._8_4_ = auVar197._8_4_ * fVar151 + auVar250._8_4_;
  auVar294._12_4_ = auVar197._12_4_ * fVar153 + auVar250._12_4_;
  auVar250 = vcvtdq2ps_avx(auVar17);
  auVar279._8_8_ = 0;
  auVar279._0_8_ = *(ulong *)(prim + uVar117 * 0x16 + 6);
  auVar197 = vpmovsxwd_avx(auVar279);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar234 = vsubps_avx(auVar197,auVar250);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar117 * 0x14 + 6);
  auVar197 = vpmovsxwd_avx(auVar22);
  auVar304._0_4_ = auVar234._0_4_ * fVar128 + auVar250._0_4_;
  auVar304._4_4_ = auVar234._4_4_ * fVar149 + auVar250._4_4_;
  auVar304._8_4_ = auVar234._8_4_ * fVar151 + auVar250._8_4_;
  auVar304._12_4_ = auVar234._12_4_ * fVar153 + auVar250._12_4_;
  auVar250 = vcvtdq2ps_avx(auVar197);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar117 * 0x18 + 6);
  auVar197 = vpmovsxwd_avx(auVar23);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar197 = vsubps_avx(auVar197,auVar250);
  auVar313._0_4_ = auVar197._0_4_ * fVar128 + auVar250._0_4_;
  auVar313._4_4_ = auVar197._4_4_ * fVar149 + auVar250._4_4_;
  auVar313._8_4_ = auVar197._8_4_ * fVar151 + auVar250._8_4_;
  auVar313._12_4_ = auVar197._12_4_ * fVar153 + auVar250._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar117 * 0x1d + 6);
  auVar250 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar117 * 0x21 + 6);
  auVar197 = vpmovsxwd_avx(auVar19);
  auVar250 = vcvtdq2ps_avx(auVar250);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar197 = vsubps_avx(auVar197,auVar250);
  auVar320._0_4_ = auVar197._0_4_ * fVar128 + auVar250._0_4_;
  auVar320._4_4_ = auVar197._4_4_ * fVar149 + auVar250._4_4_;
  auVar320._8_4_ = auVar197._8_4_ * fVar151 + auVar250._8_4_;
  auVar320._12_4_ = auVar197._12_4_ * fVar153 + auVar250._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar117 * 0x1f + 6);
  auVar250 = vpmovsxwd_avx(auVar20);
  auVar250 = vcvtdq2ps_avx(auVar250);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar117 * 0x23 + 6);
  auVar197 = vpmovsxwd_avx(auVar21);
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar197 = vsubps_avx(auVar197,auVar250);
  auVar274._0_4_ = auVar250._0_4_ + auVar197._0_4_ * fVar128;
  auVar274._4_4_ = auVar250._4_4_ + auVar197._4_4_ * fVar149;
  auVar274._8_4_ = auVar250._8_4_ + auVar197._8_4_ * fVar151;
  auVar274._12_4_ = auVar250._12_4_ + auVar197._12_4_ * fVar153;
  auVar250 = vsubps_avx(auVar280,auVar230);
  auVar281._0_4_ = auVar250._0_4_ * fVar189;
  auVar281._4_4_ = auVar250._4_4_ * fVar204;
  auVar281._8_4_ = auVar250._8_4_ * fVar207;
  auVar281._12_4_ = auVar250._12_4_ * fVar210;
  auVar287 = ZEXT1664(auVar281);
  auVar250 = vsubps_avx(auVar294,auVar230);
  auVar192._0_4_ = fVar189 * auVar250._0_4_;
  auVar192._4_4_ = fVar204 * auVar250._4_4_;
  auVar192._8_4_ = fVar207 * auVar250._8_4_;
  auVar192._12_4_ = fVar210 * auVar250._12_4_;
  auVar250 = vsubps_avx(auVar304,auVar163);
  auVar231._0_4_ = fVar246 * auVar250._0_4_;
  auVar231._4_4_ = fVar255 * auVar250._4_4_;
  auVar231._8_4_ = fVar256 * auVar250._8_4_;
  auVar231._12_4_ = fVar257 * auVar250._12_4_;
  auVar250 = vsubps_avx(auVar313,auVar163);
  auVar164._0_4_ = fVar246 * auVar250._0_4_;
  auVar164._4_4_ = fVar255 * auVar250._4_4_;
  auVar164._8_4_ = fVar256 * auVar250._8_4_;
  auVar164._12_4_ = fVar257 * auVar250._12_4_;
  auVar250 = vsubps_avx(auVar320,auVar130);
  auVar248._0_4_ = fVar213 * auVar250._0_4_;
  auVar248._4_4_ = fVar222 * auVar250._4_4_;
  auVar248._8_4_ = fVar224 * auVar250._8_4_;
  auVar248._12_4_ = fVar226 * auVar250._12_4_;
  auVar250 = vsubps_avx(auVar274,auVar130);
  auVar131._0_4_ = fVar213 * auVar250._0_4_;
  auVar131._4_4_ = fVar222 * auVar250._4_4_;
  auVar131._8_4_ = fVar224 * auVar250._8_4_;
  auVar131._12_4_ = fVar226 * auVar250._12_4_;
  auVar250 = vpminsd_avx(auVar281,auVar192);
  auVar197 = vpminsd_avx(auVar231,auVar164);
  auVar250 = vmaxps_avx(auVar250,auVar197);
  auVar197 = vpminsd_avx(auVar248,auVar131);
  uVar126 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar295._4_4_ = uVar126;
  auVar295._0_4_ = uVar126;
  auVar295._8_4_ = uVar126;
  auVar295._12_4_ = uVar126;
  auVar299 = ZEXT1664(auVar295);
  auVar197 = vmaxps_avx(auVar197,auVar295);
  auVar250 = vmaxps_avx(auVar250,auVar197);
  local_230._0_4_ = auVar250._0_4_ * 0.99999964;
  local_230._4_4_ = auVar250._4_4_ * 0.99999964;
  local_230._8_4_ = auVar250._8_4_ * 0.99999964;
  local_230._12_4_ = auVar250._12_4_ * 0.99999964;
  auVar250 = vpmaxsd_avx(auVar281,auVar192);
  auVar197 = vpmaxsd_avx(auVar231,auVar164);
  auVar250 = vminps_avx(auVar250,auVar197);
  auVar197 = vpmaxsd_avx(auVar248,auVar131);
  fVar128 = (ray->super_RayK<1>).tfar;
  auVar193._4_4_ = fVar128;
  auVar193._0_4_ = fVar128;
  auVar193._8_4_ = fVar128;
  auVar193._12_4_ = fVar128;
  auVar197 = vminps_avx(auVar197,auVar193);
  auVar250 = vminps_avx(auVar250,auVar197);
  auVar132._0_4_ = auVar250._0_4_ * 1.0000004;
  auVar132._4_4_ = auVar250._4_4_ * 1.0000004;
  auVar132._8_4_ = auVar250._8_4_ * 1.0000004;
  auVar132._12_4_ = auVar250._12_4_ * 1.0000004;
  auVar250 = vpshufd_avx(ZEXT116((byte)PVar12),0);
  auVar197 = vpcmpgtd_avx(auVar250,_DAT_01f4ad30);
  auVar250 = vcmpps_avx(local_230,auVar132,2);
  auVar250 = vandps_avx(auVar250,auVar197);
  local_460[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_460[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_460[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_460[1]._24_8_ = mm_lookupmask_ps._24_8_;
  uVar126 = vmovmskps_avx(auVar250);
  uVar117 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar126);
  local_780 = prim;
  local_7b0 = ray;
  do {
    if (uVar117 == 0) {
      return;
    }
    local_6a0 = auVar299._0_32_;
    local_700 = auVar287._0_32_;
    lVar120 = 0;
    if (uVar117 != 0) {
      for (; (uVar117 >> lVar120 & 1) == 0; lVar120 = lVar120 + 1) {
      }
    }
    uVar119 = *(uint *)(prim + 2);
    uVar116 = *(uint *)(prim + lVar120 * 4 + 6);
    local_7a8 = (ulong)uVar119;
    pGVar124 = (context->scene->geometries).items[uVar119].ptr;
    local_798 = (ulong)uVar116;
    uVar118 = (ulong)*(uint *)(*(long *)&pGVar124->field_0x58 +
                              (ulong)uVar116 *
                              pGVar124[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar128 = (pGVar124->time_range).lower;
    fVar128 = pGVar124->fnumTimeSegments *
              (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar128) /
              ((pGVar124->time_range).upper - fVar128));
    auVar250 = vroundss_avx(ZEXT416((uint)fVar128),ZEXT416((uint)fVar128),9);
    auVar250 = vminss_avx(auVar250,ZEXT416((uint)(pGVar124->fnumTimeSegments + -1.0)));
    auVar250 = vmaxss_avx(ZEXT816(0) << 0x20,auVar250);
    fVar128 = fVar128 - auVar250._0_4_;
    _Var13 = pGVar124[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar125 = (long)(int)auVar250._0_4_ * 0x38;
    lVar127 = *(long *)(_Var13 + 0x10 + lVar125);
    lVar121 = *(long *)(_Var13 + 0x38 + lVar125);
    lVar14 = *(long *)(_Var13 + 0x48 + lVar125);
    auVar250 = vshufps_avx(ZEXT416((uint)fVar128),ZEXT416((uint)fVar128),0);
    pfVar1 = (float *)(lVar121 + lVar14 * uVar118);
    fVar189 = auVar250._0_4_;
    fVar204 = auVar250._4_4_;
    fVar207 = auVar250._8_4_;
    fVar210 = auVar250._12_4_;
    lVar120 = uVar118 + 1;
    pfVar2 = (float *)(lVar121 + lVar14 * lVar120);
    p_Var15 = pGVar124[4].occlusionFilterN;
    auVar250 = vshufps_avx(ZEXT416((uint)(1.0 - fVar128)),ZEXT416((uint)(1.0 - fVar128)),0);
    pfVar3 = (float *)(*(long *)(_Var13 + lVar125) + lVar127 * uVar118);
    fVar128 = auVar250._0_4_;
    fVar149 = auVar250._4_4_;
    fVar151 = auVar250._8_4_;
    fVar153 = auVar250._12_4_;
    pfVar4 = (float *)(*(long *)(_Var13 + lVar125) + lVar127 * lVar120);
    pfVar5 = (float *)(*(long *)(p_Var15 + lVar125 + 0x38) +
                      uVar118 * *(long *)(p_Var15 + lVar125 + 0x48));
    pfVar6 = (float *)(*(long *)(p_Var15 + lVar125 + 0x38) +
                      *(long *)(p_Var15 + lVar125 + 0x48) * lVar120);
    pfVar7 = (float *)(*(long *)(p_Var15 + lVar125) + *(long *)(p_Var15 + lVar125 + 0x10) * uVar118)
    ;
    fVar228 = fVar128 * *pfVar3 + fVar189 * *pfVar1;
    fVar238 = fVar149 * pfVar3[1] + fVar204 * pfVar1[1];
    auVar232._0_8_ = CONCAT44(fVar238,fVar228);
    auVar232._8_4_ = fVar151 * pfVar3[2] + fVar207 * pfVar1[2];
    auVar232._12_4_ = fVar153 * pfVar3[3] + fVar210 * pfVar1[3];
    pfVar1 = (float *)(*(long *)(p_Var15 + lVar125) + *(long *)(p_Var15 + lVar125 + 0x10) * lVar120)
    ;
    fVar328 = fVar128 * *pfVar4 + fVar189 * *pfVar2;
    fVar333 = fVar149 * pfVar4[1] + fVar204 * pfVar2[1];
    auVar330._0_8_ = CONCAT44(fVar333,fVar328);
    auVar330._8_4_ = fVar151 * pfVar4[2] + fVar207 * pfVar2[2];
    auVar330._12_4_ = fVar153 * pfVar4[3] + fVar210 * pfVar2[3];
    uVar123 = (uint)pGVar124[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar348 = fVar228 + (fVar128 * *pfVar7 + fVar189 * *pfVar5) * 0.33333334;
    fVar353 = fVar238 + (fVar149 * pfVar7[1] + fVar204 * pfVar5[1]) * 0.33333334;
    auVar350._0_8_ = CONCAT44(fVar353,fVar348);
    auVar350._8_4_ = auVar232._8_4_ + (fVar151 * pfVar7[2] + fVar207 * pfVar5[2]) * 0.33333334;
    auVar350._12_4_ = auVar232._12_4_ + (fVar153 * pfVar7[3] + fVar210 * pfVar5[3]) * 0.33333334;
    auVar133._0_4_ = (fVar128 * *pfVar1 + fVar189 * *pfVar6) * 0.33333334;
    auVar133._4_4_ = (fVar149 * pfVar1[1] + fVar204 * pfVar6[1]) * 0.33333334;
    auVar133._8_4_ = (fVar151 * pfVar1[2] + fVar207 * pfVar6[2]) * 0.33333334;
    auVar133._12_4_ = (fVar153 * pfVar1[3] + fVar210 * pfVar6[3]) * 0.33333334;
    _local_6d0 = vsubps_avx(auVar330,auVar133);
    aVar11 = (local_7b0->super_RayK<1>).org.field_0;
    auVar234 = vsubps_avx(auVar232,(undefined1  [16])aVar11);
    _local_790 = auVar232;
    auVar22 = _local_790;
    auVar250 = vshufps_avx(auVar234,auVar234,0);
    auVar197 = vshufps_avx(auVar234,auVar234,0x55);
    auVar234 = vshufps_avx(auVar234,auVar234,0xaa);
    fVar128 = (local_778->ray_space).vx.field_0.m128[0];
    fVar149 = (local_778->ray_space).vx.field_0.m128[1];
    fVar151 = (local_778->ray_space).vx.field_0.m128[2];
    fVar153 = (local_778->ray_space).vx.field_0.m128[3];
    fVar189 = (local_778->ray_space).vy.field_0.m128[0];
    fVar204 = (local_778->ray_space).vy.field_0.m128[1];
    fVar207 = (local_778->ray_space).vy.field_0.m128[2];
    fVar210 = (local_778->ray_space).vy.field_0.m128[3];
    fVar213 = (local_778->ray_space).vz.field_0.m128[0];
    fVar222 = (local_778->ray_space).vz.field_0.m128[1];
    fVar224 = (local_778->ray_space).vz.field_0.m128[2];
    fVar226 = (local_778->ray_space).vz.field_0.m128[3];
    auVar217._0_4_ = auVar250._0_4_ * fVar128 + auVar234._0_4_ * fVar213 + auVar197._0_4_ * fVar189;
    auVar217._4_4_ = auVar250._4_4_ * fVar149 + auVar234._4_4_ * fVar222 + auVar197._4_4_ * fVar204;
    auVar217._8_4_ = auVar250._8_4_ * fVar151 + auVar234._8_4_ * fVar224 + auVar197._8_4_ * fVar207;
    auVar217._12_4_ =
         auVar250._12_4_ * fVar153 + auVar234._12_4_ * fVar226 + auVar197._12_4_ * fVar210;
    auVar250 = vblendps_avx(auVar217,auVar232,8);
    auVar218 = vsubps_avx(auVar350,(undefined1  [16])aVar11);
    auVar197 = vshufps_avx(auVar218,auVar218,0);
    auVar234 = vshufps_avx(auVar218,auVar218,0x55);
    auVar218 = vshufps_avx(auVar218,auVar218,0xaa);
    auVar249._0_4_ = auVar197._0_4_ * fVar128 + auVar234._0_4_ * fVar189 + fVar213 * auVar218._0_4_;
    auVar249._4_4_ = auVar197._4_4_ * fVar149 + auVar234._4_4_ * fVar204 + fVar222 * auVar218._4_4_;
    auVar249._8_4_ = auVar197._8_4_ * fVar151 + auVar234._8_4_ * fVar207 + fVar224 * auVar218._8_4_;
    auVar249._12_4_ =
         auVar197._12_4_ * fVar153 + auVar234._12_4_ * fVar210 + fVar226 * auVar218._12_4_;
    local_740._0_16_ = auVar249;
    auVar197 = vblendps_avx(auVar249,auVar350,8);
    local_520._0_16_ = (undefined1  [16])aVar11;
    auVar17 = vsubps_avx(_local_6d0,(undefined1  [16])aVar11);
    auVar234 = vshufps_avx(auVar17,auVar17,0);
    auVar218 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
    auVar261._0_4_ = auVar234._0_4_ * fVar128 + auVar218._0_4_ * fVar189 + fVar213 * auVar17._0_4_;
    auVar261._4_4_ = auVar234._4_4_ * fVar149 + auVar218._4_4_ * fVar204 + fVar222 * auVar17._4_4_;
    auVar261._8_4_ = auVar234._8_4_ * fVar151 + auVar218._8_4_ * fVar207 + fVar224 * auVar17._8_4_;
    auVar261._12_4_ =
         auVar234._12_4_ * fVar153 + auVar218._12_4_ * fVar210 + fVar226 * auVar17._12_4_;
    auVar234 = vblendps_avx(auVar261,_local_6d0,8);
    auVar279 = vsubps_avx(auVar330,(undefined1  [16])aVar11);
    auVar218 = vshufps_avx(auVar279,auVar279,0xaa);
    auVar17 = vshufps_avx(auVar279,auVar279,0);
    auVar279 = vshufps_avx(auVar279,auVar279,0x55);
    auVar165._0_4_ = auVar17._0_4_ * fVar128 + auVar218._0_4_ * fVar213 + auVar279._0_4_ * fVar189;
    auVar165._4_4_ = auVar17._4_4_ * fVar149 + auVar218._4_4_ * fVar222 + auVar279._4_4_ * fVar204;
    auVar165._8_4_ = auVar17._8_4_ * fVar151 + auVar218._8_4_ * fVar224 + auVar279._8_4_ * fVar207;
    auVar165._12_4_ =
         auVar17._12_4_ * fVar153 + auVar218._12_4_ * fVar226 + auVar279._12_4_ * fVar210;
    auVar218 = vblendps_avx(auVar165,auVar330,8);
    auVar233._8_4_ = 0x7fffffff;
    auVar233._0_8_ = 0x7fffffff7fffffff;
    auVar233._12_4_ = 0x7fffffff;
    auVar250 = vandps_avx(auVar250,auVar233);
    auVar197 = vandps_avx(auVar197,auVar233);
    auVar17 = vmaxps_avx(auVar250,auVar197);
    auVar250 = vandps_avx(auVar234,auVar233);
    auVar197 = vandps_avx(auVar218,auVar233);
    auVar250 = vmaxps_avx(auVar250,auVar197);
    auVar250 = vmaxps_avx(auVar17,auVar250);
    auVar197 = vmovshdup_avx(auVar250);
    auVar197 = vmaxss_avx(auVar197,auVar250);
    auVar250 = vshufpd_avx(auVar250,auVar250,1);
    auVar250 = vmaxss_avx(auVar250,auVar197);
    lVar120 = (long)(int)uVar123;
    lVar127 = lVar120 * 0x44;
    fVar256 = *(float *)(bezier_basis0 + lVar127 + 0x908);
    fVar257 = *(float *)(bezier_basis0 + lVar127 + 0x90c);
    fVar316 = *(float *)(bezier_basis0 + lVar127 + 0x910);
    fVar183 = *(float *)(bezier_basis0 + lVar127 + 0x914);
    fVar317 = *(float *)(bezier_basis0 + lVar127 + 0x918);
    fVar334 = *(float *)(bezier_basis0 + lVar127 + 0x91c);
    fVar318 = *(float *)(bezier_basis0 + lVar127 + 0x920);
    auVar197 = vshufps_avx(auVar261,auVar261,0);
    register0x00001250 = auVar197;
    _local_5e0 = auVar197;
    fVar128 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar127 + 0xd8c);
    fVar149 = *(float *)(bezier_basis0 + lVar127 + 0xd90);
    fVar151 = *(float *)(bezier_basis0 + lVar127 + 0xd94);
    fVar153 = *(float *)(bezier_basis0 + lVar127 + 0xd98);
    fVar189 = *(float *)(bezier_basis0 + lVar127 + 0xd9c);
    fVar204 = *(float *)(bezier_basis0 + lVar127 + 0xda0);
    fVar207 = *(float *)(bezier_basis0 + lVar127 + 0xda4);
    auVar110 = *(undefined1 (*) [28])(bezier_basis0 + lVar127 + 0xd8c);
    auVar234 = vshufps_avx(auVar165,auVar165,0);
    register0x00001590 = auVar234;
    _local_360 = auVar234;
    fVar293 = auVar234._0_4_;
    fVar300 = auVar234._4_4_;
    fVar301 = auVar234._8_4_;
    fVar302 = auVar234._12_4_;
    fVar161 = auVar197._0_4_;
    fVar175 = auVar197._4_4_;
    fVar177 = auVar197._8_4_;
    fVar179 = auVar197._12_4_;
    auVar197 = vshufps_avx(auVar261,auVar261,0x55);
    register0x000012d0 = auVar197;
    _local_640 = auVar197;
    auVar234 = vshufps_avx(auVar165,auVar165,0x55);
    register0x000014d0 = auVar234;
    _local_480 = auVar234;
    fVar312 = auVar234._0_4_;
    fVar314 = auVar234._4_4_;
    fVar315 = auVar234._8_4_;
    fVar129 = auVar234._12_4_;
    fVar214 = auVar197._0_4_;
    fVar223 = auVar197._4_4_;
    fVar225 = auVar197._8_4_;
    fVar227 = auVar197._12_4_;
    auVar23 = _local_6d0;
    auVar197 = vshufps_avx(_local_6d0,_local_6d0,0xff);
    register0x00001390 = auVar197;
    _local_80 = auVar197;
    _local_6b0 = auVar330;
    auVar19 = _local_6b0;
    auVar234 = vshufps_avx(auVar330,auVar330,0xff);
    register0x00001450 = auVar234;
    _local_a0 = auVar234;
    auVar321._0_4_ = auVar234._0_4_;
    fVar191 = auVar234._4_4_;
    fVar206 = auVar234._8_4_;
    fVar209 = auVar234._12_4_;
    fVar259 = auVar197._0_4_;
    fVar264 = auVar197._4_4_;
    fVar266 = auVar197._8_4_;
    auVar234 = vshufps_avx(auVar249,auVar249,0);
    register0x00001350 = auVar234;
    _local_340 = auVar234;
    fVar210 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar127 + 0x484);
    fVar213 = *(float *)(bezier_basis0 + lVar127 + 0x488);
    fVar222 = *(float *)(bezier_basis0 + lVar127 + 0x48c);
    fVar224 = *(float *)(bezier_basis0 + lVar127 + 0x490);
    fVar226 = *(float *)(bezier_basis0 + lVar127 + 0x494);
    fVar246 = *(float *)(bezier_basis0 + lVar127 + 0x498);
    fVar255 = *(float *)(bezier_basis0 + lVar127 + 0x49c);
    auVar111 = *(undefined1 (*) [28])(bezier_basis0 + lVar127 + 0x484);
    fVar155 = auVar234._0_4_;
    fVar157 = auVar234._4_4_;
    fVar158 = auVar234._8_4_;
    fVar159 = auVar234._12_4_;
    auVar234 = vshufps_avx(auVar249,auVar249,0x55);
    register0x00001290 = auVar234;
    _local_620 = auVar234;
    fVar190 = auVar234._0_4_;
    fVar205 = auVar234._4_4_;
    fVar208 = auVar234._8_4_;
    fVar211 = auVar234._12_4_;
    _local_6c0 = auVar350;
    auVar18 = _local_6c0;
    auVar218 = vshufps_avx(auVar350,auVar350,0xff);
    register0x000015d0 = auVar218;
    _local_e0 = auVar218;
    fVar265 = auVar218._0_4_;
    fVar267 = auVar218._4_4_;
    fVar268 = auVar218._8_4_;
    fVar336 = auVar218._12_4_;
    auVar218 = vshufps_avx(auVar217,auVar217,0);
    register0x00001250 = auVar218;
    _local_680 = auVar218;
    pauVar8 = (undefined1 (*) [32])(bezier_basis0 + lVar127);
    fVar186 = *(float *)*pauVar8;
    fVar319 = *(float *)(bezier_basis0 + lVar127 + 4);
    fVar335 = *(float *)(bezier_basis0 + lVar127 + 8);
    fVar269 = *(float *)(bezier_basis0 + lVar127 + 0xc);
    fVar239 = *(float *)(bezier_basis0 + lVar127 + 0x10);
    fVar181 = *(float *)(bezier_basis0 + lVar127 + 0x14);
    fVar270 = *(float *)(bezier_basis0 + lVar127 + 0x18);
    auVar112 = *(undefined1 (*) [28])*pauVar8;
    fVar162 = auVar218._0_4_;
    fVar176 = auVar218._4_4_;
    fVar178 = auVar218._8_4_;
    fVar180 = auVar218._12_4_;
    auVar275._0_4_ = fVar162 * fVar186 + fVar155 * fVar210 + fVar161 * fVar256 + fVar293 * fVar128;
    auVar275._4_4_ = fVar176 * fVar319 + fVar157 * fVar213 + fVar175 * fVar257 + fVar300 * fVar149;
    auVar275._8_4_ = fVar178 * fVar335 + fVar158 * fVar222 + fVar177 * fVar316 + fVar301 * fVar151;
    auVar275._12_4_ = fVar180 * fVar269 + fVar159 * fVar224 + fVar179 * fVar183 + fVar302 * fVar153;
    auVar275._16_4_ = fVar162 * fVar239 + fVar155 * fVar226 + fVar161 * fVar317 + fVar293 * fVar189;
    auVar275._20_4_ = fVar176 * fVar181 + fVar157 * fVar246 + fVar175 * fVar334 + fVar300 * fVar204;
    auVar275._24_4_ = fVar178 * fVar270 + fVar158 * fVar255 + fVar177 * fVar318 + fVar301 * fVar207;
    auVar275._28_4_ = *(float *)(bezier_basis0 + lVar127 + 0xda8) + fVar159 + fVar179 + 0.0;
    auVar218 = vshufps_avx(auVar217,auVar217,0x55);
    register0x00001410 = auVar218;
    _local_600 = auVar218;
    fVar160 = auVar218._0_4_;
    fVar188 = auVar218._4_4_;
    fVar271 = auVar218._8_4_;
    fVar242 = auVar218._12_4_;
    auVar322._0_4_ = fVar160 * fVar186 + fVar190 * fVar210 + fVar214 * fVar256 + fVar312 * fVar128;
    auVar322._4_4_ = fVar188 * fVar319 + fVar205 * fVar213 + fVar223 * fVar257 + fVar314 * fVar149;
    auVar322._8_4_ = fVar271 * fVar335 + fVar208 * fVar222 + fVar225 * fVar316 + fVar315 * fVar151;
    auVar322._12_4_ = fVar242 * fVar269 + fVar211 * fVar224 + fVar227 * fVar183 + fVar129 * fVar153;
    auVar322._16_4_ = fVar160 * fVar239 + fVar190 * fVar226 + fVar214 * fVar317 + fVar312 * fVar189;
    auVar322._20_4_ = fVar188 * fVar181 + fVar205 * fVar246 + fVar223 * fVar334 + fVar314 * fVar204;
    auVar322._24_4_ = fVar271 * fVar270 + fVar208 * fVar255 + fVar225 * fVar318 + fVar315 * fVar207;
    auVar322._28_4_ = fVar227 + 0.0 + 0.0 + 0.0;
    auVar218 = vpermilps_avx(auVar232,0xff);
    register0x00001490 = auVar218;
    _local_c0 = auVar218;
    _local_2a0 = *pauVar8;
    auVar148 = _local_2a0;
    fVar212 = auVar218._0_4_;
    fVar245 = auVar218._4_4_;
    fVar260 = auVar218._8_4_;
    local_660._0_4_ =
         fVar212 * fVar186 + fVar265 * fVar210 + fVar259 * fVar256 + auVar321._0_4_ * fVar128;
    local_660._4_4_ = fVar245 * fVar319 + fVar267 * fVar213 + fVar264 * fVar257 + fVar191 * fVar149;
    local_660._8_4_ = fVar260 * fVar335 + fVar268 * fVar222 + fVar266 * fVar316 + fVar206 * fVar151;
    local_660._12_4_ =
         auVar218._12_4_ * fVar269 +
         fVar336 * fVar224 + auVar197._12_4_ * fVar183 + fVar209 * fVar153;
    local_660._16_4_ =
         fVar212 * fVar239 + fVar265 * fVar226 + fVar259 * fVar317 + auVar321._0_4_ * fVar189;
    local_660._20_4_ = fVar245 * fVar181 + fVar267 * fVar246 + fVar264 * fVar334 + fVar191 * fVar204
    ;
    local_660._24_4_ = fVar260 * fVar270 + fVar268 * fVar255 + fVar266 * fVar318 + fVar206 * fVar207
    ;
    local_660._28_4_ = 0;
    fVar186 = *(float *)(bezier_basis1 + lVar127 + 0x908);
    fVar319 = *(float *)(bezier_basis1 + lVar127 + 0x90c);
    fVar335 = *(float *)(bezier_basis1 + lVar127 + 0x910);
    fVar269 = *(float *)(bezier_basis1 + lVar127 + 0x914);
    fVar239 = *(float *)(bezier_basis1 + lVar127 + 0x918);
    fVar181 = *(float *)(bezier_basis1 + lVar127 + 0x91c);
    fVar270 = *(float *)(bezier_basis1 + lVar127 + 0x920);
    fVar288 = *(float *)(bezier_basis1 + lVar127 + 0xd8c);
    fVar240 = *(float *)(bezier_basis1 + lVar127 + 0xd90);
    fVar182 = *(float *)(bezier_basis1 + lVar127 + 0xd94);
    fVar289 = *(float *)(bezier_basis1 + lVar127 + 0xd98);
    fVar290 = *(float *)(bezier_basis1 + lVar127 + 0xd9c);
    fVar241 = *(float *)(bezier_basis1 + lVar127 + 0xda0);
    fVar184 = *(float *)(bezier_basis1 + lVar127 + 0xda4);
    fVar291 = *(float *)(bezier_basis1 + lVar127 + 0x484);
    fVar292 = *(float *)(bezier_basis1 + lVar127 + 0x488);
    fVar243 = *(float *)(bezier_basis1 + lVar127 + 0x48c);
    fVar185 = *(float *)(bezier_basis1 + lVar127 + 0x490);
    fVar309 = *(float *)(bezier_basis1 + lVar127 + 0x494);
    fVar311 = *(float *)(bezier_basis1 + lVar127 + 0x498);
    fVar244 = *(float *)(bezier_basis1 + lVar127 + 0x49c);
    fVar258 = fVar209 + 0.0 + 0.0;
    fVar187 = *(float *)(bezier_basis1 + lVar127);
    fVar278 = *(float *)(bezier_basis1 + lVar127 + 4);
    fVar303 = *(float *)(bezier_basis1 + lVar127 + 8);
    fVar150 = *(float *)(bezier_basis1 + lVar127 + 0xc);
    fVar152 = *(float *)(bezier_basis1 + lVar127 + 0x10);
    fVar154 = *(float *)(bezier_basis1 + lVar127 + 0x14);
    fVar156 = *(float *)(bezier_basis1 + lVar127 + 0x18);
    local_4e0._0_4_ = fVar162 * fVar187 + fVar155 * fVar291 + fVar186 * fVar161 + fVar293 * fVar288;
    local_4e0._4_4_ = fVar176 * fVar278 + fVar157 * fVar292 + fVar319 * fVar175 + fVar300 * fVar240;
    fStack_4d8 = fVar178 * fVar303 + fVar158 * fVar243 + fVar335 * fVar177 + fVar301 * fVar182;
    fStack_4d4 = fVar180 * fVar150 + fVar159 * fVar185 + fVar269 * fVar179 + fVar302 * fVar289;
    fStack_4d0 = fVar162 * fVar152 + fVar155 * fVar309 + fVar239 * fVar161 + fVar293 * fVar290;
    fStack_4cc = fVar176 * fVar154 + fVar157 * fVar311 + fVar181 * fVar175 + fVar300 * fVar241;
    fStack_4c8 = fVar178 * fVar156 + fVar158 * fVar244 + fVar270 * fVar177 + fVar301 * fVar184;
    register0x0000139c = fVar336 + fVar302 + 0.0;
    local_4a0._0_4_ = fVar160 * fVar187 + fVar291 * fVar190 + fVar186 * fVar214 + fVar312 * fVar288;
    local_4a0._4_4_ = fVar188 * fVar278 + fVar292 * fVar205 + fVar319 * fVar223 + fVar314 * fVar240;
    fStack_498 = fVar271 * fVar303 + fVar243 * fVar208 + fVar335 * fVar225 + fVar315 * fVar182;
    fStack_494 = fVar242 * fVar150 + fVar185 * fVar211 + fVar269 * fVar227 + fVar129 * fVar289;
    fStack_490 = fVar160 * fVar152 + fVar309 * fVar190 + fVar239 * fVar214 + fVar312 * fVar290;
    fStack_48c = fVar188 * fVar154 + fVar311 * fVar205 + fVar181 * fVar223 + fVar314 * fVar241;
    fStack_488 = fVar271 * fVar156 + fVar244 * fVar208 + fVar270 * fVar225 + fVar315 * fVar184;
    fStack_484 = fVar302 + 0.0 + 0.0;
    local_400._0_4_ =
         fVar212 * fVar187 + fVar265 * fVar291 + fVar186 * fVar259 + auVar321._0_4_ * fVar288;
    local_400._4_4_ = fVar245 * fVar278 + fVar267 * fVar292 + fVar319 * fVar264 + fVar191 * fVar240;
    local_400._8_4_ = fVar260 * fVar303 + fVar268 * fVar243 + fVar335 * fVar266 + fVar206 * fVar182;
    local_400._12_4_ =
         auVar218._12_4_ * fVar150 +
         fVar336 * fVar185 + fVar269 * auVar197._12_4_ + fVar209 * fVar289;
    local_400._16_4_ =
         fVar212 * fVar152 + fVar265 * fVar309 + fVar239 * fVar259 + auVar321._0_4_ * fVar290;
    local_400._20_4_ = fVar245 * fVar154 + fVar267 * fVar311 + fVar181 * fVar264 + fVar191 * fVar241
    ;
    local_400._24_4_ = fVar260 * fVar156 + fVar268 * fVar244 + fVar270 * fVar266 + fVar206 * fVar184
    ;
    local_400._28_4_ = fVar258 + 0.0;
    auVar24 = vsubps_avx(_local_4e0,auVar275);
    auVar25 = vsubps_avx(_local_4a0,auVar322);
    _auStack_390 = auVar25._16_16_;
    fVar128 = auVar24._0_4_;
    fVar151 = auVar24._4_4_;
    auVar143._4_4_ = auVar322._4_4_ * fVar151;
    auVar143._0_4_ = auVar322._0_4_ * fVar128;
    fVar189 = auVar24._8_4_;
    auVar143._8_4_ = auVar322._8_4_ * fVar189;
    fVar207 = auVar24._12_4_;
    auVar143._12_4_ = auVar322._12_4_ * fVar207;
    fVar213 = auVar24._16_4_;
    auVar143._16_4_ = auVar322._16_4_ * fVar213;
    fVar224 = auVar24._20_4_;
    auVar143._20_4_ = auVar322._20_4_ * fVar224;
    fVar246 = auVar24._24_4_;
    auVar143._24_4_ = auVar322._24_4_ * fVar246;
    auVar143._28_4_ = 0;
    fVar149 = auVar25._0_4_;
    fVar153 = auVar25._4_4_;
    auVar26._4_4_ = auVar275._4_4_ * fVar153;
    auVar26._0_4_ = auVar275._0_4_ * fVar149;
    fVar204 = auVar25._8_4_;
    auVar26._8_4_ = auVar275._8_4_ * fVar204;
    fVar210 = auVar25._12_4_;
    auVar26._12_4_ = auVar275._12_4_ * fVar210;
    fVar222 = auVar25._16_4_;
    auVar26._16_4_ = auVar275._16_4_ * fVar222;
    fVar226 = auVar25._20_4_;
    auVar26._20_4_ = auVar275._20_4_ * fVar226;
    fVar255 = auVar25._24_4_;
    auVar26._24_4_ = auVar275._24_4_ * fVar255;
    auVar26._28_4_ = fVar258;
    auVar26 = vsubps_avx(auVar143,auVar26);
    auVar143 = vmaxps_avx(local_660,local_400);
    auVar31._4_4_ = auVar143._4_4_ * auVar143._4_4_ * (fVar151 * fVar151 + fVar153 * fVar153);
    auVar31._0_4_ = auVar143._0_4_ * auVar143._0_4_ * (fVar128 * fVar128 + fVar149 * fVar149);
    auVar31._8_4_ = auVar143._8_4_ * auVar143._8_4_ * (fVar189 * fVar189 + fVar204 * fVar204);
    auVar31._12_4_ = auVar143._12_4_ * auVar143._12_4_ * (fVar207 * fVar207 + fVar210 * fVar210);
    auVar31._16_4_ = auVar143._16_4_ * auVar143._16_4_ * (fVar213 * fVar213 + fVar222 * fVar222);
    auVar31._20_4_ = auVar143._20_4_ * auVar143._20_4_ * (fVar224 * fVar224 + fVar226 * fVar226);
    auVar31._24_4_ = auVar143._24_4_ * auVar143._24_4_ * (fVar246 * fVar246 + fVar255 * fVar255);
    auVar31._28_4_ = register0x0000139c + fVar258;
    auVar16._4_4_ = auVar26._4_4_ * auVar26._4_4_;
    auVar16._0_4_ = auVar26._0_4_ * auVar26._0_4_;
    auVar16._8_4_ = auVar26._8_4_ * auVar26._8_4_;
    auVar16._12_4_ = auVar26._12_4_ * auVar26._12_4_;
    auVar16._16_4_ = auVar26._16_4_ * auVar26._16_4_;
    auVar16._20_4_ = auVar26._20_4_ * auVar26._20_4_;
    auVar16._24_4_ = auVar26._24_4_ * auVar26._24_4_;
    auVar16._28_4_ = auVar26._28_4_;
    auVar143 = vcmpps_avx(auVar16,auVar31,2);
    auVar321._0_4_ = (float)(int)uVar123;
    auVar321._4_12_ = auVar234._4_12_;
    auVar197 = vshufps_avx(auVar321,auVar321,0);
    auVar251._16_16_ = auVar197;
    auVar251._0_16_ = auVar197;
    auVar26 = vcmpps_avx(_DAT_01f7b060,auVar251,1);
    auVar197 = vpermilps_avx(auVar217,0xaa);
    auVar201._16_16_ = auVar197;
    auVar201._0_16_ = auVar197;
    auVar234 = vpermilps_avx(auVar249,0xaa);
    register0x00001590 = auVar234;
    _local_260 = auVar234;
    auVar218 = vpermilps_avx(auVar261,0xaa);
    register0x000015d0 = auVar218;
    _local_280 = auVar218;
    auVar17 = vpermilps_avx(auVar165,0xaa);
    register0x00001390 = auVar17;
    _local_540 = auVar17;
    auVar31 = auVar26 & auVar143;
    auVar279 = vpermilps_avx((undefined1  [16])aVar11,0xff);
    _local_720 = ZEXT1632(auVar279);
    auVar250 = ZEXT416((uint)(auVar250._0_4_ * 4.7683716e-07));
    ray = local_7b0;
    fVar128 = fVar161;
    fVar149 = fVar175;
    fVar151 = fVar177;
    fVar153 = fVar179;
    fVar189 = fVar312;
    fVar204 = fVar314;
    fVar207 = fVar315;
    fVar210 = fVar129;
    fVar213 = fVar190;
    fVar222 = fVar205;
    fVar224 = fVar208;
    fVar226 = fVar211;
    fVar246 = fVar162;
    fVar255 = fVar176;
    fVar258 = fVar178;
    fVar259 = fVar214;
    fVar264 = fVar223;
    fVar266 = fVar225;
    _local_720 = auVar279;
    if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar31 >> 0x7f,0) == '\0') &&
          (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar31 >> 0xbf,0) == '\0') &&
        (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar31[0x1f]) {
      auVar287 = ZEXT3264(local_700);
      auVar299 = ZEXT3264(local_6a0);
      auVar254 = ZEXT3264(_local_600);
    }
    else {
      local_520._0_16_ = auVar321;
      local_740._0_16_ = auVar250;
      _local_2c0 = vandps_avx(auVar143,auVar26);
      fVar191 = auVar197._0_4_;
      fVar206 = auVar197._4_4_;
      fVar209 = auVar197._8_4_;
      fVar212 = auVar197._12_4_;
      fVar336 = auVar234._0_4_;
      fVar342 = auVar234._4_4_;
      fVar343 = auVar234._8_4_;
      fVar344 = auVar234._12_4_;
      fVar345 = auVar218._0_4_;
      fVar346 = auVar218._4_4_;
      fVar347 = auVar218._8_4_;
      fVar354 = auVar218._12_4_;
      fVar260 = auVar17._0_4_;
      fVar265 = auVar17._4_4_;
      fVar267 = auVar17._8_4_;
      fVar268 = auVar17._12_4_;
      fVar245 = auVar143._28_4_ + auVar26._28_4_ + fVar268;
      local_3e0 = fVar191 * fVar187 + fVar336 * fVar291 + fVar345 * fVar186 + fVar260 * fVar288;
      fStack_3dc = fVar206 * fVar278 + fVar342 * fVar292 + fVar346 * fVar319 + fVar265 * fVar240;
      fStack_3d8 = fVar209 * fVar303 + fVar343 * fVar243 + fVar347 * fVar335 + fVar267 * fVar182;
      fStack_3d4 = fVar212 * fVar150 + fVar344 * fVar185 + fVar354 * fVar269 + fVar268 * fVar289;
      fStack_3d0 = fVar191 * fVar152 + fVar336 * fVar309 + fVar345 * fVar239 + fVar260 * fVar290;
      fStack_3cc = fVar206 * fVar154 + fVar342 * fVar311 + fVar346 * fVar181 + fVar265 * fVar241;
      fStack_3c8 = fVar209 * fVar156 + fVar343 * fVar244 + fVar347 * fVar270 + fVar267 * fVar184;
      fStack_3c4 = *(float *)(bezier_basis1 + lVar127 + 0x1c) + fVar245;
      local_2a0._0_4_ = auVar112._0_4_;
      local_2a0._4_4_ = auVar112._4_4_;
      fStack_298 = auVar112._8_4_;
      fStack_294 = auVar112._12_4_;
      fStack_290 = auVar112._16_4_;
      fStack_28c = auVar112._20_4_;
      fStack_288 = auVar112._24_4_;
      local_3c0._0_4_ = auVar111._0_4_;
      local_3c0._4_4_ = auVar111._4_4_;
      fStack_3b8 = auVar111._8_4_;
      fStack_3b4 = auVar111._12_4_;
      fStack_3b0 = auVar111._16_4_;
      fStack_3ac = auVar111._20_4_;
      fStack_3a8 = auVar111._24_4_;
      local_580._0_4_ = auVar110._0_4_;
      local_580._4_4_ = auVar110._4_4_;
      fStack_578 = auVar110._8_4_;
      fStack_574 = auVar110._12_4_;
      fStack_570 = auVar110._16_4_;
      fStack_56c = auVar110._20_4_;
      fStack_568 = auVar110._24_4_;
      local_4c0 = fVar191 * (float)local_2a0._0_4_ +
                  fVar336 * (float)local_3c0._0_4_ +
                  fVar345 * fVar256 + fVar260 * (float)local_580._0_4_;
      fStack_4bc = fVar206 * (float)local_2a0._4_4_ +
                   fVar342 * (float)local_3c0._4_4_ +
                   fVar346 * fVar257 + fVar265 * (float)local_580._4_4_;
      fStack_4b8 = fVar209 * fStack_298 +
                   fVar343 * fStack_3b8 + fVar347 * fVar316 + fVar267 * fStack_578;
      fStack_4b4 = fVar212 * fStack_294 +
                   fVar344 * fStack_3b4 + fVar354 * fVar183 + fVar268 * fStack_574;
      fStack_4b0 = fVar191 * fStack_290 +
                   fVar336 * fStack_3b0 + fVar345 * fVar317 + fVar260 * fStack_570;
      fStack_4ac = fVar206 * fStack_28c +
                   fVar342 * fStack_3ac + fVar346 * fVar334 + fVar265 * fStack_56c;
      fStack_4a8 = fVar209 * fStack_288 +
                   fVar343 * fStack_3a8 + fVar347 * fVar318 + fVar267 * fStack_568;
      fStack_4a4 = fVar180 + fStack_3c4 + *(float *)(bezier_basis1 + lVar127 + 0x1c) + fVar245;
      fVar256 = *(float *)(bezier_basis0 + lVar127 + 0x1210);
      fVar257 = *(float *)(bezier_basis0 + lVar127 + 0x1214);
      fVar316 = *(float *)(bezier_basis0 + lVar127 + 0x1218);
      fVar183 = *(float *)(bezier_basis0 + lVar127 + 0x121c);
      fVar317 = *(float *)(bezier_basis0 + lVar127 + 0x1220);
      fVar334 = *(float *)(bezier_basis0 + lVar127 + 0x1224);
      fVar318 = *(float *)(bezier_basis0 + lVar127 + 0x1228);
      fVar186 = *(float *)(bezier_basis0 + lVar127 + 0x1694);
      fVar319 = *(float *)(bezier_basis0 + lVar127 + 0x1698);
      fVar335 = *(float *)(bezier_basis0 + lVar127 + 0x169c);
      fVar269 = *(float *)(bezier_basis0 + lVar127 + 0x16a0);
      fVar239 = *(float *)(bezier_basis0 + lVar127 + 0x16a4);
      fVar181 = *(float *)(bezier_basis0 + lVar127 + 0x16a8);
      fVar270 = *(float *)(bezier_basis0 + lVar127 + 0x16ac);
      fVar288 = *(float *)(bezier_basis0 + lVar127 + 0x1b18);
      fVar240 = *(float *)(bezier_basis0 + lVar127 + 0x1b1c);
      fVar182 = *(float *)(bezier_basis0 + lVar127 + 0x1b20);
      fVar289 = *(float *)(bezier_basis0 + lVar127 + 0x1b24);
      fVar290 = *(float *)(bezier_basis0 + lVar127 + 0x1b28);
      fVar241 = *(float *)(bezier_basis0 + lVar127 + 0x1b2c);
      fVar184 = *(float *)(bezier_basis0 + lVar127 + 0x1b30);
      fVar291 = *(float *)(bezier_basis0 + lVar127 + 0x1f9c);
      fVar292 = *(float *)(bezier_basis0 + lVar127 + 0x1fa0);
      fVar243 = *(float *)(bezier_basis0 + lVar127 + 0x1fa4);
      fVar185 = *(float *)(bezier_basis0 + lVar127 + 0x1fa8);
      fVar309 = *(float *)(bezier_basis0 + lVar127 + 0x1fac);
      fVar311 = *(float *)(bezier_basis0 + lVar127 + 0x1fb0);
      fVar244 = *(float *)(bezier_basis0 + lVar127 + 0x1fb4);
      fVar278 = *(float *)(bezier_basis1 + lVar127 + 0x4a0) + auVar275._28_4_;
      fVar187 = *(float *)(bezier_basis0 + lVar127 + 0x1b34) +
                *(float *)(bezier_basis0 + lVar127 + 0x1fb8);
      fVar303 = *(float *)(bezier_basis0 + lVar127 + 0x16b0) + fVar187;
      local_3c0._4_4_ =
           fVar176 * fVar257 + fVar157 * fVar319 + fVar175 * fVar240 + fVar300 * fVar292;
      local_3c0._0_4_ =
           fVar162 * fVar256 + fVar155 * fVar186 + fVar161 * fVar288 + fVar293 * fVar291;
      fStack_3b8 = fVar178 * fVar316 + fVar158 * fVar335 + fVar177 * fVar182 + fVar301 * fVar243;
      fStack_3b4 = fVar180 * fVar183 + fVar159 * fVar269 + fVar179 * fVar289 + fVar302 * fVar185;
      fStack_3b0 = fVar162 * fVar317 + fVar155 * fVar239 + fVar161 * fVar290 + fVar293 * fVar309;
      fStack_3ac = fVar176 * fVar334 + fVar157 * fVar181 + fVar175 * fVar241 + fVar300 * fVar311;
      fStack_3a8 = fVar178 * fVar318 + fVar158 * fVar270 + fVar177 * fVar184 + fVar301 * fVar244;
      fStack_3a4 = *(float *)(bezier_basis0 + lVar127 + 0x16b0) +
                   *(float *)(bezier_basis0 + lVar127 + 0x1fb8) + fVar278;
      auVar166._0_4_ = fVar160 * fVar256 + fVar190 * fVar186 + fVar214 * fVar288 + fVar312 * fVar291
      ;
      auVar166._4_4_ = fVar188 * fVar257 + fVar205 * fVar319 + fVar223 * fVar240 + fVar314 * fVar292
      ;
      auVar166._8_4_ = fVar271 * fVar316 + fVar208 * fVar335 + fVar225 * fVar182 + fVar315 * fVar243
      ;
      auVar166._12_4_ =
           fVar242 * fVar183 + fVar211 * fVar269 + fVar227 * fVar289 + fVar129 * fVar185;
      auVar166._16_4_ =
           fVar160 * fVar317 + fVar190 * fVar239 + fVar214 * fVar290 + fVar312 * fVar309;
      auVar166._20_4_ =
           fVar188 * fVar334 + fVar205 * fVar181 + fVar223 * fVar241 + fVar314 * fVar311;
      auVar166._24_4_ =
           fVar271 * fVar318 + fVar208 * fVar270 + fVar225 * fVar184 + fVar315 * fVar244;
      auVar166._28_4_ = fVar187 + fVar278 + *(float *)(bezier_basis1 + lVar127 + 0x4a0) + fVar268;
      auVar219._0_4_ = fVar336 * fVar186 + fVar345 * fVar288 + fVar260 * fVar291 + fVar191 * fVar256
      ;
      auVar219._4_4_ = fVar342 * fVar319 + fVar346 * fVar240 + fVar265 * fVar292 + fVar206 * fVar257
      ;
      auVar219._8_4_ = fVar343 * fVar335 + fVar347 * fVar182 + fVar267 * fVar243 + fVar209 * fVar316
      ;
      auVar219._12_4_ =
           fVar344 * fVar269 + fVar354 * fVar289 + fVar268 * fVar185 + fVar212 * fVar183;
      auVar219._16_4_ =
           fVar336 * fVar239 + fVar345 * fVar290 + fVar260 * fVar309 + fVar191 * fVar317;
      auVar219._20_4_ =
           fVar342 * fVar181 + fVar346 * fVar241 + fVar265 * fVar311 + fVar206 * fVar334;
      auVar219._24_4_ =
           fVar343 * fVar270 + fVar347 * fVar184 + fVar267 * fVar244 + fVar209 * fVar318;
      auVar219._28_4_ = fVar303 + *(float *)(bezier_basis0 + lVar127 + 0x122c);
      fVar256 = *(float *)(bezier_basis1 + lVar127 + 0x1b18);
      fVar257 = *(float *)(bezier_basis1 + lVar127 + 0x1b1c);
      fVar316 = *(float *)(bezier_basis1 + lVar127 + 0x1b20);
      fVar183 = *(float *)(bezier_basis1 + lVar127 + 0x1b24);
      fVar317 = *(float *)(bezier_basis1 + lVar127 + 0x1b28);
      fVar334 = *(float *)(bezier_basis1 + lVar127 + 0x1b2c);
      fVar318 = *(float *)(bezier_basis1 + lVar127 + 0x1b30);
      fVar186 = *(float *)(bezier_basis1 + lVar127 + 0x1f9c);
      fVar319 = *(float *)(bezier_basis1 + lVar127 + 0x1fa0);
      fVar335 = *(float *)(bezier_basis1 + lVar127 + 0x1fa4);
      fVar269 = *(float *)(bezier_basis1 + lVar127 + 0x1fa8);
      fVar239 = *(float *)(bezier_basis1 + lVar127 + 0x1fac);
      fVar181 = *(float *)(bezier_basis1 + lVar127 + 0x1fb0);
      fVar270 = *(float *)(bezier_basis1 + lVar127 + 0x1fb4);
      fVar288 = *(float *)(bezier_basis1 + lVar127 + 0x1694);
      fVar240 = *(float *)(bezier_basis1 + lVar127 + 0x1698);
      fVar182 = *(float *)(bezier_basis1 + lVar127 + 0x169c);
      fVar289 = *(float *)(bezier_basis1 + lVar127 + 0x16a0);
      fVar290 = *(float *)(bezier_basis1 + lVar127 + 0x16a4);
      fVar241 = *(float *)(bezier_basis1 + lVar127 + 0x16a8);
      fVar184 = *(float *)(bezier_basis1 + lVar127 + 0x16ac);
      fVar291 = *(float *)(bezier_basis1 + lVar127 + 0x1210);
      fVar292 = *(float *)(bezier_basis1 + lVar127 + 0x1214);
      fVar243 = *(float *)(bezier_basis1 + lVar127 + 0x1218);
      fVar185 = *(float *)(bezier_basis1 + lVar127 + 0x121c);
      fVar309 = *(float *)(bezier_basis1 + lVar127 + 0x1220);
      fVar311 = *(float *)(bezier_basis1 + lVar127 + 0x1224);
      fVar244 = *(float *)(bezier_basis1 + lVar127 + 0x1228);
      auVar282._0_4_ = fVar162 * fVar291 + fVar288 * fVar155 + fVar161 * fVar256 + fVar293 * fVar186
      ;
      auVar282._4_4_ = fVar176 * fVar292 + fVar240 * fVar157 + fVar175 * fVar257 + fVar300 * fVar319
      ;
      auVar282._8_4_ = fVar178 * fVar243 + fVar182 * fVar158 + fVar177 * fVar316 + fVar301 * fVar335
      ;
      auVar282._12_4_ =
           fVar180 * fVar185 + fVar289 * fVar159 + fVar179 * fVar183 + fVar302 * fVar269;
      auVar282._16_4_ =
           fVar162 * fVar309 + fVar290 * fVar155 + fVar161 * fVar317 + fVar293 * fVar239;
      auVar282._20_4_ =
           fVar176 * fVar311 + fVar241 * fVar157 + fVar175 * fVar334 + fVar300 * fVar181;
      auVar282._24_4_ =
           fVar178 * fVar244 + fVar184 * fVar158 + fVar177 * fVar318 + fVar301 * fVar270;
      auVar282._28_4_ = fVar302 + fVar302 + fVar303 + fVar302;
      auVar296._0_4_ = fVar160 * fVar291 + fVar190 * fVar288 + fVar214 * fVar256 + fVar312 * fVar186
      ;
      auVar296._4_4_ = fVar188 * fVar292 + fVar205 * fVar240 + fVar223 * fVar257 + fVar314 * fVar319
      ;
      auVar296._8_4_ = fVar271 * fVar243 + fVar208 * fVar182 + fVar225 * fVar316 + fVar315 * fVar335
      ;
      auVar296._12_4_ =
           fVar242 * fVar185 + fVar211 * fVar289 + fVar227 * fVar183 + fVar129 * fVar269;
      auVar296._16_4_ =
           fVar160 * fVar309 + fVar190 * fVar290 + fVar214 * fVar317 + fVar312 * fVar239;
      auVar296._20_4_ =
           fVar188 * fVar311 + fVar205 * fVar241 + fVar223 * fVar334 + fVar314 * fVar181;
      auVar296._24_4_ =
           fVar271 * fVar244 + fVar208 * fVar184 + fVar225 * fVar318 + fVar315 * fVar270;
      auVar296._28_4_ = fVar302 + fVar302 + fVar302 + fVar303;
      _local_500 = auVar201;
      auVar235._0_4_ = fVar191 * fVar291 + fVar336 * fVar288 + fVar345 * fVar256 + fVar260 * fVar186
      ;
      auVar235._4_4_ = fVar206 * fVar292 + fVar342 * fVar240 + fVar346 * fVar257 + fVar265 * fVar319
      ;
      auVar235._8_4_ = fVar209 * fVar243 + fVar343 * fVar182 + fVar347 * fVar316 + fVar267 * fVar335
      ;
      auVar235._12_4_ =
           fVar212 * fVar185 + fVar344 * fVar289 + fVar354 * fVar183 + fVar268 * fVar269;
      auVar235._16_4_ =
           fVar191 * fVar309 + fVar336 * fVar290 + fVar345 * fVar317 + fVar260 * fVar239;
      auVar235._20_4_ =
           fVar206 * fVar311 + fVar342 * fVar241 + fVar346 * fVar334 + fVar265 * fVar181;
      auVar235._24_4_ =
           fVar209 * fVar244 + fVar343 * fVar184 + fVar347 * fVar318 + fVar267 * fVar270;
      auVar235._28_4_ =
           *(float *)(bezier_basis1 + lVar127 + 0x122c) +
           *(float *)(bezier_basis1 + lVar127 + 0x16b0) +
           *(float *)(bezier_basis1 + lVar127 + 0x1b34) +
           *(float *)(bezier_basis1 + lVar127 + 0x1fb8);
      auVar202._8_4_ = 0x7fffffff;
      auVar202._0_8_ = 0x7fffffff7fffffff;
      auVar202._12_4_ = 0x7fffffff;
      auVar202._16_4_ = 0x7fffffff;
      auVar202._20_4_ = 0x7fffffff;
      auVar202._24_4_ = 0x7fffffff;
      auVar202._28_4_ = 0x7fffffff;
      auVar143 = vandps_avx(_local_3c0,auVar202);
      auVar26 = vandps_avx(auVar166,auVar202);
      auVar26 = vmaxps_avx(auVar143,auVar26);
      auVar143 = vandps_avx(auVar219,auVar202);
      auVar143 = vmaxps_avx(auVar26,auVar143);
      auVar250 = vpermilps_avx(auVar250,0);
      auVar276._16_16_ = auVar250;
      auVar276._0_16_ = auVar250;
      auVar143 = vcmpps_avx(auVar143,auVar276,1);
      auVar31 = vblendvps_avx(_local_3c0,auVar24,auVar143);
      auVar16 = vblendvps_avx(auVar166,auVar25,auVar143);
      auVar143 = vandps_avx(auVar282,auVar202);
      auVar26 = vandps_avx(auVar296,auVar202);
      auVar251 = vmaxps_avx(auVar143,auVar26);
      auVar143 = vandps_avx(auVar235,auVar202);
      auVar143 = vmaxps_avx(auVar251,auVar143);
      auVar251 = vcmpps_avx(auVar143,auVar276,1);
      auVar143 = vblendvps_avx(auVar282,auVar24,auVar251);
      auVar24 = vblendvps_avx(auVar296,auVar25,auVar251);
      fVar303 = auVar31._0_4_;
      fVar150 = auVar31._4_4_;
      fVar152 = auVar31._8_4_;
      fVar154 = auVar31._12_4_;
      fVar156 = auVar31._16_4_;
      fVar155 = auVar31._20_4_;
      fVar157 = auVar31._24_4_;
      fVar158 = auVar143._0_4_;
      fVar159 = auVar143._4_4_;
      fVar160 = auVar143._8_4_;
      fVar188 = auVar143._12_4_;
      fVar271 = auVar143._16_4_;
      fVar242 = auVar143._20_4_;
      fVar191 = auVar143._24_4_;
      fVar256 = auVar16._0_4_;
      fVar317 = auVar16._4_4_;
      fVar319 = auVar16._8_4_;
      fVar181 = auVar16._12_4_;
      fVar182 = auVar16._16_4_;
      fVar184 = auVar16._20_4_;
      fVar185 = auVar16._24_4_;
      auVar136._0_4_ = fVar256 * fVar256 + fVar303 * fVar303;
      auVar136._4_4_ = fVar317 * fVar317 + fVar150 * fVar150;
      auVar136._8_4_ = fVar319 * fVar319 + fVar152 * fVar152;
      auVar136._12_4_ = fVar181 * fVar181 + fVar154 * fVar154;
      auVar136._16_4_ = fVar182 * fVar182 + fVar156 * fVar156;
      auVar136._20_4_ = fVar184 * fVar184 + fVar155 * fVar155;
      auVar136._24_4_ = fVar185 * fVar185 + fVar157 * fVar157;
      auVar136._28_4_ = auVar296._28_4_ + auVar31._28_4_;
      auVar25 = vrsqrtps_avx(auVar136);
      fVar257 = auVar25._0_4_;
      fVar316 = auVar25._4_4_;
      auVar27._4_4_ = fVar316 * 1.5;
      auVar27._0_4_ = fVar257 * 1.5;
      fVar183 = auVar25._8_4_;
      auVar27._8_4_ = fVar183 * 1.5;
      fVar334 = auVar25._12_4_;
      auVar27._12_4_ = fVar334 * 1.5;
      fVar318 = auVar25._16_4_;
      auVar27._16_4_ = fVar318 * 1.5;
      fVar186 = auVar25._20_4_;
      auVar27._20_4_ = fVar186 * 1.5;
      fVar335 = auVar25._24_4_;
      auVar27._24_4_ = fVar335 * 1.5;
      auVar27._28_4_ = auVar26._28_4_;
      auVar25._4_4_ = fVar316 * fVar316 * fVar316 * auVar136._4_4_ * 0.5;
      auVar25._0_4_ = fVar257 * fVar257 * fVar257 * auVar136._0_4_ * 0.5;
      auVar25._8_4_ = fVar183 * fVar183 * fVar183 * auVar136._8_4_ * 0.5;
      auVar25._12_4_ = fVar334 * fVar334 * fVar334 * auVar136._12_4_ * 0.5;
      auVar25._16_4_ = fVar318 * fVar318 * fVar318 * auVar136._16_4_ * 0.5;
      auVar25._20_4_ = fVar186 * fVar186 * fVar186 * auVar136._20_4_ * 0.5;
      auVar25._24_4_ = fVar335 * fVar335 * fVar335 * auVar136._24_4_ * 0.5;
      auVar25._28_4_ = auVar136._28_4_;
      auVar25 = vsubps_avx(auVar27,auVar25);
      fVar257 = auVar25._0_4_;
      fVar334 = auVar25._4_4_;
      fVar335 = auVar25._8_4_;
      fVar270 = auVar25._12_4_;
      fVar289 = auVar25._16_4_;
      fVar291 = auVar25._20_4_;
      fVar309 = auVar25._24_4_;
      fVar187 = auVar16._28_4_;
      fVar316 = auVar24._0_4_;
      fVar318 = auVar24._4_4_;
      fVar269 = auVar24._8_4_;
      fVar288 = auVar24._12_4_;
      fVar290 = auVar24._16_4_;
      fVar292 = auVar24._20_4_;
      fVar311 = auVar24._24_4_;
      auVar137._0_4_ = fVar316 * fVar316 + fVar158 * fVar158;
      auVar137._4_4_ = fVar318 * fVar318 + fVar159 * fVar159;
      auVar137._8_4_ = fVar269 * fVar269 + fVar160 * fVar160;
      auVar137._12_4_ = fVar288 * fVar288 + fVar188 * fVar188;
      auVar137._16_4_ = fVar290 * fVar290 + fVar271 * fVar271;
      auVar137._20_4_ = fVar292 * fVar292 + fVar242 * fVar242;
      auVar137._24_4_ = fVar311 * fVar311 + fVar191 * fVar191;
      auVar137._28_4_ = auVar143._28_4_ + auVar25._28_4_;
      auVar143 = vrsqrtps_avx(auVar137);
      fVar183 = auVar143._0_4_;
      fVar186 = auVar143._4_4_;
      auVar28._4_4_ = fVar186 * 1.5;
      auVar28._0_4_ = fVar183 * 1.5;
      fVar239 = auVar143._8_4_;
      auVar28._8_4_ = fVar239 * 1.5;
      fVar240 = auVar143._12_4_;
      auVar28._12_4_ = fVar240 * 1.5;
      fVar241 = auVar143._16_4_;
      auVar28._16_4_ = fVar241 * 1.5;
      fVar243 = auVar143._20_4_;
      auVar28._20_4_ = fVar243 * 1.5;
      fVar244 = auVar143._24_4_;
      auVar28._24_4_ = fVar244 * 1.5;
      auVar28._28_4_ = auVar26._28_4_;
      fVar278 = auVar143._28_4_;
      auVar29._4_4_ = fVar186 * fVar186 * fVar186 * auVar137._4_4_ * 0.5;
      auVar29._0_4_ = fVar183 * fVar183 * fVar183 * auVar137._0_4_ * 0.5;
      auVar29._8_4_ = fVar239 * fVar239 * fVar239 * auVar137._8_4_ * 0.5;
      auVar29._12_4_ = fVar240 * fVar240 * fVar240 * auVar137._12_4_ * 0.5;
      auVar29._16_4_ = fVar241 * fVar241 * fVar241 * auVar137._16_4_ * 0.5;
      auVar29._20_4_ = fVar243 * fVar243 * fVar243 * auVar137._20_4_ * 0.5;
      auVar29._24_4_ = fVar244 * fVar244 * fVar244 * auVar137._24_4_ * 0.5;
      auVar29._28_4_ = auVar137._28_4_;
      auVar143 = vsubps_avx(auVar28,auVar29);
      fVar183 = auVar143._0_4_;
      fVar186 = auVar143._4_4_;
      fVar239 = auVar143._8_4_;
      fVar240 = auVar143._12_4_;
      fVar241 = auVar143._16_4_;
      fVar243 = auVar143._20_4_;
      fVar244 = auVar143._24_4_;
      fVar256 = (float)local_660._0_4_ * fVar256 * fVar257;
      fVar317 = local_660._4_4_ * fVar317 * fVar334;
      auVar30._4_4_ = fVar317;
      auVar30._0_4_ = fVar256;
      fVar319 = local_660._8_4_ * fVar319 * fVar335;
      auVar30._8_4_ = fVar319;
      fVar181 = local_660._12_4_ * fVar181 * fVar270;
      auVar30._12_4_ = fVar181;
      fVar182 = local_660._16_4_ * fVar182 * fVar289;
      auVar30._16_4_ = fVar182;
      fVar184 = local_660._20_4_ * fVar184 * fVar291;
      auVar30._20_4_ = fVar184;
      fVar185 = local_660._24_4_ * fVar185 * fVar309;
      auVar30._24_4_ = fVar185;
      auVar30._28_4_ = fVar187;
      local_580._4_4_ = auVar275._4_4_ + fVar317;
      local_580._0_4_ = auVar275._0_4_ + fVar256;
      fStack_578 = auVar275._8_4_ + fVar319;
      fStack_574 = auVar275._12_4_ + fVar181;
      fStack_570 = auVar275._16_4_ + fVar182;
      fStack_56c = auVar275._20_4_ + fVar184;
      fStack_568 = auVar275._24_4_ + fVar185;
      fStack_564 = auVar275._28_4_ + fVar187;
      fVar256 = (float)local_660._0_4_ * fVar257 * -fVar303;
      fVar317 = local_660._4_4_ * fVar334 * -fVar150;
      auVar32._4_4_ = fVar317;
      auVar32._0_4_ = fVar256;
      fVar319 = local_660._8_4_ * fVar335 * -fVar152;
      auVar32._8_4_ = fVar319;
      fVar181 = local_660._12_4_ * fVar270 * -fVar154;
      auVar32._12_4_ = fVar181;
      fVar182 = local_660._16_4_ * fVar289 * -fVar156;
      auVar32._16_4_ = fVar182;
      fVar184 = local_660._20_4_ * fVar291 * -fVar155;
      auVar32._20_4_ = fVar184;
      fVar185 = local_660._24_4_ * fVar309 * -fVar157;
      auVar32._24_4_ = fVar185;
      auVar32._28_4_ = 0x3f000000;
      local_3a0._4_4_ = fVar317 + auVar322._4_4_;
      local_3a0._0_4_ = fVar256 + auVar322._0_4_;
      fStack_398 = fVar319 + auVar322._8_4_;
      fStack_394 = fVar181 + auVar322._12_4_;
      auStack_390._0_4_ = fVar182 + auVar322._16_4_;
      auStack_390._4_4_ = fVar184 + auVar322._20_4_;
      fStack_388 = fVar185 + auVar322._24_4_;
      fStack_384 = auVar322._28_4_ + 0.5;
      fVar256 = (float)local_660._0_4_ * fVar257 * 0.0;
      fVar257 = local_660._4_4_ * fVar334 * 0.0;
      auVar33._4_4_ = fVar257;
      auVar33._0_4_ = fVar256;
      fVar317 = local_660._8_4_ * fVar335 * 0.0;
      auVar33._8_4_ = fVar317;
      fVar334 = local_660._12_4_ * fVar270 * 0.0;
      auVar33._12_4_ = fVar334;
      fVar319 = local_660._16_4_ * fVar289 * 0.0;
      auVar33._16_4_ = fVar319;
      fVar335 = local_660._20_4_ * fVar291 * 0.0;
      auVar33._20_4_ = fVar335;
      fVar181 = local_660._24_4_ * fVar309 * 0.0;
      auVar33._24_4_ = fVar181;
      auVar33._28_4_ = fVar129;
      auVar106._4_4_ = fStack_4bc;
      auVar106._0_4_ = local_4c0;
      auVar106._8_4_ = fStack_4b8;
      auVar106._12_4_ = fStack_4b4;
      auVar106._16_4_ = fStack_4b0;
      auVar106._20_4_ = fStack_4ac;
      auVar106._24_4_ = fStack_4a8;
      auVar106._28_4_ = fStack_4a4;
      auVar283._0_4_ = fVar256 + local_4c0;
      auVar283._4_4_ = fVar257 + fStack_4bc;
      auVar283._8_4_ = fVar317 + fStack_4b8;
      auVar283._12_4_ = fVar334 + fStack_4b4;
      auVar283._16_4_ = fVar319 + fStack_4b0;
      auVar283._20_4_ = fVar335 + fStack_4ac;
      auVar283._24_4_ = fVar181 + fStack_4a8;
      auVar283._28_4_ = fVar129 + fStack_4a4;
      fVar256 = local_400._0_4_ * fVar316 * fVar183;
      fVar257 = local_400._4_4_ * fVar318 * fVar186;
      auVar34._4_4_ = fVar257;
      auVar34._0_4_ = fVar256;
      fVar316 = local_400._8_4_ * fVar269 * fVar239;
      auVar34._8_4_ = fVar316;
      fVar317 = local_400._12_4_ * fVar288 * fVar240;
      auVar34._12_4_ = fVar317;
      fVar334 = local_400._16_4_ * fVar290 * fVar241;
      auVar34._16_4_ = fVar334;
      fVar318 = local_400._20_4_ * fVar292 * fVar243;
      auVar34._20_4_ = fVar318;
      fVar319 = local_400._24_4_ * fVar311 * fVar244;
      auVar34._24_4_ = fVar319;
      auVar34._28_4_ = auVar24._28_4_;
      auVar31 = vsubps_avx(auVar275,auVar30);
      auVar305._0_4_ = (float)local_4e0._0_4_ + fVar256;
      auVar305._4_4_ = (float)local_4e0._4_4_ + fVar257;
      auVar305._8_4_ = fStack_4d8 + fVar316;
      auVar305._12_4_ = fStack_4d4 + fVar317;
      auVar305._16_4_ = fStack_4d0 + fVar334;
      auVar305._20_4_ = fStack_4cc + fVar318;
      auVar305._24_4_ = fStack_4c8 + fVar319;
      auVar305._28_4_ = register0x0000139c + auVar24._28_4_;
      fVar256 = local_400._0_4_ * -fVar158 * fVar183;
      fVar257 = local_400._4_4_ * -fVar159 * fVar186;
      auVar24._4_4_ = fVar257;
      auVar24._0_4_ = fVar256;
      fVar316 = local_400._8_4_ * -fVar160 * fVar239;
      auVar24._8_4_ = fVar316;
      fVar317 = local_400._12_4_ * -fVar188 * fVar240;
      auVar24._12_4_ = fVar317;
      fVar334 = local_400._16_4_ * -fVar271 * fVar241;
      auVar24._16_4_ = fVar334;
      fVar318 = local_400._20_4_ * -fVar242 * fVar243;
      auVar24._20_4_ = fVar318;
      fVar319 = local_400._24_4_ * -fVar191 * fVar244;
      auVar24._24_4_ = fVar319;
      auVar24._28_4_ = fVar187;
      auVar322 = vsubps_avx(auVar322,auVar32);
      auVar340._0_4_ = (float)local_4a0._0_4_ + fVar256;
      auVar340._4_4_ = (float)local_4a0._4_4_ + fVar257;
      auVar340._8_4_ = fStack_498 + fVar316;
      auVar340._12_4_ = fStack_494 + fVar317;
      auVar340._16_4_ = fStack_490 + fVar334;
      auVar340._20_4_ = fStack_48c + fVar318;
      auVar340._24_4_ = fStack_488 + fVar319;
      auVar340._28_4_ = fStack_484 + fVar187;
      fVar256 = fVar183 * 0.0 * local_400._0_4_;
      fVar257 = fVar186 * 0.0 * local_400._4_4_;
      auVar35._4_4_ = fVar257;
      auVar35._0_4_ = fVar256;
      fVar316 = fVar239 * 0.0 * local_400._8_4_;
      auVar35._8_4_ = fVar316;
      fVar183 = fVar240 * 0.0 * local_400._12_4_;
      auVar35._12_4_ = fVar183;
      fVar317 = fVar241 * 0.0 * local_400._16_4_;
      auVar35._16_4_ = fVar317;
      fVar334 = fVar243 * 0.0 * local_400._20_4_;
      auVar35._20_4_ = fVar334;
      fVar318 = fVar244 * 0.0 * local_400._24_4_;
      auVar35._24_4_ = fVar318;
      auVar35._28_4_ = fVar278;
      auVar251 = vsubps_avx(auVar106,auVar33);
      auVar108._4_4_ = fStack_3dc;
      auVar108._0_4_ = local_3e0;
      auVar108._8_4_ = fStack_3d8;
      auVar108._12_4_ = fStack_3d4;
      auVar108._16_4_ = fStack_3d0;
      auVar108._20_4_ = fStack_3cc;
      auVar108._24_4_ = fStack_3c8;
      auVar108._28_4_ = fStack_3c4;
      auVar351._0_4_ = local_3e0 + fVar256;
      auVar351._4_4_ = fStack_3dc + fVar257;
      auVar351._8_4_ = fStack_3d8 + fVar316;
      auVar351._12_4_ = fStack_3d4 + fVar183;
      auVar351._16_4_ = fStack_3d0 + fVar317;
      auVar351._20_4_ = fStack_3cc + fVar334;
      auVar351._24_4_ = fStack_3c8 + fVar318;
      auVar351._28_4_ = fStack_3c4 + fVar278;
      auVar143 = vsubps_avx(_local_4e0,auVar34);
      auVar26 = vsubps_avx(_local_4a0,auVar24);
      auVar24 = vsubps_avx(auVar108,auVar35);
      auVar25 = vsubps_avx(auVar340,auVar322);
      auVar16 = vsubps_avx(auVar351,auVar251);
      auVar36._4_4_ = auVar251._4_4_ * auVar25._4_4_;
      auVar36._0_4_ = auVar251._0_4_ * auVar25._0_4_;
      auVar36._8_4_ = auVar251._8_4_ * auVar25._8_4_;
      auVar36._12_4_ = auVar251._12_4_ * auVar25._12_4_;
      auVar36._16_4_ = auVar251._16_4_ * auVar25._16_4_;
      auVar36._20_4_ = auVar251._20_4_ * auVar25._20_4_;
      auVar36._24_4_ = auVar251._24_4_ * auVar25._24_4_;
      auVar36._28_4_ = fVar278;
      auVar37._4_4_ = auVar322._4_4_ * auVar16._4_4_;
      auVar37._0_4_ = auVar322._0_4_ * auVar16._0_4_;
      auVar37._8_4_ = auVar322._8_4_ * auVar16._8_4_;
      auVar37._12_4_ = auVar322._12_4_ * auVar16._12_4_;
      auVar37._16_4_ = auVar322._16_4_ * auVar16._16_4_;
      auVar37._20_4_ = auVar322._20_4_ * auVar16._20_4_;
      auVar37._24_4_ = auVar322._24_4_ * auVar16._24_4_;
      auVar37._28_4_ = fStack_484;
      auVar275 = vsubps_avx(auVar37,auVar36);
      auVar38._4_4_ = auVar31._4_4_ * auVar16._4_4_;
      auVar38._0_4_ = auVar31._0_4_ * auVar16._0_4_;
      auVar38._8_4_ = auVar31._8_4_ * auVar16._8_4_;
      auVar38._12_4_ = auVar31._12_4_ * auVar16._12_4_;
      auVar38._16_4_ = auVar31._16_4_ * auVar16._16_4_;
      auVar38._20_4_ = auVar31._20_4_ * auVar16._20_4_;
      auVar38._24_4_ = auVar31._24_4_ * auVar16._24_4_;
      auVar38._28_4_ = auVar16._28_4_;
      auVar27 = vsubps_avx(auVar305,auVar31);
      auVar39._4_4_ = auVar251._4_4_ * auVar27._4_4_;
      auVar39._0_4_ = auVar251._0_4_ * auVar27._0_4_;
      auVar39._8_4_ = auVar251._8_4_ * auVar27._8_4_;
      auVar39._12_4_ = auVar251._12_4_ * auVar27._12_4_;
      auVar39._16_4_ = auVar251._16_4_ * auVar27._16_4_;
      auVar39._20_4_ = auVar251._20_4_ * auVar27._20_4_;
      auVar39._24_4_ = auVar251._24_4_ * auVar27._24_4_;
      auVar39._28_4_ = register0x0000139c;
      auVar28 = vsubps_avx(auVar39,auVar38);
      auVar40._4_4_ = auVar322._4_4_ * auVar27._4_4_;
      auVar40._0_4_ = auVar322._0_4_ * auVar27._0_4_;
      auVar40._8_4_ = auVar322._8_4_ * auVar27._8_4_;
      auVar40._12_4_ = auVar322._12_4_ * auVar27._12_4_;
      auVar40._16_4_ = auVar322._16_4_ * auVar27._16_4_;
      auVar40._20_4_ = auVar322._20_4_ * auVar27._20_4_;
      auVar40._24_4_ = auVar322._24_4_ * auVar27._24_4_;
      auVar40._28_4_ = auVar16._28_4_;
      auVar41._4_4_ = auVar31._4_4_ * auVar25._4_4_;
      auVar41._0_4_ = auVar31._0_4_ * auVar25._0_4_;
      auVar41._8_4_ = auVar31._8_4_ * auVar25._8_4_;
      auVar41._12_4_ = auVar31._12_4_ * auVar25._12_4_;
      auVar41._16_4_ = auVar31._16_4_ * auVar25._16_4_;
      auVar41._20_4_ = auVar31._20_4_ * auVar25._20_4_;
      auVar41._24_4_ = auVar31._24_4_ * auVar25._24_4_;
      auVar41._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar41,auVar40);
      auVar138._0_4_ = auVar275._0_4_ * 0.0 + auVar25._0_4_ + auVar28._0_4_ * 0.0;
      auVar138._4_4_ = auVar275._4_4_ * 0.0 + auVar25._4_4_ + auVar28._4_4_ * 0.0;
      auVar138._8_4_ = auVar275._8_4_ * 0.0 + auVar25._8_4_ + auVar28._8_4_ * 0.0;
      auVar138._12_4_ = auVar275._12_4_ * 0.0 + auVar25._12_4_ + auVar28._12_4_ * 0.0;
      auVar138._16_4_ = auVar275._16_4_ * 0.0 + auVar25._16_4_ + auVar28._16_4_ * 0.0;
      auVar138._20_4_ = auVar275._20_4_ * 0.0 + auVar25._20_4_ + auVar28._20_4_ * 0.0;
      auVar138._24_4_ = auVar275._24_4_ * 0.0 + auVar25._24_4_ + auVar28._24_4_ * 0.0;
      auVar138._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar28._28_4_;
      auVar275 = vcmpps_avx(auVar138,ZEXT832(0) << 0x20,2);
      _local_560 = vblendvps_avx(auVar143,_local_580,auVar275);
      local_380 = vblendvps_avx(auVar26,_local_3a0,auVar275);
      auVar143 = vblendvps_avx(auVar24,auVar283,auVar275);
      auVar26 = vblendvps_avx(auVar31,auVar305,auVar275);
      auVar24 = vblendvps_avx(auVar322,auVar340,auVar275);
      auVar25 = vblendvps_avx(auVar251,auVar351,auVar275);
      auVar31 = vblendvps_avx(auVar305,auVar31,auVar275);
      auVar16 = vblendvps_avx(auVar340,auVar322,auVar275);
      auVar250 = vpackssdw_avx(local_2c0._0_16_,local_2c0._16_16_);
      auVar251 = vblendvps_avx(auVar351,auVar251,auVar275);
      auVar31 = vsubps_avx(auVar31,_local_560);
      auVar16 = vsubps_avx(auVar16,local_380);
      auVar251 = vsubps_avx(auVar251,auVar143);
      auVar27 = vsubps_avx(local_380,auVar24);
      fVar256 = auVar16._0_4_;
      fVar155 = auVar143._0_4_;
      fVar334 = auVar16._4_4_;
      fVar157 = auVar143._4_4_;
      auVar42._4_4_ = fVar157 * fVar334;
      auVar42._0_4_ = fVar155 * fVar256;
      fVar269 = auVar16._8_4_;
      fVar158 = auVar143._8_4_;
      auVar42._8_4_ = fVar158 * fVar269;
      fVar240 = auVar16._12_4_;
      fVar159 = auVar143._12_4_;
      auVar42._12_4_ = fVar159 * fVar240;
      fVar184 = auVar16._16_4_;
      fVar160 = auVar143._16_4_;
      auVar42._16_4_ = fVar160 * fVar184;
      fVar309 = auVar16._20_4_;
      fVar188 = auVar143._20_4_;
      auVar42._20_4_ = fVar188 * fVar309;
      fVar303 = auVar16._24_4_;
      fVar271 = auVar143._24_4_;
      auVar42._24_4_ = fVar271 * fVar303;
      auVar42._28_4_ = local_2c0._28_4_;
      fVar257 = local_380._0_4_;
      fVar293 = auVar251._0_4_;
      fVar318 = local_380._4_4_;
      fVar300 = auVar251._4_4_;
      auVar43._4_4_ = fVar300 * fVar318;
      auVar43._0_4_ = fVar293 * fVar257;
      fVar239 = local_380._8_4_;
      fVar301 = auVar251._8_4_;
      auVar43._8_4_ = fVar301 * fVar239;
      fVar182 = local_380._12_4_;
      fVar302 = auVar251._12_4_;
      auVar43._12_4_ = fVar302 * fVar182;
      fVar291 = local_380._16_4_;
      fVar265 = auVar251._16_4_;
      auVar43._16_4_ = fVar265 * fVar291;
      fVar311 = local_380._20_4_;
      fVar267 = auVar251._20_4_;
      auVar43._20_4_ = fVar267 * fVar311;
      fVar150 = local_380._24_4_;
      fVar268 = auVar251._24_4_;
      uVar126 = auVar322._28_4_;
      auVar43._24_4_ = fVar268 * fVar150;
      auVar43._28_4_ = uVar126;
      auVar322 = vsubps_avx(auVar43,auVar42);
      fVar316 = local_560._0_4_;
      fVar186 = local_560._4_4_;
      auVar44._4_4_ = fVar300 * fVar186;
      auVar44._0_4_ = fVar293 * fVar316;
      fVar181 = local_560._8_4_;
      auVar44._8_4_ = fVar301 * fVar181;
      fVar289 = local_560._12_4_;
      auVar44._12_4_ = fVar302 * fVar289;
      fVar292 = local_560._16_4_;
      auVar44._16_4_ = fVar265 * fVar292;
      fVar244 = local_560._20_4_;
      auVar44._20_4_ = fVar267 * fVar244;
      fVar152 = local_560._24_4_;
      auVar44._24_4_ = fVar268 * fVar152;
      auVar44._28_4_ = uVar126;
      fVar183 = auVar31._0_4_;
      fVar319 = auVar31._4_4_;
      auVar45._4_4_ = fVar157 * fVar319;
      auVar45._0_4_ = fVar155 * fVar183;
      fVar270 = auVar31._8_4_;
      auVar45._8_4_ = fVar158 * fVar270;
      fVar290 = auVar31._12_4_;
      auVar45._12_4_ = fVar159 * fVar290;
      fVar243 = auVar31._16_4_;
      auVar45._16_4_ = fVar160 * fVar243;
      fVar187 = auVar31._20_4_;
      auVar45._20_4_ = fVar188 * fVar187;
      fVar154 = auVar31._24_4_;
      auVar45._24_4_ = fVar271 * fVar154;
      auVar45._28_4_ = auVar340._28_4_;
      auVar28 = vsubps_avx(auVar45,auVar44);
      auVar46._4_4_ = fVar318 * fVar319;
      auVar46._0_4_ = fVar257 * fVar183;
      auVar46._8_4_ = fVar239 * fVar270;
      auVar46._12_4_ = fVar182 * fVar290;
      auVar46._16_4_ = fVar291 * fVar243;
      auVar46._20_4_ = fVar311 * fVar187;
      auVar46._24_4_ = fVar150 * fVar154;
      auVar46._28_4_ = uVar126;
      auVar47._4_4_ = fVar186 * fVar334;
      auVar47._0_4_ = fVar316 * fVar256;
      auVar47._8_4_ = fVar181 * fVar269;
      auVar47._12_4_ = fVar289 * fVar240;
      auVar47._16_4_ = fVar292 * fVar184;
      auVar47._20_4_ = fVar244 * fVar309;
      auVar47._24_4_ = fVar152 * fVar303;
      auVar47._28_4_ = auVar351._28_4_;
      auVar29 = vsubps_avx(auVar47,auVar46);
      auVar30 = vsubps_avx(auVar143,auVar25);
      fVar317 = auVar29._28_4_ + auVar28._28_4_;
      auVar236._0_4_ = auVar29._0_4_ + auVar28._0_4_ * 0.0 + auVar322._0_4_ * 0.0;
      auVar236._4_4_ = auVar29._4_4_ + auVar28._4_4_ * 0.0 + auVar322._4_4_ * 0.0;
      auVar236._8_4_ = auVar29._8_4_ + auVar28._8_4_ * 0.0 + auVar322._8_4_ * 0.0;
      auVar236._12_4_ = auVar29._12_4_ + auVar28._12_4_ * 0.0 + auVar322._12_4_ * 0.0;
      auVar236._16_4_ = auVar29._16_4_ + auVar28._16_4_ * 0.0 + auVar322._16_4_ * 0.0;
      auVar236._20_4_ = auVar29._20_4_ + auVar28._20_4_ * 0.0 + auVar322._20_4_ * 0.0;
      auVar236._24_4_ = auVar29._24_4_ + auVar28._24_4_ * 0.0 + auVar322._24_4_ * 0.0;
      auVar236._28_4_ = fVar317 + 0.0;
      fVar242 = auVar27._0_4_;
      fVar191 = auVar27._4_4_;
      auVar48._4_4_ = fVar191 * auVar25._4_4_;
      auVar48._0_4_ = fVar242 * auVar25._0_4_;
      fVar206 = auVar27._8_4_;
      auVar48._8_4_ = fVar206 * auVar25._8_4_;
      fVar209 = auVar27._12_4_;
      auVar48._12_4_ = fVar209 * auVar25._12_4_;
      fVar212 = auVar27._16_4_;
      auVar48._16_4_ = fVar212 * auVar25._16_4_;
      fVar245 = auVar27._20_4_;
      auVar48._20_4_ = fVar245 * auVar25._20_4_;
      fVar260 = auVar27._24_4_;
      auVar48._24_4_ = fVar260 * auVar25._24_4_;
      auVar48._28_4_ = fVar317;
      fVar317 = auVar30._0_4_;
      fVar335 = auVar30._4_4_;
      auVar49._4_4_ = auVar24._4_4_ * fVar335;
      auVar49._0_4_ = auVar24._0_4_ * fVar317;
      fVar288 = auVar30._8_4_;
      auVar49._8_4_ = auVar24._8_4_ * fVar288;
      fVar241 = auVar30._12_4_;
      auVar49._12_4_ = auVar24._12_4_ * fVar241;
      fVar185 = auVar30._16_4_;
      auVar49._16_4_ = auVar24._16_4_ * fVar185;
      fVar278 = auVar30._20_4_;
      auVar49._20_4_ = auVar24._20_4_ * fVar278;
      fVar156 = auVar30._24_4_;
      auVar49._24_4_ = auVar24._24_4_ * fVar156;
      auVar49._28_4_ = auVar29._28_4_;
      auVar322 = vsubps_avx(auVar49,auVar48);
      auVar27 = vsubps_avx(_local_560,auVar26);
      fVar336 = auVar27._0_4_;
      fVar342 = auVar27._4_4_;
      auVar50._4_4_ = fVar342 * auVar25._4_4_;
      auVar50._0_4_ = fVar336 * auVar25._0_4_;
      fVar343 = auVar27._8_4_;
      auVar50._8_4_ = fVar343 * auVar25._8_4_;
      fVar344 = auVar27._12_4_;
      auVar50._12_4_ = fVar344 * auVar25._12_4_;
      fVar345 = auVar27._16_4_;
      auVar50._16_4_ = fVar345 * auVar25._16_4_;
      fVar346 = auVar27._20_4_;
      auVar50._20_4_ = fVar346 * auVar25._20_4_;
      fVar347 = auVar27._24_4_;
      auVar50._24_4_ = fVar347 * auVar25._24_4_;
      auVar50._28_4_ = auVar25._28_4_;
      auVar51._4_4_ = auVar26._4_4_ * fVar335;
      auVar51._0_4_ = auVar26._0_4_ * fVar317;
      auVar51._8_4_ = auVar26._8_4_ * fVar288;
      auVar51._12_4_ = auVar26._12_4_ * fVar241;
      auVar51._16_4_ = auVar26._16_4_ * fVar185;
      auVar51._20_4_ = auVar26._20_4_ * fVar278;
      auVar51._24_4_ = auVar26._24_4_ * fVar156;
      auVar51._28_4_ = 0;
      auVar27 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = auVar24._4_4_ * fVar342;
      auVar52._0_4_ = auVar24._0_4_ * fVar336;
      auVar52._8_4_ = auVar24._8_4_ * fVar343;
      auVar52._12_4_ = auVar24._12_4_ * fVar344;
      auVar52._16_4_ = auVar24._16_4_ * fVar345;
      auVar52._20_4_ = auVar24._20_4_ * fVar346;
      auVar52._24_4_ = auVar24._24_4_ * fVar347;
      auVar52._28_4_ = auVar25._28_4_;
      auVar53._4_4_ = auVar26._4_4_ * fVar191;
      auVar53._0_4_ = auVar26._0_4_ * fVar242;
      auVar53._8_4_ = auVar26._8_4_ * fVar206;
      auVar53._12_4_ = auVar26._12_4_ * fVar209;
      auVar53._16_4_ = auVar26._16_4_ * fVar212;
      auVar53._20_4_ = auVar26._20_4_ * fVar245;
      auVar53._24_4_ = auVar26._24_4_ * fVar260;
      auVar53._28_4_ = auVar26._28_4_;
      auVar26 = vsubps_avx(auVar53,auVar52);
      auVar203._0_4_ = auVar322._0_4_ * 0.0 + auVar26._0_4_ + auVar27._0_4_ * 0.0;
      auVar203._4_4_ = auVar322._4_4_ * 0.0 + auVar26._4_4_ + auVar27._4_4_ * 0.0;
      auVar203._8_4_ = auVar322._8_4_ * 0.0 + auVar26._8_4_ + auVar27._8_4_ * 0.0;
      auVar203._12_4_ = auVar322._12_4_ * 0.0 + auVar26._12_4_ + auVar27._12_4_ * 0.0;
      auVar203._16_4_ = auVar322._16_4_ * 0.0 + auVar26._16_4_ + auVar27._16_4_ * 0.0;
      auVar203._20_4_ = auVar322._20_4_ * 0.0 + auVar26._20_4_ + auVar27._20_4_ * 0.0;
      auVar203._24_4_ = auVar322._24_4_ * 0.0 + auVar26._24_4_ + auVar27._24_4_ * 0.0;
      auVar203._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar27._28_4_;
      auVar26 = vmaxps_avx(auVar236,auVar203);
      auVar26 = vcmpps_avx(auVar26,ZEXT832(0) << 0x20,2);
      auVar197 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
      auVar250 = vpand_avx(auVar250,auVar197);
      auVar197 = vpmovsxwd_avx(auVar250);
      auVar234 = vpunpckhwd_avx(auVar250,auVar250);
      auVar139._16_16_ = auVar234;
      auVar139._0_16_ = auVar197;
      if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar139 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar139 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar139 >> 0x7f,0) == '\0') &&
            (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar234 >> 0x3f,0) == '\0') &&
          (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar234[0xf]
         ) {
LAB_0090554d:
        auVar168._8_8_ = local_460[1]._8_8_;
        auVar168._0_8_ = local_460[1]._0_8_;
        auVar168._16_8_ = local_460[1]._16_8_;
        auVar168._24_8_ = local_460[1]._24_8_;
        auVar287 = ZEXT3264(local_700);
        auVar299 = ZEXT3264(local_6a0);
      }
      else {
        _local_4e0 = auVar236;
        auVar54._4_4_ = fVar335 * fVar334;
        auVar54._0_4_ = fVar317 * fVar256;
        auVar54._8_4_ = fVar288 * fVar269;
        auVar54._12_4_ = fVar241 * fVar240;
        auVar54._16_4_ = fVar185 * fVar184;
        auVar54._20_4_ = fVar278 * fVar309;
        auVar54._24_4_ = fVar156 * fVar303;
        auVar54._28_4_ = auVar234._12_4_;
        auVar323._0_4_ = fVar242 * fVar293;
        auVar323._4_4_ = fVar191 * fVar300;
        auVar323._8_4_ = fVar206 * fVar301;
        auVar323._12_4_ = fVar209 * fVar302;
        auVar323._16_4_ = fVar212 * fVar265;
        auVar323._20_4_ = fVar245 * fVar267;
        auVar323._24_4_ = fVar260 * fVar268;
        auVar323._28_4_ = 0;
        auVar24 = vsubps_avx(auVar323,auVar54);
        auVar55._4_4_ = fVar342 * fVar300;
        auVar55._0_4_ = fVar336 * fVar293;
        auVar55._8_4_ = fVar343 * fVar301;
        auVar55._12_4_ = fVar344 * fVar302;
        auVar55._16_4_ = fVar345 * fVar265;
        auVar55._20_4_ = fVar346 * fVar267;
        auVar55._24_4_ = fVar347 * fVar268;
        auVar55._28_4_ = auVar251._28_4_;
        auVar56._4_4_ = fVar335 * fVar319;
        auVar56._0_4_ = fVar317 * fVar183;
        auVar56._8_4_ = fVar288 * fVar270;
        auVar56._12_4_ = fVar241 * fVar290;
        auVar56._16_4_ = fVar185 * fVar243;
        auVar56._20_4_ = fVar278 * fVar187;
        auVar56._24_4_ = fVar156 * fVar154;
        auVar56._28_4_ = auVar30._28_4_;
        auVar25 = vsubps_avx(auVar56,auVar55);
        auVar57._4_4_ = fVar191 * fVar319;
        auVar57._0_4_ = fVar242 * fVar183;
        auVar57._8_4_ = fVar206 * fVar270;
        auVar57._12_4_ = fVar209 * fVar290;
        auVar57._16_4_ = fVar212 * fVar243;
        auVar57._20_4_ = fVar245 * fVar187;
        auVar57._24_4_ = fVar260 * fVar154;
        auVar57._28_4_ = auVar31._28_4_;
        auVar58._4_4_ = fVar342 * fVar334;
        auVar58._0_4_ = fVar336 * fVar256;
        auVar58._8_4_ = fVar343 * fVar269;
        auVar58._12_4_ = fVar344 * fVar240;
        auVar58._16_4_ = fVar345 * fVar184;
        auVar58._20_4_ = fVar346 * fVar309;
        auVar58._24_4_ = fVar347 * fVar303;
        auVar58._28_4_ = auVar16._28_4_;
        auVar251 = vsubps_avx(auVar58,auVar57);
        auVar277._0_4_ = auVar24._0_4_ * 0.0 + auVar251._0_4_ + auVar25._0_4_ * 0.0;
        auVar277._4_4_ = auVar24._4_4_ * 0.0 + auVar251._4_4_ + auVar25._4_4_ * 0.0;
        auVar277._8_4_ = auVar24._8_4_ * 0.0 + auVar251._8_4_ + auVar25._8_4_ * 0.0;
        auVar277._12_4_ = auVar24._12_4_ * 0.0 + auVar251._12_4_ + auVar25._12_4_ * 0.0;
        auVar277._16_4_ = auVar24._16_4_ * 0.0 + auVar251._16_4_ + auVar25._16_4_ * 0.0;
        auVar277._20_4_ = auVar24._20_4_ * 0.0 + auVar251._20_4_ + auVar25._20_4_ * 0.0;
        auVar277._24_4_ = auVar24._24_4_ * 0.0 + auVar251._24_4_ + auVar25._24_4_ * 0.0;
        auVar277._28_4_ = auVar16._28_4_ + auVar251._28_4_ + auVar31._28_4_;
        auVar26 = vrcpps_avx(auVar277);
        fVar183 = auVar26._0_4_;
        fVar317 = auVar26._4_4_;
        auVar59._4_4_ = auVar277._4_4_ * fVar317;
        auVar59._0_4_ = auVar277._0_4_ * fVar183;
        fVar334 = auVar26._8_4_;
        auVar59._8_4_ = auVar277._8_4_ * fVar334;
        fVar319 = auVar26._12_4_;
        auVar59._12_4_ = auVar277._12_4_ * fVar319;
        fVar335 = auVar26._16_4_;
        auVar59._16_4_ = auVar277._16_4_ * fVar335;
        fVar269 = auVar26._20_4_;
        auVar59._20_4_ = auVar277._20_4_ * fVar269;
        fVar270 = auVar26._24_4_;
        auVar59._24_4_ = auVar277._24_4_ * fVar270;
        auVar59._28_4_ = auVar30._28_4_;
        auVar324._8_4_ = 0x3f800000;
        auVar324._0_8_ = 0x3f8000003f800000;
        auVar324._12_4_ = 0x3f800000;
        auVar324._16_4_ = 0x3f800000;
        auVar324._20_4_ = 0x3f800000;
        auVar324._24_4_ = 0x3f800000;
        auVar324._28_4_ = 0x3f800000;
        auVar26 = vsubps_avx(auVar324,auVar59);
        fVar183 = auVar26._0_4_ * fVar183 + fVar183;
        fVar317 = auVar26._4_4_ * fVar317 + fVar317;
        fVar334 = auVar26._8_4_ * fVar334 + fVar334;
        fVar319 = auVar26._12_4_ * fVar319 + fVar319;
        fVar335 = auVar26._16_4_ * fVar335 + fVar335;
        fVar269 = auVar26._20_4_ * fVar269 + fVar269;
        fVar270 = auVar26._24_4_ * fVar270 + fVar270;
        auVar60._4_4_ =
             (auVar24._4_4_ * fVar186 + auVar25._4_4_ * fVar318 + auVar251._4_4_ * fVar157) *
             fVar317;
        auVar60._0_4_ =
             (auVar24._0_4_ * fVar316 + auVar25._0_4_ * fVar257 + auVar251._0_4_ * fVar155) *
             fVar183;
        auVar60._8_4_ =
             (auVar24._8_4_ * fVar181 + auVar25._8_4_ * fVar239 + auVar251._8_4_ * fVar158) *
             fVar334;
        auVar60._12_4_ =
             (auVar24._12_4_ * fVar289 + auVar25._12_4_ * fVar182 + auVar251._12_4_ * fVar159) *
             fVar319;
        auVar60._16_4_ =
             (auVar24._16_4_ * fVar292 + auVar25._16_4_ * fVar291 + auVar251._16_4_ * fVar160) *
             fVar335;
        auVar60._20_4_ =
             (auVar24._20_4_ * fVar244 + auVar25._20_4_ * fVar311 + auVar251._20_4_ * fVar188) *
             fVar269;
        auVar60._24_4_ =
             (auVar24._24_4_ * fVar152 + auVar25._24_4_ * fVar150 + auVar251._24_4_ * fVar271) *
             fVar270;
        auVar60._28_4_ = auVar236._28_4_ + auVar143._28_4_;
        auVar140._16_16_ = auVar279;
        auVar140._0_16_ = auVar279;
        auVar143 = vcmpps_avx(auVar140,auVar60,2);
        fVar256 = (local_7b0->super_RayK<1>).tfar;
        auVar167._4_4_ = fVar256;
        auVar167._0_4_ = fVar256;
        auVar167._8_4_ = fVar256;
        auVar167._12_4_ = fVar256;
        auVar167._16_4_ = fVar256;
        auVar167._20_4_ = fVar256;
        auVar167._24_4_ = fVar256;
        auVar167._28_4_ = fVar256;
        auVar26 = vcmpps_avx(auVar60,auVar167,2);
        auVar143 = vandps_avx(auVar26,auVar143);
        auVar197 = vpackssdw_avx(auVar143._0_16_,auVar143._16_16_);
        auVar250 = vpand_avx(auVar250,auVar197);
        auVar197 = vpmovsxwd_avx(auVar250);
        auVar234 = vpshufd_avx(auVar250,0xee);
        auVar234 = vpmovsxwd_avx(auVar234);
        auVar141._16_16_ = auVar234;
        auVar141._0_16_ = auVar197;
        if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar141 >> 0x7f,0) == '\0') &&
              (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar234 >> 0x3f,0) == '\0') &&
            (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar234[0xf]) goto LAB_0090554d;
        auVar143 = vcmpps_avx(ZEXT832(0) << 0x20,auVar277,4);
        auVar197 = vpackssdw_avx(auVar143._0_16_,auVar143._16_16_);
        auVar250 = vpand_avx(auVar250,auVar197);
        auVar197 = vpmovsxwd_avx(auVar250);
        auVar250 = vpunpckhwd_avx(auVar250,auVar250);
        auVar252._16_16_ = auVar250;
        auVar252._0_16_ = auVar197;
        auVar168._8_8_ = local_460[1]._8_8_;
        auVar168._0_8_ = local_460[1]._0_8_;
        auVar168._16_8_ = local_460[1]._16_8_;
        auVar168._24_8_ = local_460[1]._24_8_;
        auVar287 = ZEXT3264(local_700);
        auVar299 = ZEXT3264(local_6a0);
        if ((((((((auVar252 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar252 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar252 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar252 >> 0x7f,0) != '\0') ||
              (auVar252 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar250 >> 0x3f,0) != '\0') ||
            (auVar252 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar250[0xf] < '\0') {
          auVar142._0_4_ = fVar183 * auVar236._0_4_;
          auVar142._4_4_ = fVar317 * auVar236._4_4_;
          auVar142._8_4_ = fVar334 * auVar236._8_4_;
          auVar142._12_4_ = fVar319 * auVar236._12_4_;
          auVar142._16_4_ = fVar335 * auVar236._16_4_;
          auVar142._20_4_ = fVar269 * auVar236._20_4_;
          auVar142._24_4_ = fVar270 * auVar236._24_4_;
          auVar142._28_4_ = 0;
          auVar61._4_4_ = auVar203._4_4_ * fVar317;
          auVar61._0_4_ = auVar203._0_4_ * fVar183;
          auVar61._8_4_ = auVar203._8_4_ * fVar334;
          auVar61._12_4_ = auVar203._12_4_ * fVar319;
          auVar61._16_4_ = auVar203._16_4_ * fVar335;
          auVar61._20_4_ = auVar203._20_4_ * fVar269;
          auVar61._24_4_ = auVar203._24_4_ * fVar270;
          auVar61._28_4_ = SUB84(local_460[1]._24_8_,4);
          auVar262._8_4_ = 0x3f800000;
          auVar262._0_8_ = 0x3f8000003f800000;
          auVar262._12_4_ = 0x3f800000;
          auVar262._16_4_ = 0x3f800000;
          auVar262._20_4_ = 0x3f800000;
          auVar262._24_4_ = 0x3f800000;
          auVar262._28_4_ = 0x3f800000;
          auVar143 = vsubps_avx(auVar262,auVar142);
          auVar143 = vblendvps_avx(auVar143,auVar142,auVar275);
          auVar287 = ZEXT3264(auVar143);
          auVar143 = vsubps_avx(auVar262,auVar61);
          _local_2e0 = vblendvps_avx(auVar143,auVar61,auVar275);
          auVar299 = ZEXT3264(auVar60);
          auVar168 = auVar252;
        }
      }
      auVar327 = ZEXT1664(auVar321);
      auVar308 = ZEXT3264(auVar201);
      if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar168 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar168 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar168 >> 0x7f,0) == '\0') &&
            (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar168 >> 0xbf,0) == '\0') &&
          (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar168[0x1f]) {
        auVar254 = ZEXT3264(_local_600);
      }
      else {
        auVar143 = vsubps_avx(local_400,local_660);
        fVar257 = (float)local_660._0_4_ + auVar287._0_4_ * auVar143._0_4_;
        fVar316 = local_660._4_4_ + auVar287._4_4_ * auVar143._4_4_;
        fVar183 = local_660._8_4_ + auVar287._8_4_ * auVar143._8_4_;
        fVar317 = local_660._12_4_ + auVar287._12_4_ * auVar143._12_4_;
        fVar334 = local_660._16_4_ + auVar287._16_4_ * auVar143._16_4_;
        fVar318 = local_660._20_4_ + auVar287._20_4_ * auVar143._20_4_;
        fVar186 = local_660._24_4_ + auVar287._24_4_ * auVar143._24_4_;
        fVar319 = auVar143._28_4_ + 0.0;
        fVar256 = local_778->depth_scale;
        auVar62._4_4_ = (fVar316 + fVar316) * fVar256;
        auVar62._0_4_ = (fVar257 + fVar257) * fVar256;
        auVar62._8_4_ = (fVar183 + fVar183) * fVar256;
        auVar62._12_4_ = (fVar317 + fVar317) * fVar256;
        auVar62._16_4_ = (fVar334 + fVar334) * fVar256;
        auVar62._20_4_ = (fVar318 + fVar318) * fVar256;
        auVar62._24_4_ = (fVar186 + fVar186) * fVar256;
        auVar62._28_4_ = fVar319 + fVar319;
        local_1e0 = auVar299._0_32_;
        auVar143 = vcmpps_avx(local_1e0,auVar62,6);
        auVar26 = auVar168 & auVar143;
        auVar254 = ZEXT3264(_local_600);
        if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0x7f,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0xbf,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar26[0x1f] < '\0') {
          local_2e0._0_4_ = (float)local_2e0._0_4_ + (float)local_2e0._0_4_ + -1.0;
          local_2e0._4_4_ = (float)local_2e0._4_4_ + (float)local_2e0._4_4_ + -1.0;
          uStack_2d8._0_4_ = (float)uStack_2d8 + (float)uStack_2d8 + -1.0;
          uStack_2d8._4_4_ = uStack_2d8._4_4_ + uStack_2d8._4_4_ + -1.0;
          uStack_2d0._0_4_ = (float)uStack_2d0 + (float)uStack_2d0 + -1.0;
          uStack_2d0._4_4_ = uStack_2d0._4_4_ + uStack_2d0._4_4_ + -1.0;
          uStack_2c8._0_4_ = (float)uStack_2c8 + (float)uStack_2c8 + -1.0;
          uStack_2c8._4_4_ = uStack_2c8._4_4_ + uStack_2c8._4_4_ + -1.0;
          local_220 = auVar287._0_32_;
          auVar114 = _local_2e0;
          auVar26 = _local_2e0;
          local_200 = (float)local_2e0._0_4_;
          fStack_1fc = (float)local_2e0._4_4_;
          fStack_1f8 = (float)uStack_2d8;
          fStack_1f4 = uStack_2d8._4_4_;
          fStack_1f0 = (float)uStack_2d0;
          fStack_1ec = uStack_2d0._4_4_;
          fStack_1e8 = (float)uStack_2c8;
          fStack_1e4 = uStack_2c8._4_4_;
          local_1c0 = 0;
          local_1bc = uVar123;
          uStack_788 = auVar232._8_8_;
          local_1b0 = auVar232._0_8_;
          uStack_1a8 = uStack_788;
          uStack_6b8 = auVar350._8_8_;
          local_1a0 = auVar350._0_8_;
          uStack_198 = uStack_6b8;
          local_190 = local_6d0;
          uStack_188 = uStack_6c8;
          uStack_6a8 = auVar330._8_8_;
          local_180 = auVar330._0_8_;
          uStack_178 = uStack_6a8;
          local_770.ray = (RTCRayN *)local_7b0;
          _local_790 = auVar22;
          _local_6d0 = auVar23;
          _local_6c0 = auVar18;
          _local_6b0 = auVar19;
          if ((pGVar124->mask & (local_7b0->super_RayK<1>).mask) != 0) {
            auVar143 = vandps_avx(auVar143,auVar168);
            local_460[0] = auVar143;
            auVar194._0_4_ = 1.0 / auVar321._0_4_;
            auVar194._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar250 = vshufps_avx(auVar194,auVar194,0);
            local_140[0] = auVar250._0_4_ * (auVar287._0_4_ + 0.0);
            local_140[1] = auVar250._4_4_ * (auVar287._4_4_ + 1.0);
            local_140[2] = auVar250._8_4_ * (auVar287._8_4_ + 2.0);
            local_140[3] = auVar250._12_4_ * (auVar287._12_4_ + 3.0);
            fStack_130 = auVar250._0_4_ * (auVar287._16_4_ + 4.0);
            fStack_12c = auVar250._4_4_ * (auVar287._20_4_ + 5.0);
            fStack_128 = auVar250._8_4_ * (auVar287._24_4_ + 6.0);
            fStack_124 = auVar287._28_4_ + 7.0;
            uStack_2d0 = auVar114._16_8_;
            uStack_2c8 = auVar26._24_8_;
            local_120 = local_2e0;
            uStack_118 = uStack_2d8;
            uStack_110 = uStack_2d0;
            uStack_108 = uStack_2c8;
            local_100 = local_1e0;
            auVar169._8_4_ = 0x7f800000;
            auVar169._0_8_ = 0x7f8000007f800000;
            auVar169._12_4_ = 0x7f800000;
            auVar169._16_4_ = 0x7f800000;
            auVar169._20_4_ = 0x7f800000;
            auVar169._24_4_ = 0x7f800000;
            auVar169._28_4_ = 0x7f800000;
            auVar24 = vblendvps_avx(auVar169,local_1e0,auVar143);
            auVar25 = vshufps_avx(auVar24,auVar24,0xb1);
            auVar25 = vminps_avx(auVar24,auVar25);
            auVar31 = vshufpd_avx(auVar25,auVar25,5);
            auVar25 = vminps_avx(auVar25,auVar31);
            auVar31 = vperm2f128_avx(auVar25,auVar25,1);
            auVar25 = vminps_avx(auVar25,auVar31);
            auVar24 = vcmpps_avx(auVar24,auVar25,0);
            auVar25 = auVar143 & auVar24;
            local_79c = uVar123;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar143 = vandps_avx(auVar24,auVar143);
            }
            uVar115 = vmovmskps_avx(auVar143);
            uVar123 = 0;
            if (uVar115 != 0) {
              for (; (uVar115 >> uVar123 & 1) == 0; uVar123 = uVar123 + 1) {
              }
            }
            uVar118 = (ulong)uVar123;
            _local_2e0 = auVar26;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar124->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_6a0 = local_1e0;
              local_660 = ZEXT432((uint)(local_7b0->super_RayK<1>).tfar);
              local_700 = auVar287._0_32_;
              _local_2a0 = auVar148;
              do {
                local_5a4 = local_140[uVar118];
                local_5a0 = *(undefined4 *)((long)&local_120 + uVar118 * 4);
                (((RayHit *)local_770.ray)->super_RayK<1>).tfar =
                     *(float *)(local_100 + uVar118 * 4);
                local_770.context = context->user;
                fVar149 = 1.0 - local_5a4;
                fVar128 = local_5a4 * fVar149 + local_5a4 * fVar149;
                auVar250 = ZEXT416((uint)(local_5a4 * local_5a4 * 3.0));
                auVar250 = vshufps_avx(auVar250,auVar250,0);
                auVar197 = ZEXT416((uint)((fVar128 - local_5a4 * local_5a4) * 3.0));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                auVar234 = ZEXT416((uint)((fVar149 * fVar149 - fVar128) * 3.0));
                auVar234 = vshufps_avx(auVar234,auVar234,0);
                auVar218 = ZEXT416((uint)(fVar149 * fVar149 * -3.0));
                auVar218 = vshufps_avx(auVar218,auVar218,0);
                auVar200._0_4_ =
                     auVar218._0_4_ * (float)local_790._0_4_ +
                     auVar234._0_4_ * (float)local_6c0._0_4_ +
                     auVar250._0_4_ * (float)local_6b0._0_4_ +
                     auVar197._0_4_ * (float)local_6d0._0_4_;
                auVar200._4_4_ =
                     auVar218._4_4_ * (float)local_790._4_4_ +
                     auVar234._4_4_ * (float)local_6c0._4_4_ +
                     auVar250._4_4_ * (float)local_6b0._4_4_ +
                     auVar197._4_4_ * (float)local_6d0._4_4_;
                auVar200._8_4_ =
                     auVar218._8_4_ * (float)uStack_788 +
                     auVar234._8_4_ * (float)uStack_6b8 +
                     auVar250._8_4_ * (float)uStack_6a8 + auVar197._8_4_ * (float)uStack_6c8;
                auVar200._12_4_ =
                     auVar218._12_4_ * uStack_788._4_4_ +
                     auVar234._12_4_ * uStack_6b8._4_4_ +
                     auVar250._12_4_ * uStack_6a8._4_4_ + auVar197._12_4_ * uStack_6c8._4_4_;
                local_5b0 = vmovlps_avx(auVar200);
                local_5a8 = vextractps_avx(auVar200,2);
                local_59c = (int)local_798;
                local_598 = (int)local_7a8;
                local_594 = (local_770.context)->instID[0];
                local_590 = (local_770.context)->instPrimID[0];
                local_7b4 = -1;
                local_770.valid = &local_7b4;
                local_770.geometryUserPtr = pGVar124->userPtr;
                local_770.hit = (RTCHitN *)&local_5b0;
                local_770.N = 1;
                pRVar122 = (RayHit *)local_770.ray;
                if (pGVar124->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00905767:
                  p_Var15 = context->args->filter;
                  if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar124->field_8).field_0x2 & 0x40) != 0)))) {
                    local_400._0_8_ = uVar118;
                    (*p_Var15)(&local_770);
                    auVar327 = ZEXT1664(local_520._0_16_);
                    auVar308 = ZEXT3264(_local_500);
                    auVar287 = ZEXT3264(local_700);
                    pRVar122 = local_7b0;
                    uVar118 = local_400._0_8_;
                    fVar190 = (float)local_620._0_4_;
                    fVar205 = (float)local_620._4_4_;
                    fVar208 = fStack_618;
                    fVar211 = fStack_614;
                    fVar213 = fStack_610;
                    fVar222 = fStack_60c;
                    fVar224 = fStack_608;
                    fVar226 = fStack_604;
                    fVar162 = (float)local_680._0_4_;
                    fVar176 = (float)local_680._4_4_;
                    fVar178 = fStack_678;
                    fVar180 = fStack_674;
                    fVar246 = fStack_670;
                    fVar255 = fStack_66c;
                    fVar258 = fStack_668;
                    fVar214 = (float)local_640._0_4_;
                    fVar223 = (float)local_640._4_4_;
                    fVar225 = fStack_638;
                    fVar227 = fStack_634;
                    fVar259 = fStack_630;
                    fVar264 = fStack_62c;
                    fVar266 = fStack_628;
                    if (*local_770.valid == 0) goto LAB_0090584b;
                  }
                  (((Vec3f *)((long)local_770.ray + 0x30))->field_0).components[0] =
                       *(float *)local_770.hit;
                  (((Vec3f *)((long)local_770.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_770.hit + 4);
                  (((Vec3f *)((long)local_770.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_770.hit + 8);
                  *(float *)((long)local_770.ray + 0x3c) = *(float *)(local_770.hit + 0xc);
                  *(float *)((long)local_770.ray + 0x40) = *(float *)(local_770.hit + 0x10);
                  *(float *)((long)local_770.ray + 0x44) = *(float *)(local_770.hit + 0x14);
                  *(float *)((long)local_770.ray + 0x48) = *(float *)(local_770.hit + 0x18);
                  *(float *)((long)local_770.ray + 0x4c) = *(float *)(local_770.hit + 0x1c);
                  *(float *)((long)local_770.ray + 0x50) = *(float *)(local_770.hit + 0x20);
                  local_770.ray = (RTCRayN *)pRVar122;
                }
                else {
                  (*pGVar124->intersectionFilterN)(&local_770);
                  auVar327 = ZEXT1664(local_520._0_16_);
                  auVar308 = ZEXT3264(_local_500);
                  auVar287 = ZEXT3264(local_700);
                  pRVar122 = local_7b0;
                  fVar190 = (float)local_620._0_4_;
                  fVar205 = (float)local_620._4_4_;
                  fVar208 = fStack_618;
                  fVar211 = fStack_614;
                  fVar213 = fStack_610;
                  fVar222 = fStack_60c;
                  fVar224 = fStack_608;
                  fVar226 = fStack_604;
                  fVar162 = (float)local_680._0_4_;
                  fVar176 = (float)local_680._4_4_;
                  fVar178 = fStack_678;
                  fVar180 = fStack_674;
                  fVar246 = fStack_670;
                  fVar255 = fStack_66c;
                  fVar258 = fStack_668;
                  fVar214 = (float)local_640._0_4_;
                  fVar223 = (float)local_640._4_4_;
                  fVar225 = fStack_638;
                  fVar227 = fStack_634;
                  fVar259 = fStack_630;
                  fVar264 = fStack_62c;
                  fVar266 = fStack_628;
                  if (*local_770.valid != 0) goto LAB_00905767;
LAB_0090584b:
                  (local_7b0->super_RayK<1>).tfar = (float)local_660._0_4_;
                  local_770.ray = (RTCRayN *)local_7b0;
                }
                auVar321._0_4_ = auVar327._0_4_;
                auVar201 = auVar308._0_32_;
                *(undefined4 *)(local_460[0] + uVar118 * 4) = 0;
                auVar24 = local_460[0];
                fVar128 = (((RayHit *)local_770.ray)->super_RayK<1>).tfar;
                auVar148._4_4_ = fVar128;
                auVar148._0_4_ = fVar128;
                auVar148._8_4_ = fVar128;
                auVar148._12_4_ = fVar128;
                auVar148._16_4_ = fVar128;
                auVar148._20_4_ = fVar128;
                auVar148._24_4_ = fVar128;
                auVar148._28_4_ = fVar128;
                auVar299 = ZEXT3264(local_6a0);
                auVar26 = vcmpps_avx(local_6a0,auVar148,2);
                auVar143 = vandps_avx(auVar26,local_460[0]);
                local_460[0] = auVar143;
                auVar24 = auVar24 & auVar26;
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar24 >> 0x7f,0) == '\0') &&
                      (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar24 >> 0xbf,0) == '\0') &&
                    (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar24[0x1f]) goto LAB_0090457a;
                local_660 = *(undefined1 (*) [32])&(((RayHit *)local_770.ray)->super_RayK<1>).tfar;
                auVar174._8_4_ = 0x7f800000;
                auVar174._0_8_ = 0x7f8000007f800000;
                auVar174._12_4_ = 0x7f800000;
                auVar174._16_4_ = 0x7f800000;
                auVar174._20_4_ = 0x7f800000;
                auVar174._24_4_ = 0x7f800000;
                auVar174._28_4_ = 0x7f800000;
                auVar26 = vblendvps_avx(auVar174,local_6a0,auVar143);
                auVar24 = vshufps_avx(auVar26,auVar26,0xb1);
                auVar24 = vminps_avx(auVar26,auVar24);
                auVar25 = vshufpd_avx(auVar24,auVar24,5);
                auVar24 = vminps_avx(auVar24,auVar25);
                auVar25 = vperm2f128_avx(auVar24,auVar24,1);
                auVar24 = vminps_avx(auVar24,auVar25);
                auVar26 = vcmpps_avx(auVar26,auVar24,0);
                auVar24 = auVar143 & auVar26;
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar24 >> 0x7f,0) != '\0') ||
                      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0xbf,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar24[0x1f] < '\0') {
                  auVar143 = vandps_avx(auVar26,auVar143);
                }
                uVar116 = vmovmskps_avx(auVar143);
                uVar119 = 0;
                if (uVar116 != 0) {
                  for (; (uVar116 >> uVar119 & 1) == 0; uVar119 = uVar119 + 1) {
                  }
                }
                uVar118 = (ulong)uVar119;
              } while( true );
            }
            fVar128 = local_140[uVar118];
            fVar149 = *(float *)((long)&local_120 + uVar118 * 4);
            fVar153 = 1.0 - fVar128;
            fVar151 = fVar128 * fVar153 + fVar128 * fVar153;
            auVar250 = ZEXT416((uint)(fVar128 * fVar128 * 3.0));
            auVar250 = vshufps_avx(auVar250,auVar250,0);
            auVar197 = ZEXT416((uint)((fVar151 - fVar128 * fVar128) * 3.0));
            auVar197 = vshufps_avx(auVar197,auVar197,0);
            auVar234 = ZEXT416((uint)((fVar153 * fVar153 - fVar151) * 3.0));
            auVar234 = vshufps_avx(auVar234,auVar234,0);
            auVar218 = ZEXT416((uint)(fVar153 * fVar153 * -3.0));
            auVar218 = vshufps_avx(auVar218,auVar218,0);
            auVar195._0_4_ =
                 auVar218._0_4_ * fVar228 +
                 auVar234._0_4_ * fVar348 +
                 auVar250._0_4_ * fVar328 + auVar197._0_4_ * (float)local_6d0._0_4_;
            auVar195._4_4_ =
                 auVar218._4_4_ * fVar238 +
                 auVar234._4_4_ * fVar353 +
                 auVar250._4_4_ * fVar333 + auVar197._4_4_ * (float)local_6d0._4_4_;
            auVar195._8_4_ =
                 auVar218._8_4_ * auVar232._8_4_ +
                 auVar234._8_4_ * auVar350._8_4_ +
                 auVar250._8_4_ * auVar330._8_4_ + auVar197._8_4_ * (float)uStack_6c8;
            auVar195._12_4_ =
                 auVar218._12_4_ * auVar232._12_4_ +
                 auVar234._12_4_ * auVar350._12_4_ +
                 auVar250._12_4_ * auVar330._12_4_ + auVar197._12_4_ * uStack_6c8._4_4_;
            (local_7b0->super_RayK<1>).tfar = *(float *)(local_100 + uVar118 * 4);
            uVar10 = vmovlps_avx(auVar195);
            *(undefined8 *)&(local_7b0->Ng).field_0 = uVar10;
            fVar151 = (float)vextractps_avx(auVar195,2);
            (local_7b0->Ng).field_0.field_0.z = fVar151;
            local_7b0->u = fVar128;
            local_7b0->v = fVar149;
            local_7b0->primID = uVar116;
            local_7b0->geomID = uVar119;
            local_7b0->instID[0] = context->user->instID[0];
            local_7b0->instPrimID[0] = context->user->instPrimID[0];
LAB_0090457a:
            auVar254 = ZEXT3264(_local_600);
            prim = local_780;
            uVar123 = local_79c;
            auVar279 = _local_720;
          }
          _local_720 = auVar279;
          ray = (RayHit *)local_770.ray;
          fVar161 = (float)local_5e0._0_4_;
          fVar175 = (float)local_5e0._4_4_;
          fVar177 = fStack_5d8;
          fVar179 = fStack_5d4;
          fVar128 = fStack_5d0;
          fVar149 = fStack_5cc;
          fVar151 = fStack_5c8;
          fVar153 = fStack_5c4;
          fVar312 = (float)local_480._0_4_;
          fVar314 = (float)local_480._4_4_;
          fVar315 = fStack_478;
          fVar129 = fStack_474;
          fVar189 = fStack_470;
          fVar204 = fStack_46c;
          fVar207 = fStack_468;
          fVar210 = fStack_464;
          auVar279 = _local_720;
        }
      }
      _local_720 = auVar279;
      auVar250 = local_740._0_16_;
    }
    if (8 < (int)uVar123) {
      _local_3a0 = vpshufd_avx(ZEXT416(uVar123),0);
      auVar250 = vshufps_avx(auVar250,auVar250,0);
      register0x00001210 = auVar250;
      _local_2a0 = auVar250;
      local_3e0 = local_720._0_4_;
      fStack_3dc = local_720._4_4_;
      fStack_3d8 = local_720._8_4_;
      fStack_3d4 = local_720._12_4_;
      auVar135._0_4_ = 1.0 / auVar321._0_4_;
      auVar135._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar250 = vshufps_avx(auVar135,auVar135,0);
      register0x00001210 = auVar250;
      _local_2c0 = auVar250;
      lVar121 = 8;
      local_700 = auVar287._0_32_;
      local_6a0 = auVar299._0_32_;
      _local_500 = auVar201;
      fStack_3d0 = local_3e0;
      fStack_3cc = fStack_3dc;
      fStack_3c8 = fStack_3d8;
      fStack_3c4 = fStack_3d4;
LAB_00904664:
      if (lVar121 < lVar120) {
        pauVar9 = (undefined1 (*) [28])(bezier_basis0 + lVar121 * 4 + lVar127);
        fVar186 = *(float *)*pauVar9;
        fVar319 = *(float *)(*pauVar9 + 4);
        fVar335 = *(float *)(*pauVar9 + 8);
        fVar269 = *(float *)(*pauVar9 + 0xc);
        fVar239 = *(float *)(*pauVar9 + 0x10);
        fVar181 = *(float *)(*pauVar9 + 0x14);
        fVar270 = *(float *)(*pauVar9 + 0x18);
        auVar112 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar127 + 0x21fb768 + lVar121 * 4);
        fVar288 = *(float *)*pauVar9;
        fVar240 = *(float *)(*pauVar9 + 4);
        fVar182 = *(float *)(*pauVar9 + 8);
        fVar289 = *(float *)(*pauVar9 + 0xc);
        fVar290 = *(float *)(*pauVar9 + 0x10);
        fVar241 = *(float *)(*pauVar9 + 0x14);
        fVar184 = *(float *)(*pauVar9 + 0x18);
        auVar111 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar127 + 0x21fbbec + lVar121 * 4);
        fVar291 = *(float *)*pauVar9;
        fVar292 = *(float *)(*pauVar9 + 4);
        fVar243 = *(float *)(*pauVar9 + 8);
        fVar185 = *(float *)(*pauVar9 + 0xc);
        fVar309 = *(float *)(*pauVar9 + 0x10);
        fVar311 = *(float *)(*pauVar9 + 0x14);
        fVar244 = *(float *)(*pauVar9 + 0x18);
        auVar110 = *pauVar9;
        pfVar1 = (float *)(lVar127 + 0x21fc070 + lVar121 * 4);
        fVar187 = *pfVar1;
        fVar278 = pfVar1[1];
        fVar303 = pfVar1[2];
        fVar150 = pfVar1[3];
        fVar152 = pfVar1[4];
        fVar154 = pfVar1[5];
        fVar156 = pfVar1[6];
        fStack_704 = fVar210 + fVar210 + fStack_344;
        auVar284._0_4_ =
             fVar162 * fVar186 +
             fVar288 * (float)local_340._0_4_ + fVar161 * fVar291 + fVar187 * (float)local_360._0_4_
        ;
        auVar284._4_4_ =
             fVar176 * fVar319 +
             fVar240 * (float)local_340._4_4_ + fVar175 * fVar292 + fVar278 * (float)local_360._4_4_
        ;
        auVar284._8_4_ =
             fVar178 * fVar335 + fVar182 * fStack_338 + fVar177 * fVar243 + fVar303 * fStack_358;
        auVar284._12_4_ =
             fVar180 * fVar269 + fVar289 * fStack_334 + fVar179 * fVar185 + fVar150 * fStack_354;
        auVar284._16_4_ =
             fVar246 * fVar239 + fVar290 * fStack_330 + fVar128 * fVar309 + fVar152 * fStack_350;
        auVar284._20_4_ =
             fVar255 * fVar181 + fVar241 * fStack_32c + fVar149 * fVar311 + fVar154 * fStack_34c;
        auVar284._24_4_ =
             fVar258 * fVar270 + fVar184 * fStack_328 + fVar151 * fVar244 + fVar156 * fStack_348;
        auVar284._28_4_ = fVar210 + fVar153 + fStack_704;
        fVar256 = auVar254._0_4_;
        fVar257 = auVar254._4_4_;
        fVar316 = auVar254._8_4_;
        fVar183 = auVar254._12_4_;
        fVar317 = auVar254._16_4_;
        fVar334 = auVar254._20_4_;
        fVar318 = auVar254._24_4_;
        local_740._0_4_ =
             fVar186 * fVar256 + fVar288 * fVar190 + fVar214 * fVar291 + fVar187 * fVar312;
        local_740._4_4_ =
             fVar319 * fVar257 + fVar240 * fVar205 + fVar223 * fVar292 + fVar278 * fVar314;
        local_740._8_4_ =
             fVar335 * fVar316 + fVar182 * fVar208 + fVar225 * fVar243 + fVar303 * fVar315;
        local_740._12_4_ =
             fVar269 * fVar183 + fVar289 * fVar211 + fVar227 * fVar185 + fVar150 * fVar129;
        local_740._16_4_ =
             fVar239 * fVar317 + fVar290 * fVar213 + fVar259 * fVar309 + fVar152 * fVar189;
        local_740._20_4_ =
             fVar181 * fVar334 + fVar241 * fVar222 + fVar264 * fVar311 + fVar154 * fVar204;
        local_740._24_4_ =
             fVar270 * fVar318 + fVar184 * fVar224 + fVar266 * fVar244 + fVar156 * fVar207;
        local_740._28_4_ = fStack_704 + fVar210 + fVar210 + fStack_404;
        local_720._0_4_ =
             fVar186 * (float)local_c0._0_4_ +
             fVar288 * (float)local_e0._0_4_ +
             (float)local_80._0_4_ * fVar291 + (float)local_a0._0_4_ * fVar187;
        local_720._4_4_ =
             fVar319 * (float)local_c0._4_4_ +
             fVar240 * (float)local_e0._4_4_ +
             (float)local_80._4_4_ * fVar292 + (float)local_a0._4_4_ * fVar278;
        fStack_718 = fVar335 * fStack_b8 +
                     fVar182 * fStack_d8 + fStack_78 * fVar243 + fStack_98 * fVar303;
        fStack_714 = fVar269 * fStack_b4 +
                     fVar289 * fStack_d4 + fStack_74 * fVar185 + fStack_94 * fVar150;
        fStack_710 = fVar239 * fStack_b0 +
                     fVar290 * fStack_d0 + fStack_70 * fVar309 + fStack_90 * fVar152;
        fStack_70c = fVar181 * fStack_ac +
                     fVar241 * fStack_cc + fStack_6c * fVar311 + fStack_8c * fVar154;
        fStack_708 = fVar270 * fStack_a8 +
                     fVar184 * fStack_c8 + fStack_68 * fVar244 + fStack_88 * fVar156;
        fStack_704 = fStack_704 + fVar210 + fVar210 + fVar153;
        pfVar1 = (float *)(bezier_basis1 + lVar121 * 4 + lVar127);
        fVar186 = *pfVar1;
        fVar319 = pfVar1[1];
        fVar335 = pfVar1[2];
        fVar269 = pfVar1[3];
        fVar239 = pfVar1[4];
        fVar181 = pfVar1[5];
        fVar270 = pfVar1[6];
        pfVar2 = (float *)(lVar127 + 0x21fdb88 + lVar121 * 4);
        fVar288 = *pfVar2;
        fVar240 = pfVar2[1];
        fVar182 = pfVar2[2];
        fVar289 = pfVar2[3];
        fVar290 = pfVar2[4];
        fVar241 = pfVar2[5];
        fVar184 = pfVar2[6];
        pfVar2 = (float *)(lVar127 + 0x21fe00c + lVar121 * 4);
        fVar291 = *pfVar2;
        fVar292 = pfVar2[1];
        fVar243 = pfVar2[2];
        fVar185 = pfVar2[3];
        fVar309 = pfVar2[4];
        fVar311 = pfVar2[5];
        fVar244 = pfVar2[6];
        pauVar9 = (undefined1 (*) [28])(lVar127 + 0x21fe490 + lVar121 * 4);
        fVar153 = *(float *)*pauVar9;
        fVar246 = *(float *)(*pauVar9 + 4);
        fVar255 = *(float *)(*pauVar9 + 8);
        fVar162 = *(float *)(*pauVar9 + 0xc);
        fVar176 = *(float *)(*pauVar9 + 0x10);
        fVar178 = *(float *)(*pauVar9 + 0x14);
        fVar180 = *(float *)(*pauVar9 + 0x18);
        auVar113 = *pauVar9;
        fVar228 = fVar226 + *(float *)pauVar9[1];
        fVar258 = fVar226 + fVar226 + fStack_344;
        local_520._0_4_ =
             (float)local_680._0_4_ * fVar186 +
             (float)local_340._0_4_ * fVar288 + fVar161 * fVar291 + (float)local_360._0_4_ * fVar153
        ;
        local_520._4_4_ =
             (float)local_680._4_4_ * fVar319 +
             (float)local_340._4_4_ * fVar240 + fVar175 * fVar292 + (float)local_360._4_4_ * fVar246
        ;
        local_520._8_4_ =
             fStack_678 * fVar335 + fStack_338 * fVar182 + fVar177 * fVar243 + fStack_358 * fVar255;
        local_520._12_4_ =
             fStack_674 * fVar269 + fStack_334 * fVar289 + fVar179 * fVar185 + fStack_354 * fVar162;
        local_520._16_4_ =
             fStack_670 * fVar239 + fStack_330 * fVar290 + fVar128 * fVar309 + fStack_350 * fVar176;
        local_520._20_4_ =
             fStack_66c * fVar181 + fStack_32c * fVar241 + fVar149 * fVar311 + fStack_34c * fVar178;
        local_520._24_4_ =
             fStack_668 * fVar270 + fStack_328 * fVar184 + fVar151 * fVar244 + fStack_348 * fVar180;
        local_520._28_4_ = fVar228 + fVar258;
        local_400._0_4_ =
             fVar256 * fVar186 + fVar288 * fVar190 + fVar312 * fVar153 + fVar214 * fVar291;
        local_400._4_4_ =
             fVar257 * fVar319 + fVar240 * fVar205 + fVar314 * fVar246 + fVar223 * fVar292;
        local_400._8_4_ =
             fVar316 * fVar335 + fVar182 * fVar208 + fVar315 * fVar255 + fVar225 * fVar243;
        local_400._12_4_ =
             fVar183 * fVar269 + fVar289 * fVar211 + fVar129 * fVar162 + fVar227 * fVar185;
        local_400._16_4_ =
             fVar317 * fVar239 + fVar290 * fVar213 + fVar189 * fVar176 + fVar259 * fVar309;
        local_400._20_4_ =
             fVar334 * fVar181 + fVar241 * fVar222 + fVar204 * fVar178 + fVar264 * fVar311;
        local_400._24_4_ =
             fVar318 * fVar270 + fVar184 * fVar224 + fVar207 * fVar180 + fVar266 * fVar244;
        local_400._28_4_ = fVar258 + fVar226 + fVar210 + fVar226;
        auVar341._0_4_ =
             fVar288 * (float)local_e0._0_4_ +
             (float)local_80._0_4_ * fVar291 + (float)local_a0._0_4_ * fVar153 +
             fVar186 * (float)local_c0._0_4_;
        auVar341._4_4_ =
             fVar240 * (float)local_e0._4_4_ +
             (float)local_80._4_4_ * fVar292 + (float)local_a0._4_4_ * fVar246 +
             fVar319 * (float)local_c0._4_4_;
        auVar341._8_4_ =
             fVar182 * fStack_d8 + fStack_78 * fVar243 + fStack_98 * fVar255 + fVar335 * fStack_b8;
        auVar341._12_4_ =
             fVar289 * fStack_d4 + fStack_74 * fVar185 + fStack_94 * fVar162 + fVar269 * fStack_b4;
        auVar341._16_4_ =
             fVar290 * fStack_d0 + fStack_70 * fVar309 + fStack_90 * fVar176 + fVar239 * fStack_b0;
        auVar341._20_4_ =
             fVar241 * fStack_cc + fStack_6c * fVar311 + fStack_8c * fVar178 + fVar181 * fStack_ac;
        auVar341._24_4_ =
             fVar184 * fStack_c8 + fStack_68 * fVar244 + fStack_88 * fVar180 + fVar270 * fStack_a8;
        auVar341._28_4_ = fVar226 + fVar228 + fVar258;
        auVar26 = vsubps_avx(local_520,auVar284);
        auVar24 = vsubps_avx(local_400,local_740);
        fVar128 = auVar26._0_4_;
        fVar151 = auVar26._4_4_;
        auVar63._4_4_ = local_740._4_4_ * fVar151;
        auVar63._0_4_ = local_740._0_4_ * fVar128;
        fVar189 = auVar26._8_4_;
        auVar63._8_4_ = local_740._8_4_ * fVar189;
        fVar207 = auVar26._12_4_;
        auVar63._12_4_ = local_740._12_4_ * fVar207;
        fVar213 = auVar26._16_4_;
        auVar63._16_4_ = local_740._16_4_ * fVar213;
        fVar224 = auVar26._20_4_;
        auVar63._20_4_ = local_740._20_4_ * fVar224;
        fVar246 = auVar26._24_4_;
        auVar63._24_4_ = local_740._24_4_ * fVar246;
        auVar63._28_4_ = fVar258;
        local_660 = auVar284;
        fVar149 = auVar24._0_4_;
        fVar153 = auVar24._4_4_;
        auVar64._4_4_ = auVar284._4_4_ * fVar153;
        auVar64._0_4_ = auVar284._0_4_ * fVar149;
        fVar204 = auVar24._8_4_;
        auVar64._8_4_ = auVar284._8_4_ * fVar204;
        fVar210 = auVar24._12_4_;
        auVar64._12_4_ = auVar284._12_4_ * fVar210;
        fVar222 = auVar24._16_4_;
        auVar64._16_4_ = auVar284._16_4_ * fVar222;
        fVar226 = auVar24._20_4_;
        auVar64._20_4_ = auVar284._20_4_ * fVar226;
        fVar255 = auVar24._24_4_;
        auVar64._24_4_ = auVar284._24_4_ * fVar255;
        auVar64._28_4_ = local_400._28_4_;
        auVar25 = vsubps_avx(auVar63,auVar64);
        auVar143 = vmaxps_avx(_local_720,auVar341);
        auVar65._4_4_ = auVar143._4_4_ * auVar143._4_4_ * (fVar151 * fVar151 + fVar153 * fVar153);
        auVar65._0_4_ = auVar143._0_4_ * auVar143._0_4_ * (fVar128 * fVar128 + fVar149 * fVar149);
        auVar65._8_4_ = auVar143._8_4_ * auVar143._8_4_ * (fVar189 * fVar189 + fVar204 * fVar204);
        auVar65._12_4_ = auVar143._12_4_ * auVar143._12_4_ * (fVar207 * fVar207 + fVar210 * fVar210)
        ;
        auVar65._16_4_ = auVar143._16_4_ * auVar143._16_4_ * (fVar213 * fVar213 + fVar222 * fVar222)
        ;
        auVar65._20_4_ = auVar143._20_4_ * auVar143._20_4_ * (fVar224 * fVar224 + fVar226 * fVar226)
        ;
        auVar65._24_4_ = auVar143._24_4_ * auVar143._24_4_ * (fVar246 * fVar246 + fVar255 * fVar255)
        ;
        auVar65._28_4_ = local_520._28_4_ + local_400._28_4_;
        auVar66._4_4_ = auVar25._4_4_ * auVar25._4_4_;
        auVar66._0_4_ = auVar25._0_4_ * auVar25._0_4_;
        auVar66._8_4_ = auVar25._8_4_ * auVar25._8_4_;
        auVar66._12_4_ = auVar25._12_4_ * auVar25._12_4_;
        auVar66._16_4_ = auVar25._16_4_ * auVar25._16_4_;
        auVar66._20_4_ = auVar25._20_4_ * auVar25._20_4_;
        auVar66._24_4_ = auVar25._24_4_ * auVar25._24_4_;
        auVar66._28_4_ = auVar25._28_4_;
        local_380 = vcmpps_avx(auVar66,auVar65,2);
        local_1c0 = (uint)lVar121;
        auVar197 = vpshufd_avx(ZEXT416(local_1c0),0);
        auVar250 = vpor_avx(auVar197,_DAT_01f4ad30);
        auVar197 = vpor_avx(auVar197,_DAT_01f7afa0);
        auVar250 = vpcmpgtd_avx(_local_3a0,auVar250);
        auVar197 = vpcmpgtd_avx(_local_3a0,auVar197);
        register0x000012d0 = auVar197;
        _local_3c0 = auVar250;
        auVar143 = _local_3c0 & local_380;
        local_660._0_8_ = lVar120;
        fVar161 = (float)local_5e0._0_4_;
        fVar175 = (float)local_5e0._4_4_;
        fVar177 = fStack_5d8;
        fVar179 = fStack_5d4;
        fVar128 = fStack_5d0;
        fVar149 = fStack_5cc;
        fVar151 = fStack_5c8;
        fVar153 = fStack_5c4;
        fVar190 = (float)local_620._0_4_;
        fVar205 = (float)local_620._4_4_;
        fVar208 = fStack_618;
        fVar211 = fStack_614;
        fVar213 = fStack_610;
        fVar222 = fStack_60c;
        fVar224 = fStack_608;
        fVar226 = fStack_604;
        fVar162 = (float)local_680._0_4_;
        fVar176 = (float)local_680._4_4_;
        fVar178 = fStack_678;
        fVar180 = fStack_674;
        fVar246 = fStack_670;
        fVar255 = fStack_66c;
        fVar258 = fStack_668;
        fVar214 = (float)local_640._0_4_;
        fVar223 = (float)local_640._4_4_;
        fVar225 = fStack_638;
        fVar227 = fStack_634;
        fVar259 = fStack_630;
        fVar264 = fStack_62c;
        fVar266 = fStack_628;
        if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar143 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar143 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar143 >> 0x7f,0) != '\0') ||
              (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar143 >> 0xbf,0) != '\0') ||
            (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar143[0x1f] < '\0') {
          local_580._0_4_ = auVar113._0_4_;
          local_580._4_4_ = auVar113._4_4_;
          fStack_578 = auVar113._8_4_;
          fStack_574 = auVar113._12_4_;
          fStack_570 = auVar113._16_4_;
          fStack_56c = auVar113._20_4_;
          fStack_568 = auVar113._24_4_;
          local_580._0_4_ =
               fVar186 * (float)local_500._0_4_ +
               fVar288 * (float)local_260._0_4_ +
               (float)local_280._0_4_ * fVar291 + (float)local_540._0_4_ * (float)local_580._0_4_;
          local_580._4_4_ =
               fVar319 * (float)local_500._4_4_ +
               fVar240 * (float)local_260._4_4_ +
               (float)local_280._4_4_ * fVar292 + (float)local_540._4_4_ * (float)local_580._4_4_;
          fStack_578 = fVar335 * fStack_4f8 +
                       fVar182 * fStack_258 + fStack_278 * fVar243 + fStack_538 * fStack_578;
          fStack_574 = fVar269 * fStack_4f4 +
                       fVar289 * fStack_254 + fStack_274 * fVar185 + fStack_534 * fStack_574;
          fStack_570 = fVar239 * fStack_4f0 +
                       fVar290 * fStack_250 + fStack_270 * fVar309 + fStack_530 * fStack_570;
          fStack_56c = fVar181 * fStack_4ec +
                       fVar241 * fStack_24c + fStack_26c * fVar311 + fStack_52c * fStack_56c;
          fStack_568 = fVar270 * fStack_4e8 +
                       fVar184 * fStack_248 + fStack_268 * fVar244 + fStack_528 * fStack_568;
          fStack_564 = pfVar1[7] + local_380._28_4_ + pfVar2[7] + 0.0;
          local_4e0._0_4_ = auVar111._0_4_;
          local_4e0._4_4_ = auVar111._4_4_;
          fStack_4d8 = auVar111._8_4_;
          fStack_4d4 = auVar111._12_4_;
          fStack_4d0 = auVar111._16_4_;
          fStack_4cc = auVar111._20_4_;
          fStack_4c8 = auVar111._24_4_;
          fVar129 = (float)local_260._0_4_ * (float)local_4e0._0_4_;
          fVar228 = (float)local_260._4_4_ * (float)local_4e0._4_4_;
          fVar238 = fStack_258 * fStack_4d8;
          fVar155 = fStack_254 * fStack_4d4;
          fVar157 = fStack_250 * fStack_4d0;
          fVar158 = fStack_24c * fStack_4cc;
          fVar159 = fStack_248 * fStack_4c8;
          local_4a0._0_4_ = auVar110._0_4_;
          local_4a0._4_4_ = auVar110._4_4_;
          fStack_498 = auVar110._8_4_;
          fStack_494 = auVar110._12_4_;
          fStack_490 = auVar110._16_4_;
          fStack_48c = auVar110._20_4_;
          fStack_488 = auVar110._24_4_;
          pfVar1 = (float *)(lVar127 + 0x21fcdfc + lVar121 * 4);
          fVar189 = *pfVar1;
          fVar204 = pfVar1[1];
          fVar207 = pfVar1[2];
          fVar210 = pfVar1[3];
          fVar186 = pfVar1[4];
          fVar319 = pfVar1[5];
          fVar335 = pfVar1[6];
          pfVar3 = (float *)(lVar127 + 0x21fd280 + lVar121 * 4);
          fVar269 = *pfVar3;
          fVar239 = pfVar3[1];
          fVar181 = pfVar3[2];
          fVar270 = pfVar3[3];
          fVar288 = pfVar3[4];
          fVar240 = pfVar3[5];
          fVar182 = pfVar3[6];
          _local_4e0 = auVar341;
          pfVar4 = (float *)(lVar127 + 0x21fc978 + lVar121 * 4);
          fVar289 = *pfVar4;
          fVar290 = pfVar4[1];
          fVar241 = pfVar4[2];
          fVar184 = pfVar4[3];
          fVar291 = pfVar4[4];
          fVar292 = pfVar4[5];
          fVar243 = pfVar4[6];
          fVar160 = pfVar1[7] + pfVar3[7];
          fVar188 = pfVar3[7] + auVar341._28_4_ + 0.0;
          fVar271 = auVar341._28_4_ + auVar254._28_4_ + auVar341._28_4_ + 0.0;
          pfVar1 = (float *)(lVar127 + 0x21fc4f4 + lVar121 * 4);
          fVar185 = *pfVar1;
          fVar309 = pfVar1[1];
          fVar311 = pfVar1[2];
          fVar244 = pfVar1[3];
          fVar312 = pfVar1[4];
          fVar314 = pfVar1[5];
          fVar315 = pfVar1[6];
          local_4c0 = fVar185 * (float)local_680._0_4_ +
                      (float)local_340._0_4_ * fVar289 +
                      (float)local_5e0._0_4_ * fVar189 + (float)local_360._0_4_ * fVar269;
          fStack_4bc = fVar309 * (float)local_680._4_4_ +
                       (float)local_340._4_4_ * fVar290 +
                       (float)local_5e0._4_4_ * fVar204 + (float)local_360._4_4_ * fVar239;
          fStack_4b8 = fVar311 * fStack_678 +
                       fStack_338 * fVar241 + fStack_5d8 * fVar207 + fStack_358 * fVar181;
          fStack_4b4 = fVar244 * fStack_674 +
                       fStack_334 * fVar184 + fStack_5d4 * fVar210 + fStack_354 * fVar270;
          fStack_4b0 = fVar312 * fStack_670 +
                       fStack_330 * fVar291 + fStack_5d0 * fVar186 + fStack_350 * fVar288;
          fStack_4ac = fVar314 * fStack_66c +
                       fStack_32c * fVar292 + fStack_5cc * fVar319 + fStack_34c * fVar240;
          fStack_4a8 = fVar315 * fStack_668 +
                       fStack_328 * fVar243 + fStack_5c8 * fVar335 + fStack_348 * fVar182;
          fStack_4a4 = fVar160 + fVar188;
          auVar170._0_4_ =
               fVar256 * fVar185 +
               (float)local_640._0_4_ * fVar189 + (float)local_480._0_4_ * fVar269 +
               fVar289 * (float)local_620._0_4_;
          auVar170._4_4_ =
               fVar257 * fVar309 +
               (float)local_640._4_4_ * fVar204 + (float)local_480._4_4_ * fVar239 +
               fVar290 * (float)local_620._4_4_;
          auVar170._8_4_ =
               fVar316 * fVar311 +
               fStack_638 * fVar207 + fStack_478 * fVar181 + fVar241 * fStack_618;
          auVar170._12_4_ =
               fVar183 * fVar244 +
               fStack_634 * fVar210 + fStack_474 * fVar270 + fVar184 * fStack_614;
          auVar170._16_4_ =
               fVar317 * fVar312 +
               fStack_630 * fVar186 + fStack_470 * fVar288 + fVar291 * fStack_610;
          auVar170._20_4_ =
               fVar334 * fVar314 +
               fStack_62c * fVar319 + fStack_46c * fVar240 + fVar292 * fStack_60c;
          auVar170._24_4_ =
               fVar318 * fVar315 +
               fStack_628 * fVar335 + fStack_468 * fVar182 + fVar243 * fStack_608;
          auVar170._28_4_ = fVar188 + fVar271;
          auVar331._0_4_ =
               fVar289 * (float)local_260._0_4_ +
               (float)local_280._0_4_ * fVar189 + (float)local_540._0_4_ * fVar269 +
               fVar185 * (float)local_500._0_4_;
          auVar331._4_4_ =
               fVar290 * (float)local_260._4_4_ +
               (float)local_280._4_4_ * fVar204 + (float)local_540._4_4_ * fVar239 +
               fVar309 * (float)local_500._4_4_;
          auVar331._8_4_ =
               fVar241 * fStack_258 + fStack_278 * fVar207 + fStack_538 * fVar181 +
               fVar311 * fStack_4f8;
          auVar331._12_4_ =
               fVar184 * fStack_254 + fStack_274 * fVar210 + fStack_534 * fVar270 +
               fVar244 * fStack_4f4;
          auVar331._16_4_ =
               fVar291 * fStack_250 + fStack_270 * fVar186 + fStack_530 * fVar288 +
               fVar312 * fStack_4f0;
          auVar331._20_4_ =
               fVar292 * fStack_24c + fStack_26c * fVar319 + fStack_52c * fVar240 +
               fVar314 * fStack_4ec;
          auVar331._24_4_ =
               fVar243 * fStack_248 + fStack_268 * fVar335 + fStack_528 * fVar182 +
               fVar315 * fStack_4e8;
          auVar331._28_4_ = pfVar4[7] + fVar160 + fVar271;
          pfVar1 = (float *)(lVar127 + 0x21ff21c + lVar121 * 4);
          fVar189 = *pfVar1;
          fVar204 = pfVar1[1];
          fVar207 = pfVar1[2];
          fVar210 = pfVar1[3];
          fVar256 = pfVar1[4];
          fVar257 = pfVar1[5];
          fVar316 = pfVar1[6];
          pfVar3 = (float *)(lVar127 + 0x21ff6a0 + lVar121 * 4);
          fVar183 = *pfVar3;
          fVar317 = pfVar3[1];
          fVar334 = pfVar3[2];
          fVar318 = pfVar3[3];
          fVar186 = pfVar3[4];
          fVar319 = pfVar3[5];
          fVar335 = pfVar3[6];
          pfVar4 = (float *)(lVar127 + 0x21fed98 + lVar121 * 4);
          fVar269 = *pfVar4;
          fVar239 = pfVar4[1];
          fVar181 = pfVar4[2];
          fVar270 = pfVar4[3];
          fVar288 = pfVar4[4];
          fVar240 = pfVar4[5];
          fVar182 = pfVar4[6];
          pfVar5 = (float *)(lVar127 + 0x21fe914 + lVar121 * 4);
          fVar289 = *pfVar5;
          fVar290 = pfVar5[1];
          fVar241 = pfVar5[2];
          fVar184 = pfVar5[3];
          fVar291 = pfVar5[4];
          fVar292 = pfVar5[5];
          fVar243 = pfVar5[6];
          auVar297._0_4_ =
               fVar289 * (float)local_680._0_4_ +
               (float)local_340._0_4_ * fVar269 +
               (float)local_5e0._0_4_ * fVar189 + (float)local_360._0_4_ * fVar183;
          auVar297._4_4_ =
               fVar290 * (float)local_680._4_4_ +
               (float)local_340._4_4_ * fVar239 +
               (float)local_5e0._4_4_ * fVar204 + (float)local_360._4_4_ * fVar317;
          auVar297._8_4_ =
               fVar241 * fStack_678 +
               fStack_338 * fVar181 + fStack_5d8 * fVar207 + fStack_358 * fVar334;
          auVar297._12_4_ =
               fVar184 * fStack_674 +
               fStack_334 * fVar270 + fStack_5d4 * fVar210 + fStack_354 * fVar318;
          auVar297._16_4_ =
               fVar291 * fStack_670 +
               fStack_330 * fVar288 + fStack_5d0 * fVar256 + fStack_350 * fVar186;
          auVar297._20_4_ =
               fVar292 * fStack_66c +
               fStack_32c * fVar240 + fStack_5cc * fVar257 + fStack_34c * fVar319;
          auVar297._24_4_ =
               fVar243 * fStack_668 +
               fStack_328 * fVar182 + fStack_5c8 * fVar316 + fStack_348 * fVar335;
          auVar297._28_4_ = fStack_324 + fStack_324 + fStack_344 + fStack_324;
          auVar325._0_4_ =
               fVar289 * (float)local_600._0_4_ +
               fVar269 * (float)local_620._0_4_ +
               (float)local_640._0_4_ * fVar189 + (float)local_480._0_4_ * fVar183;
          auVar325._4_4_ =
               fVar290 * (float)local_600._4_4_ +
               fVar239 * (float)local_620._4_4_ +
               (float)local_640._4_4_ * fVar204 + (float)local_480._4_4_ * fVar317;
          auVar325._8_4_ =
               fVar241 * fStack_5f8 +
               fVar181 * fStack_618 + fStack_638 * fVar207 + fStack_478 * fVar334;
          auVar325._12_4_ =
               fVar184 * fStack_5f4 +
               fVar270 * fStack_614 + fStack_634 * fVar210 + fStack_474 * fVar318;
          auVar325._16_4_ =
               fVar291 * fStack_5f0 +
               fVar288 * fStack_610 + fStack_630 * fVar256 + fStack_470 * fVar186;
          auVar325._20_4_ =
               fVar292 * fStack_5ec +
               fVar240 * fStack_60c + fStack_62c * fVar257 + fStack_46c * fVar319;
          auVar325._24_4_ =
               fVar243 * fStack_5e8 +
               fVar182 * fStack_608 + fStack_628 * fVar316 + fStack_468 * fVar335;
          auVar325._28_4_ = fStack_324 + fStack_324 + fStack_464 + fStack_324;
          auVar253._8_4_ = 0x7fffffff;
          auVar253._0_8_ = 0x7fffffff7fffffff;
          auVar253._12_4_ = 0x7fffffff;
          auVar253._16_4_ = 0x7fffffff;
          auVar253._20_4_ = 0x7fffffff;
          auVar253._24_4_ = 0x7fffffff;
          auVar253._28_4_ = 0x7fffffff;
          auVar107._4_4_ = fStack_4bc;
          auVar107._0_4_ = local_4c0;
          auVar107._8_4_ = fStack_4b8;
          auVar107._12_4_ = fStack_4b4;
          auVar107._16_4_ = fStack_4b0;
          auVar107._20_4_ = fStack_4ac;
          auVar107._24_4_ = fStack_4a8;
          auVar107._28_4_ = fStack_4a4;
          auVar143 = vandps_avx(auVar107,auVar253);
          auVar25 = vandps_avx(auVar170,auVar253);
          auVar25 = vmaxps_avx(auVar143,auVar25);
          auVar143 = vandps_avx(auVar331,auVar253);
          auVar25 = vmaxps_avx(auVar25,auVar143);
          auVar25 = vcmpps_avx(auVar25,_local_2a0,1);
          auVar31 = vblendvps_avx(auVar107,auVar26,auVar25);
          auVar144._0_4_ =
               fVar289 * (float)local_500._0_4_ +
               fVar269 * (float)local_260._0_4_ +
               fVar183 * (float)local_540._0_4_ + (float)local_280._0_4_ * fVar189;
          auVar144._4_4_ =
               fVar290 * (float)local_500._4_4_ +
               fVar239 * (float)local_260._4_4_ +
               fVar317 * (float)local_540._4_4_ + (float)local_280._4_4_ * fVar204;
          auVar144._8_4_ =
               fVar241 * fStack_4f8 +
               fVar181 * fStack_258 + fVar334 * fStack_538 + fStack_278 * fVar207;
          auVar144._12_4_ =
               fVar184 * fStack_4f4 +
               fVar270 * fStack_254 + fVar318 * fStack_534 + fStack_274 * fVar210;
          auVar144._16_4_ =
               fVar291 * fStack_4f0 +
               fVar288 * fStack_250 + fVar186 * fStack_530 + fStack_270 * fVar256;
          auVar144._20_4_ =
               fVar292 * fStack_4ec +
               fVar240 * fStack_24c + fVar319 * fStack_52c + fStack_26c * fVar257;
          auVar144._24_4_ =
               fVar243 * fStack_4e8 +
               fVar182 * fStack_248 + fVar335 * fStack_528 + fStack_268 * fVar316;
          auVar144._28_4_ = auVar143._28_4_ + pfVar4[7] + pfVar3[7] + pfVar1[7];
          auVar16 = vblendvps_avx(auVar170,auVar24,auVar25);
          auVar143 = vandps_avx(auVar297,auVar253);
          auVar25 = vandps_avx(auVar325,auVar253);
          auVar148 = vmaxps_avx(auVar143,auVar25);
          auVar143 = vandps_avx(auVar144,auVar253);
          auVar143 = vmaxps_avx(auVar148,auVar143);
          local_560._0_4_ = auVar112._0_4_;
          local_560._4_4_ = auVar112._4_4_;
          fStack_558 = auVar112._8_4_;
          fStack_554 = auVar112._12_4_;
          fStack_550 = auVar112._16_4_;
          fStack_54c = auVar112._20_4_;
          fStack_548 = auVar112._24_4_;
          auVar25 = vcmpps_avx(auVar143,_local_2a0,1);
          auVar143 = vblendvps_avx(auVar297,auVar26,auVar25);
          auVar145._0_4_ =
               (float)local_500._0_4_ * (float)local_560._0_4_ +
               fVar129 + (float)local_280._0_4_ * (float)local_4a0._0_4_ +
                         (float)local_540._0_4_ * fVar187;
          auVar145._4_4_ =
               (float)local_500._4_4_ * (float)local_560._4_4_ +
               fVar228 + (float)local_280._4_4_ * (float)local_4a0._4_4_ +
                         (float)local_540._4_4_ * fVar278;
          auVar145._8_4_ =
               fStack_4f8 * fStack_558 + fVar238 + fStack_278 * fStack_498 + fStack_538 * fVar303;
          auVar145._12_4_ =
               fStack_4f4 * fStack_554 + fVar155 + fStack_274 * fStack_494 + fStack_534 * fVar150;
          auVar145._16_4_ =
               fStack_4f0 * fStack_550 + fVar157 + fStack_270 * fStack_490 + fStack_530 * fVar152;
          auVar145._20_4_ =
               fStack_4ec * fStack_54c + fVar158 + fStack_26c * fStack_48c + fStack_52c * fVar154;
          auVar145._24_4_ =
               fStack_4e8 * fStack_548 + fVar159 + fStack_268 * fStack_488 + fStack_528 * fVar156;
          auVar145._28_4_ = auVar148._28_4_ + fStack_564 + pfVar2[7] + 0.0;
          auVar26 = vblendvps_avx(auVar325,auVar24,auVar25);
          fVar150 = auVar31._0_4_;
          fVar152 = auVar31._4_4_;
          fVar154 = auVar31._8_4_;
          fVar156 = auVar31._12_4_;
          fVar312 = auVar31._16_4_;
          fVar314 = auVar31._20_4_;
          fVar315 = auVar31._24_4_;
          fVar129 = auVar31._28_4_;
          fVar269 = auVar143._0_4_;
          fVar181 = auVar143._4_4_;
          fVar288 = auVar143._8_4_;
          fVar182 = auVar143._12_4_;
          fVar290 = auVar143._16_4_;
          fVar184 = auVar143._20_4_;
          fVar292 = auVar143._24_4_;
          fVar189 = auVar16._0_4_;
          fVar207 = auVar16._4_4_;
          fVar256 = auVar16._8_4_;
          fVar316 = auVar16._12_4_;
          fVar317 = auVar16._16_4_;
          fVar318 = auVar16._20_4_;
          fVar319 = auVar16._24_4_;
          auVar306._0_4_ = fVar189 * fVar189 + fVar150 * fVar150;
          auVar306._4_4_ = fVar207 * fVar207 + fVar152 * fVar152;
          auVar306._8_4_ = fVar256 * fVar256 + fVar154 * fVar154;
          auVar306._12_4_ = fVar316 * fVar316 + fVar156 * fVar156;
          auVar306._16_4_ = fVar317 * fVar317 + fVar312 * fVar312;
          auVar306._20_4_ = fVar318 * fVar318 + fVar314 * fVar314;
          auVar306._24_4_ = fVar319 * fVar319 + fVar315 * fVar315;
          auVar306._28_4_ = fStack_324 + auVar24._28_4_;
          auVar24 = vrsqrtps_avx(auVar306);
          fVar204 = auVar24._0_4_;
          fVar210 = auVar24._4_4_;
          auVar67._4_4_ = fVar210 * 1.5;
          auVar67._0_4_ = fVar204 * 1.5;
          fVar257 = auVar24._8_4_;
          auVar67._8_4_ = fVar257 * 1.5;
          fVar183 = auVar24._12_4_;
          auVar67._12_4_ = fVar183 * 1.5;
          fVar334 = auVar24._16_4_;
          auVar67._16_4_ = fVar334 * 1.5;
          fVar186 = auVar24._20_4_;
          auVar67._20_4_ = fVar186 * 1.5;
          fVar335 = auVar24._24_4_;
          auVar67._24_4_ = fVar335 * 1.5;
          auVar67._28_4_ = auVar325._28_4_;
          auVar68._4_4_ = fVar210 * fVar210 * fVar210 * auVar306._4_4_ * 0.5;
          auVar68._0_4_ = fVar204 * fVar204 * fVar204 * auVar306._0_4_ * 0.5;
          auVar68._8_4_ = fVar257 * fVar257 * fVar257 * auVar306._8_4_ * 0.5;
          auVar68._12_4_ = fVar183 * fVar183 * fVar183 * auVar306._12_4_ * 0.5;
          auVar68._16_4_ = fVar334 * fVar334 * fVar334 * auVar306._16_4_ * 0.5;
          auVar68._20_4_ = fVar186 * fVar186 * fVar186 * auVar306._20_4_ * 0.5;
          auVar68._24_4_ = fVar335 * fVar335 * fVar335 * auVar306._24_4_ * 0.5;
          auVar68._28_4_ = auVar306._28_4_;
          auVar25 = vsubps_avx(auVar67,auVar68);
          fVar185 = auVar25._0_4_;
          fVar309 = auVar25._4_4_;
          fVar311 = auVar25._8_4_;
          fVar244 = auVar25._12_4_;
          fVar187 = auVar25._16_4_;
          fVar278 = auVar25._20_4_;
          fVar303 = auVar25._24_4_;
          fVar204 = auVar26._0_4_;
          fVar210 = auVar26._4_4_;
          fVar257 = auVar26._8_4_;
          fVar183 = auVar26._12_4_;
          fVar334 = auVar26._16_4_;
          fVar186 = auVar26._20_4_;
          fVar335 = auVar26._24_4_;
          auVar285._0_4_ = fVar204 * fVar204 + fVar269 * fVar269;
          auVar285._4_4_ = fVar210 * fVar210 + fVar181 * fVar181;
          auVar285._8_4_ = fVar257 * fVar257 + fVar288 * fVar288;
          auVar285._12_4_ = fVar183 * fVar183 + fVar182 * fVar182;
          auVar285._16_4_ = fVar334 * fVar334 + fVar290 * fVar290;
          auVar285._20_4_ = fVar186 * fVar186 + fVar184 * fVar184;
          auVar285._24_4_ = fVar335 * fVar335 + fVar292 * fVar292;
          auVar285._28_4_ = auVar24._28_4_ + auVar143._28_4_;
          auVar143 = vrsqrtps_avx(auVar285);
          fVar239 = auVar143._0_4_;
          fVar270 = auVar143._4_4_;
          auVar69._4_4_ = fVar270 * 1.5;
          auVar69._0_4_ = fVar239 * 1.5;
          fVar240 = auVar143._8_4_;
          auVar69._8_4_ = fVar240 * 1.5;
          fVar289 = auVar143._12_4_;
          auVar69._12_4_ = fVar289 * 1.5;
          fVar241 = auVar143._16_4_;
          auVar69._16_4_ = fVar241 * 1.5;
          fVar291 = auVar143._20_4_;
          auVar69._20_4_ = fVar291 * 1.5;
          fVar243 = auVar143._24_4_;
          auVar69._24_4_ = fVar243 * 1.5;
          auVar69._28_4_ = auVar325._28_4_;
          auVar70._4_4_ = fVar270 * fVar270 * fVar270 * auVar285._4_4_ * 0.5;
          auVar70._0_4_ = fVar239 * fVar239 * fVar239 * auVar285._0_4_ * 0.5;
          auVar70._8_4_ = fVar240 * fVar240 * fVar240 * auVar285._8_4_ * 0.5;
          auVar70._12_4_ = fVar289 * fVar289 * fVar289 * auVar285._12_4_ * 0.5;
          auVar70._16_4_ = fVar241 * fVar241 * fVar241 * auVar285._16_4_ * 0.5;
          auVar70._20_4_ = fVar291 * fVar291 * fVar291 * auVar285._20_4_ * 0.5;
          auVar70._24_4_ = fVar243 * fVar243 * fVar243 * auVar285._24_4_ * 0.5;
          auVar70._28_4_ = auVar285._28_4_;
          auVar26 = vsubps_avx(auVar69,auVar70);
          fVar239 = auVar26._0_4_;
          fVar270 = auVar26._4_4_;
          fVar240 = auVar26._8_4_;
          fVar289 = auVar26._12_4_;
          fVar241 = auVar26._16_4_;
          fVar291 = auVar26._20_4_;
          fVar243 = auVar26._24_4_;
          fVar189 = (float)local_720._0_4_ * fVar185 * fVar189;
          fVar207 = (float)local_720._4_4_ * fVar309 * fVar207;
          auVar71._4_4_ = fVar207;
          auVar71._0_4_ = fVar189;
          fVar256 = fStack_718 * fVar311 * fVar256;
          auVar71._8_4_ = fVar256;
          fVar316 = fStack_714 * fVar244 * fVar316;
          auVar71._12_4_ = fVar316;
          fVar317 = fStack_710 * fVar187 * fVar317;
          auVar71._16_4_ = fVar317;
          fVar318 = fStack_70c * fVar278 * fVar318;
          auVar71._20_4_ = fVar318;
          fVar319 = fStack_708 * fVar303 * fVar319;
          auVar71._24_4_ = fVar319;
          auVar71._28_4_ = auVar143._28_4_;
          local_560._4_4_ = fVar207 + auVar284._4_4_;
          local_560._0_4_ = fVar189 + auVar284._0_4_;
          fStack_558 = fVar256 + auVar284._8_4_;
          fStack_554 = fVar316 + auVar284._12_4_;
          fStack_550 = fVar317 + auVar284._16_4_;
          fStack_54c = fVar318 + auVar284._20_4_;
          fStack_548 = fVar319 + auVar284._24_4_;
          fStack_544 = auVar143._28_4_ + auVar284._28_4_;
          fVar189 = (float)local_720._0_4_ * fVar185 * -fVar150;
          fVar207 = (float)local_720._4_4_ * fVar309 * -fVar152;
          auVar72._4_4_ = fVar207;
          auVar72._0_4_ = fVar189;
          fVar256 = fStack_718 * fVar311 * -fVar154;
          auVar72._8_4_ = fVar256;
          fVar316 = fStack_714 * fVar244 * -fVar156;
          auVar72._12_4_ = fVar316;
          fVar317 = fStack_710 * fVar187 * -fVar312;
          auVar72._16_4_ = fVar317;
          fVar318 = fStack_70c * fVar278 * -fVar314;
          auVar72._20_4_ = fVar318;
          fVar319 = fStack_708 * fVar303 * -fVar315;
          auVar72._24_4_ = fVar319;
          auVar72._28_4_ = -fVar129;
          local_4a0._4_4_ = local_740._4_4_ + fVar207;
          local_4a0._0_4_ = local_740._0_4_ + fVar189;
          fStack_498 = local_740._8_4_ + fVar256;
          fStack_494 = local_740._12_4_ + fVar316;
          fStack_490 = local_740._16_4_ + fVar317;
          fStack_48c = local_740._20_4_ + fVar318;
          fStack_488 = local_740._24_4_ + fVar319;
          fStack_484 = local_740._28_4_ + -fVar129;
          fVar189 = fVar185 * 0.0 * (float)local_720._0_4_;
          fVar207 = fVar309 * 0.0 * (float)local_720._4_4_;
          auVar73._4_4_ = fVar207;
          auVar73._0_4_ = fVar189;
          fVar256 = fVar311 * 0.0 * fStack_718;
          auVar73._8_4_ = fVar256;
          fVar316 = fVar244 * 0.0 * fStack_714;
          auVar73._12_4_ = fVar316;
          fVar317 = fVar187 * 0.0 * fStack_710;
          auVar73._16_4_ = fVar317;
          fVar318 = fVar278 * 0.0 * fStack_70c;
          auVar73._20_4_ = fVar318;
          fVar319 = fVar303 * 0.0 * fStack_708;
          auVar73._24_4_ = fVar319;
          auVar73._28_4_ = fVar129;
          auVar148 = vsubps_avx(auVar284,auVar71);
          auVar352._0_4_ = fVar189 + auVar145._0_4_;
          auVar352._4_4_ = fVar207 + auVar145._4_4_;
          auVar352._8_4_ = fVar256 + auVar145._8_4_;
          auVar352._12_4_ = fVar316 + auVar145._12_4_;
          auVar352._16_4_ = fVar317 + auVar145._16_4_;
          auVar352._20_4_ = fVar318 + auVar145._20_4_;
          auVar352._24_4_ = fVar319 + auVar145._24_4_;
          auVar352._28_4_ = fVar129 + auVar145._28_4_;
          fVar189 = auVar341._0_4_ * fVar239 * fVar204;
          fVar204 = auVar341._4_4_ * fVar270 * fVar210;
          auVar74._4_4_ = fVar204;
          auVar74._0_4_ = fVar189;
          fVar207 = auVar341._8_4_ * fVar240 * fVar257;
          auVar74._8_4_ = fVar207;
          fVar210 = auVar341._12_4_ * fVar289 * fVar183;
          auVar74._12_4_ = fVar210;
          fVar256 = auVar341._16_4_ * fVar241 * fVar334;
          auVar74._16_4_ = fVar256;
          fVar257 = auVar341._20_4_ * fVar291 * fVar186;
          auVar74._20_4_ = fVar257;
          fVar316 = auVar341._24_4_ * fVar243 * fVar335;
          auVar74._24_4_ = fVar316;
          auVar74._28_4_ = fStack_704;
          auVar322 = vsubps_avx(local_740,auVar72);
          auVar332._0_4_ = local_520._0_4_ + fVar189;
          auVar332._4_4_ = local_520._4_4_ + fVar204;
          auVar332._8_4_ = local_520._8_4_ + fVar207;
          auVar332._12_4_ = local_520._12_4_ + fVar210;
          auVar332._16_4_ = local_520._16_4_ + fVar256;
          auVar332._20_4_ = local_520._20_4_ + fVar257;
          auVar332._24_4_ = local_520._24_4_ + fVar316;
          auVar332._28_4_ = local_520._28_4_ + fStack_704;
          fVar189 = fVar239 * -fVar269 * auVar341._0_4_;
          fVar204 = fVar270 * -fVar181 * auVar341._4_4_;
          auVar75._4_4_ = fVar204;
          auVar75._0_4_ = fVar189;
          fVar207 = fVar240 * -fVar288 * auVar341._8_4_;
          auVar75._8_4_ = fVar207;
          fVar210 = fVar289 * -fVar182 * auVar341._12_4_;
          auVar75._12_4_ = fVar210;
          fVar256 = fVar241 * -fVar290 * auVar341._16_4_;
          auVar75._16_4_ = fVar256;
          fVar257 = fVar291 * -fVar184 * auVar341._20_4_;
          auVar75._20_4_ = fVar257;
          fVar316 = fVar243 * -fVar292 * auVar341._24_4_;
          auVar75._24_4_ = fVar316;
          auVar75._28_4_ = auVar284._28_4_;
          auVar27 = vsubps_avx(auVar145,auVar73);
          auVar237._0_4_ = local_400._0_4_ + fVar189;
          auVar237._4_4_ = local_400._4_4_ + fVar204;
          auVar237._8_4_ = local_400._8_4_ + fVar207;
          auVar237._12_4_ = local_400._12_4_ + fVar210;
          auVar237._16_4_ = local_400._16_4_ + fVar256;
          auVar237._20_4_ = local_400._20_4_ + fVar257;
          auVar237._24_4_ = local_400._24_4_ + fVar316;
          auVar237._28_4_ = local_400._28_4_ + auVar284._28_4_;
          fVar189 = fVar239 * 0.0 * auVar341._0_4_;
          fVar204 = fVar270 * 0.0 * auVar341._4_4_;
          auVar76._4_4_ = fVar204;
          auVar76._0_4_ = fVar189;
          fVar207 = fVar240 * 0.0 * auVar341._8_4_;
          auVar76._8_4_ = fVar207;
          fVar210 = fVar289 * 0.0 * auVar341._12_4_;
          auVar76._12_4_ = fVar210;
          fVar256 = fVar241 * 0.0 * auVar341._16_4_;
          auVar76._16_4_ = fVar256;
          fVar257 = fVar291 * 0.0 * auVar341._20_4_;
          auVar76._20_4_ = fVar257;
          fVar316 = fVar243 * 0.0 * auVar341._24_4_;
          auVar76._24_4_ = fVar316;
          auVar76._28_4_ = auVar145._28_4_;
          auVar143 = vsubps_avx(local_520,auVar74);
          auVar298._0_4_ = (float)local_580._0_4_ + fVar189;
          auVar298._4_4_ = (float)local_580._4_4_ + fVar204;
          auVar298._8_4_ = fStack_578 + fVar207;
          auVar298._12_4_ = fStack_574 + fVar210;
          auVar298._16_4_ = fStack_570 + fVar256;
          auVar298._20_4_ = fStack_56c + fVar257;
          auVar298._24_4_ = fStack_568 + fVar316;
          auVar298._28_4_ = fStack_564 + auVar145._28_4_;
          auVar24 = vsubps_avx(local_400,auVar75);
          auVar25 = vsubps_avx(_local_580,auVar76);
          auVar31 = vsubps_avx(auVar237,auVar322);
          auVar16 = vsubps_avx(auVar298,auVar27);
          auVar77._4_4_ = auVar27._4_4_ * auVar31._4_4_;
          auVar77._0_4_ = auVar27._0_4_ * auVar31._0_4_;
          auVar77._8_4_ = auVar27._8_4_ * auVar31._8_4_;
          auVar77._12_4_ = auVar27._12_4_ * auVar31._12_4_;
          auVar77._16_4_ = auVar27._16_4_ * auVar31._16_4_;
          auVar77._20_4_ = auVar27._20_4_ * auVar31._20_4_;
          auVar77._24_4_ = auVar27._24_4_ * auVar31._24_4_;
          auVar77._28_4_ = auVar325._28_4_;
          auVar78._4_4_ = auVar322._4_4_ * auVar16._4_4_;
          auVar78._0_4_ = auVar322._0_4_ * auVar16._0_4_;
          auVar78._8_4_ = auVar322._8_4_ * auVar16._8_4_;
          auVar78._12_4_ = auVar322._12_4_ * auVar16._12_4_;
          auVar78._16_4_ = auVar322._16_4_ * auVar16._16_4_;
          auVar78._20_4_ = auVar322._20_4_ * auVar16._20_4_;
          auVar78._24_4_ = auVar322._24_4_ * auVar16._24_4_;
          auVar78._28_4_ = fStack_564;
          auVar201 = vsubps_avx(auVar78,auVar77);
          auVar79._4_4_ = auVar148._4_4_ * auVar16._4_4_;
          auVar79._0_4_ = auVar148._0_4_ * auVar16._0_4_;
          auVar79._8_4_ = auVar148._8_4_ * auVar16._8_4_;
          auVar79._12_4_ = auVar148._12_4_ * auVar16._12_4_;
          auVar79._16_4_ = auVar148._16_4_ * auVar16._16_4_;
          auVar79._20_4_ = auVar148._20_4_ * auVar16._20_4_;
          auVar79._24_4_ = auVar148._24_4_ * auVar16._24_4_;
          auVar79._28_4_ = auVar16._28_4_;
          auVar16 = vsubps_avx(auVar332,auVar148);
          auVar80._4_4_ = auVar27._4_4_ * auVar16._4_4_;
          auVar80._0_4_ = auVar27._0_4_ * auVar16._0_4_;
          auVar80._8_4_ = auVar27._8_4_ * auVar16._8_4_;
          auVar80._12_4_ = auVar27._12_4_ * auVar16._12_4_;
          auVar80._16_4_ = auVar27._16_4_ * auVar16._16_4_;
          auVar80._20_4_ = auVar27._20_4_ * auVar16._20_4_;
          auVar80._24_4_ = auVar27._24_4_ * auVar16._24_4_;
          auVar80._28_4_ = auVar26._28_4_;
          auVar251 = vsubps_avx(auVar80,auVar79);
          auVar81._4_4_ = auVar322._4_4_ * auVar16._4_4_;
          auVar81._0_4_ = auVar322._0_4_ * auVar16._0_4_;
          auVar81._8_4_ = auVar322._8_4_ * auVar16._8_4_;
          auVar81._12_4_ = auVar322._12_4_ * auVar16._12_4_;
          auVar81._16_4_ = auVar322._16_4_ * auVar16._16_4_;
          auVar81._20_4_ = auVar322._20_4_ * auVar16._20_4_;
          auVar81._24_4_ = auVar322._24_4_ * auVar16._24_4_;
          auVar81._28_4_ = auVar26._28_4_;
          auVar82._4_4_ = auVar148._4_4_ * auVar31._4_4_;
          auVar82._0_4_ = auVar148._0_4_ * auVar31._0_4_;
          auVar82._8_4_ = auVar148._8_4_ * auVar31._8_4_;
          auVar82._12_4_ = auVar148._12_4_ * auVar31._12_4_;
          auVar82._16_4_ = auVar148._16_4_ * auVar31._16_4_;
          auVar82._20_4_ = auVar148._20_4_ * auVar31._20_4_;
          auVar82._24_4_ = auVar148._24_4_ * auVar31._24_4_;
          auVar82._28_4_ = auVar31._28_4_;
          auVar26 = vsubps_avx(auVar82,auVar81);
          auVar171._0_4_ = auVar201._0_4_ * 0.0 + auVar26._0_4_ + auVar251._0_4_ * 0.0;
          auVar171._4_4_ = auVar201._4_4_ * 0.0 + auVar26._4_4_ + auVar251._4_4_ * 0.0;
          auVar171._8_4_ = auVar201._8_4_ * 0.0 + auVar26._8_4_ + auVar251._8_4_ * 0.0;
          auVar171._12_4_ = auVar201._12_4_ * 0.0 + auVar26._12_4_ + auVar251._12_4_ * 0.0;
          auVar171._16_4_ = auVar201._16_4_ * 0.0 + auVar26._16_4_ + auVar251._16_4_ * 0.0;
          auVar171._20_4_ = auVar201._20_4_ * 0.0 + auVar26._20_4_ + auVar251._20_4_ * 0.0;
          auVar171._24_4_ = auVar201._24_4_ * 0.0 + auVar26._24_4_ + auVar251._24_4_ * 0.0;
          auVar171._28_4_ = auVar201._28_4_ + auVar26._28_4_ + auVar251._28_4_;
          auVar275 = vcmpps_avx(auVar171,ZEXT832(0) << 0x20,2);
          auVar143 = vblendvps_avx(auVar143,_local_560,auVar275);
          auVar26 = vblendvps_avx(auVar24,_local_4a0,auVar275);
          auVar24 = vblendvps_avx(auVar25,auVar352,auVar275);
          auVar25 = vblendvps_avx(auVar148,auVar332,auVar275);
          auVar31 = vblendvps_avx(auVar322,auVar237,auVar275);
          auVar16 = vblendvps_avx(auVar27,auVar298,auVar275);
          auVar148 = vblendvps_avx(auVar332,auVar148,auVar275);
          auVar201 = vblendvps_avx(auVar237,auVar322,auVar275);
          auVar251 = vblendvps_avx(auVar298,auVar27,auVar275);
          local_740 = vandps_avx(local_380,_local_3c0);
          auVar148 = vsubps_avx(auVar148,auVar143);
          auVar28 = vsubps_avx(auVar201,auVar26);
          auVar251 = vsubps_avx(auVar251,auVar24);
          auVar29 = vsubps_avx(auVar26,auVar31);
          fVar189 = auVar28._0_4_;
          fVar160 = auVar24._0_4_;
          fVar183 = auVar28._4_4_;
          fVar188 = auVar24._4_4_;
          auVar83._4_4_ = fVar188 * fVar183;
          auVar83._0_4_ = fVar160 * fVar189;
          fVar269 = auVar28._8_4_;
          fVar271 = auVar24._8_4_;
          auVar83._8_4_ = fVar271 * fVar269;
          fVar289 = auVar28._12_4_;
          fVar242 = auVar24._12_4_;
          auVar83._12_4_ = fVar242 * fVar289;
          fVar185 = auVar28._16_4_;
          auVar321._0_4_ = auVar24._16_4_;
          auVar83._16_4_ = auVar321._0_4_ * fVar185;
          fVar150 = auVar28._20_4_;
          fVar191 = auVar24._20_4_;
          auVar83._20_4_ = fVar191 * fVar150;
          fVar129 = auVar28._24_4_;
          fVar206 = auVar24._24_4_;
          auVar83._24_4_ = fVar206 * fVar129;
          auVar83._28_4_ = auVar201._28_4_;
          fVar204 = auVar26._0_4_;
          fVar209 = auVar251._0_4_;
          fVar317 = auVar26._4_4_;
          fVar212 = auVar251._4_4_;
          auVar84._4_4_ = fVar212 * fVar317;
          auVar84._0_4_ = fVar209 * fVar204;
          fVar239 = auVar26._8_4_;
          fVar245 = auVar251._8_4_;
          auVar84._8_4_ = fVar245 * fVar239;
          fVar290 = auVar26._12_4_;
          fVar260 = auVar251._12_4_;
          auVar84._12_4_ = fVar260 * fVar290;
          fVar309 = auVar26._16_4_;
          fVar328 = auVar251._16_4_;
          auVar84._16_4_ = fVar328 * fVar309;
          fVar152 = auVar26._20_4_;
          fVar333 = auVar251._20_4_;
          auVar84._20_4_ = fVar333 * fVar152;
          fVar228 = auVar26._24_4_;
          fVar293 = auVar251._24_4_;
          uVar126 = auVar322._28_4_;
          auVar84._24_4_ = fVar293 * fVar228;
          auVar84._28_4_ = uVar126;
          auVar201 = vsubps_avx(auVar84,auVar83);
          fVar207 = auVar143._0_4_;
          fVar334 = auVar143._4_4_;
          auVar85._4_4_ = fVar212 * fVar334;
          auVar85._0_4_ = fVar209 * fVar207;
          fVar181 = auVar143._8_4_;
          auVar85._8_4_ = fVar245 * fVar181;
          fVar241 = auVar143._12_4_;
          auVar85._12_4_ = fVar260 * fVar241;
          fVar311 = auVar143._16_4_;
          auVar85._16_4_ = fVar328 * fVar311;
          fVar154 = auVar143._20_4_;
          auVar85._20_4_ = fVar333 * fVar154;
          fVar238 = auVar143._24_4_;
          auVar85._24_4_ = fVar293 * fVar238;
          auVar85._28_4_ = uVar126;
          fVar210 = auVar148._0_4_;
          fVar318 = auVar148._4_4_;
          auVar86._4_4_ = fVar188 * fVar318;
          auVar86._0_4_ = fVar160 * fVar210;
          fVar270 = auVar148._8_4_;
          auVar86._8_4_ = fVar271 * fVar270;
          fVar184 = auVar148._12_4_;
          auVar86._12_4_ = fVar242 * fVar184;
          fVar244 = auVar148._16_4_;
          auVar86._16_4_ = auVar321._0_4_ * fVar244;
          fVar156 = auVar148._20_4_;
          auVar86._20_4_ = fVar191 * fVar156;
          fVar155 = auVar148._24_4_;
          auVar86._24_4_ = fVar206 * fVar155;
          auVar86._28_4_ = auVar332._28_4_;
          auVar322 = vsubps_avx(auVar86,auVar85);
          auVar87._4_4_ = fVar317 * fVar318;
          auVar87._0_4_ = fVar204 * fVar210;
          auVar87._8_4_ = fVar239 * fVar270;
          auVar87._12_4_ = fVar290 * fVar184;
          auVar87._16_4_ = fVar309 * fVar244;
          auVar87._20_4_ = fVar152 * fVar156;
          auVar87._24_4_ = fVar228 * fVar155;
          auVar87._28_4_ = uVar126;
          auVar88._4_4_ = fVar334 * fVar183;
          auVar88._0_4_ = fVar207 * fVar189;
          auVar88._8_4_ = fVar181 * fVar269;
          auVar88._12_4_ = fVar241 * fVar289;
          auVar88._16_4_ = fVar311 * fVar185;
          auVar88._20_4_ = fVar154 * fVar150;
          auVar88._24_4_ = fVar238 * fVar129;
          auVar88._28_4_ = auVar27._28_4_;
          auVar27 = vsubps_avx(auVar88,auVar87);
          auVar30 = vsubps_avx(auVar24,auVar16);
          fVar257 = auVar27._28_4_ + auVar322._28_4_;
          auVar307._0_4_ = auVar27._0_4_ + auVar322._0_4_ * 0.0 + auVar201._0_4_ * 0.0;
          auVar307._4_4_ = auVar27._4_4_ + auVar322._4_4_ * 0.0 + auVar201._4_4_ * 0.0;
          auVar307._8_4_ = auVar27._8_4_ + auVar322._8_4_ * 0.0 + auVar201._8_4_ * 0.0;
          auVar307._12_4_ = auVar27._12_4_ + auVar322._12_4_ * 0.0 + auVar201._12_4_ * 0.0;
          auVar307._16_4_ = auVar27._16_4_ + auVar322._16_4_ * 0.0 + auVar201._16_4_ * 0.0;
          auVar307._20_4_ = auVar27._20_4_ + auVar322._20_4_ * 0.0 + auVar201._20_4_ * 0.0;
          auVar307._24_4_ = auVar27._24_4_ + auVar322._24_4_ * 0.0 + auVar201._24_4_ * 0.0;
          auVar307._28_4_ = fVar257 + auVar201._28_4_;
          fVar256 = auVar29._0_4_;
          fVar186 = auVar29._4_4_;
          auVar89._4_4_ = auVar16._4_4_ * fVar186;
          auVar89._0_4_ = auVar16._0_4_ * fVar256;
          fVar288 = auVar29._8_4_;
          auVar89._8_4_ = auVar16._8_4_ * fVar288;
          fVar291 = auVar29._12_4_;
          auVar89._12_4_ = auVar16._12_4_ * fVar291;
          fVar187 = auVar29._16_4_;
          auVar89._16_4_ = auVar16._16_4_ * fVar187;
          fVar312 = auVar29._20_4_;
          auVar89._20_4_ = auVar16._20_4_ * fVar312;
          fVar157 = auVar29._24_4_;
          auVar89._24_4_ = auVar16._24_4_ * fVar157;
          auVar89._28_4_ = fVar257;
          fVar257 = auVar30._0_4_;
          fVar319 = auVar30._4_4_;
          auVar90._4_4_ = auVar31._4_4_ * fVar319;
          auVar90._0_4_ = auVar31._0_4_ * fVar257;
          fVar240 = auVar30._8_4_;
          auVar90._8_4_ = auVar31._8_4_ * fVar240;
          fVar292 = auVar30._12_4_;
          auVar90._12_4_ = auVar31._12_4_ * fVar292;
          fVar278 = auVar30._16_4_;
          auVar90._16_4_ = auVar31._16_4_ * fVar278;
          fVar314 = auVar30._20_4_;
          auVar90._20_4_ = auVar31._20_4_ * fVar314;
          fVar158 = auVar30._24_4_;
          auVar90._24_4_ = auVar31._24_4_ * fVar158;
          auVar90._28_4_ = auVar27._28_4_;
          auVar24 = vsubps_avx(auVar90,auVar89);
          auVar143 = vsubps_avx(auVar143,auVar25);
          fVar316 = auVar143._0_4_;
          fVar335 = auVar143._4_4_;
          auVar91._4_4_ = auVar16._4_4_ * fVar335;
          auVar91._0_4_ = auVar16._0_4_ * fVar316;
          fVar182 = auVar143._8_4_;
          auVar91._8_4_ = auVar16._8_4_ * fVar182;
          fVar243 = auVar143._12_4_;
          auVar91._12_4_ = auVar16._12_4_ * fVar243;
          fVar303 = auVar143._16_4_;
          auVar91._16_4_ = auVar16._16_4_ * fVar303;
          fVar315 = auVar143._20_4_;
          auVar91._20_4_ = auVar16._20_4_ * fVar315;
          fVar159 = auVar143._24_4_;
          auVar91._24_4_ = auVar16._24_4_ * fVar159;
          auVar91._28_4_ = auVar16._28_4_;
          auVar92._4_4_ = fVar319 * auVar25._4_4_;
          auVar92._0_4_ = fVar257 * auVar25._0_4_;
          auVar92._8_4_ = fVar240 * auVar25._8_4_;
          auVar92._12_4_ = fVar292 * auVar25._12_4_;
          auVar92._16_4_ = fVar278 * auVar25._16_4_;
          auVar92._20_4_ = fVar314 * auVar25._20_4_;
          auVar92._24_4_ = fVar158 * auVar25._24_4_;
          auVar92._28_4_ = auVar201._28_4_;
          auVar143 = vsubps_avx(auVar91,auVar92);
          auVar93._4_4_ = auVar31._4_4_ * fVar335;
          auVar93._0_4_ = auVar31._0_4_ * fVar316;
          auVar93._8_4_ = auVar31._8_4_ * fVar182;
          auVar93._12_4_ = auVar31._12_4_ * fVar243;
          auVar93._16_4_ = auVar31._16_4_ * fVar303;
          auVar93._20_4_ = auVar31._20_4_ * fVar315;
          auVar93._24_4_ = auVar31._24_4_ * fVar159;
          auVar93._28_4_ = auVar31._28_4_;
          auVar94._4_4_ = fVar186 * auVar25._4_4_;
          auVar94._0_4_ = fVar256 * auVar25._0_4_;
          auVar94._8_4_ = fVar288 * auVar25._8_4_;
          auVar94._12_4_ = fVar291 * auVar25._12_4_;
          auVar94._16_4_ = fVar187 * auVar25._16_4_;
          auVar94._20_4_ = fVar312 * auVar25._20_4_;
          auVar94._24_4_ = fVar157 * auVar25._24_4_;
          auVar94._28_4_ = auVar25._28_4_;
          auVar25 = vsubps_avx(auVar94,auVar93);
          auVar146._0_4_ = auVar24._0_4_ * 0.0 + auVar25._0_4_ + auVar143._0_4_ * 0.0;
          auVar146._4_4_ = auVar24._4_4_ * 0.0 + auVar25._4_4_ + auVar143._4_4_ * 0.0;
          auVar146._8_4_ = auVar24._8_4_ * 0.0 + auVar25._8_4_ + auVar143._8_4_ * 0.0;
          auVar146._12_4_ = auVar24._12_4_ * 0.0 + auVar25._12_4_ + auVar143._12_4_ * 0.0;
          auVar146._16_4_ = auVar24._16_4_ * 0.0 + auVar25._16_4_ + auVar143._16_4_ * 0.0;
          auVar146._20_4_ = auVar24._20_4_ * 0.0 + auVar25._20_4_ + auVar143._20_4_ * 0.0;
          auVar146._24_4_ = auVar24._24_4_ * 0.0 + auVar25._24_4_ + auVar143._24_4_ * 0.0;
          auVar146._28_4_ = auVar143._28_4_ + auVar25._28_4_ + auVar143._28_4_;
          auVar143 = vmaxps_avx(auVar307,auVar146);
          auVar24 = vcmpps_avx(auVar143,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar25 = local_740 & auVar24;
          auVar143 = auVar307;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0x7f,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0xbf,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar25[0x1f]) {
LAB_00905225:
            auVar310 = auVar143._4_12_;
            auVar221._8_8_ = local_460[1]._8_8_;
            auVar221._0_8_ = local_460[1]._0_8_;
            auVar221._16_8_ = local_460[1]._16_8_;
            auVar221._24_8_ = local_460[1]._24_8_;
          }
          else {
            auVar143 = vandps_avx(auVar24,local_740);
            auVar310 = auVar143._4_12_;
            auVar95._4_4_ = fVar319 * fVar183;
            auVar95._0_4_ = fVar257 * fVar189;
            auVar95._8_4_ = fVar240 * fVar269;
            auVar95._12_4_ = fVar292 * fVar289;
            auVar95._16_4_ = fVar278 * fVar185;
            auVar95._20_4_ = fVar314 * fVar150;
            auVar95._24_4_ = fVar158 * fVar129;
            auVar95._28_4_ = local_740._28_4_;
            auVar96._4_4_ = fVar186 * fVar212;
            auVar96._0_4_ = fVar256 * fVar209;
            auVar96._8_4_ = fVar288 * fVar245;
            auVar96._12_4_ = fVar291 * fVar260;
            auVar96._16_4_ = fVar187 * fVar328;
            auVar96._20_4_ = fVar312 * fVar333;
            auVar96._24_4_ = fVar157 * fVar293;
            auVar96._28_4_ = auVar24._28_4_;
            auVar25 = vsubps_avx(auVar96,auVar95);
            auVar97._4_4_ = fVar335 * fVar212;
            auVar97._0_4_ = fVar316 * fVar209;
            auVar97._8_4_ = fVar182 * fVar245;
            auVar97._12_4_ = fVar243 * fVar260;
            auVar97._16_4_ = fVar303 * fVar328;
            auVar97._20_4_ = fVar315 * fVar333;
            auVar97._24_4_ = fVar159 * fVar293;
            auVar97._28_4_ = auVar251._28_4_;
            auVar98._4_4_ = fVar319 * fVar318;
            auVar98._0_4_ = fVar257 * fVar210;
            auVar98._8_4_ = fVar240 * fVar270;
            auVar98._12_4_ = fVar292 * fVar184;
            auVar98._16_4_ = fVar278 * fVar244;
            auVar98._20_4_ = fVar314 * fVar156;
            auVar98._24_4_ = fVar158 * fVar155;
            auVar98._28_4_ = auVar30._28_4_;
            auVar31 = vsubps_avx(auVar98,auVar97);
            auVar99._4_4_ = fVar186 * fVar318;
            auVar99._0_4_ = fVar256 * fVar210;
            auVar99._8_4_ = fVar288 * fVar270;
            auVar99._12_4_ = fVar291 * fVar184;
            auVar99._16_4_ = fVar187 * fVar244;
            auVar99._20_4_ = fVar312 * fVar156;
            auVar99._24_4_ = fVar157 * fVar155;
            auVar99._28_4_ = auVar148._28_4_;
            auVar100._4_4_ = fVar335 * fVar183;
            auVar100._0_4_ = fVar316 * fVar189;
            auVar100._8_4_ = fVar182 * fVar269;
            auVar100._12_4_ = fVar243 * fVar289;
            auVar100._16_4_ = fVar303 * fVar185;
            auVar100._20_4_ = fVar315 * fVar150;
            auVar100._24_4_ = fVar159 * fVar129;
            auVar100._28_4_ = auVar28._28_4_;
            auVar16 = vsubps_avx(auVar100,auVar99);
            auVar286._0_4_ = auVar25._0_4_ * 0.0 + auVar16._0_4_ + auVar31._0_4_ * 0.0;
            auVar286._4_4_ = auVar25._4_4_ * 0.0 + auVar16._4_4_ + auVar31._4_4_ * 0.0;
            auVar286._8_4_ = auVar25._8_4_ * 0.0 + auVar16._8_4_ + auVar31._8_4_ * 0.0;
            auVar286._12_4_ = auVar25._12_4_ * 0.0 + auVar16._12_4_ + auVar31._12_4_ * 0.0;
            auVar286._16_4_ = auVar25._16_4_ * 0.0 + auVar16._16_4_ + auVar31._16_4_ * 0.0;
            auVar286._20_4_ = auVar25._20_4_ * 0.0 + auVar16._20_4_ + auVar31._20_4_ * 0.0;
            auVar286._24_4_ = auVar25._24_4_ * 0.0 + auVar16._24_4_ + auVar31._24_4_ * 0.0;
            auVar286._28_4_ = auVar29._28_4_ + auVar16._28_4_ + auVar148._28_4_;
            auVar24 = vrcpps_avx(auVar286);
            fVar210 = auVar24._0_4_;
            fVar256 = auVar24._4_4_;
            auVar101._4_4_ = auVar286._4_4_ * fVar256;
            auVar101._0_4_ = auVar286._0_4_ * fVar210;
            fVar257 = auVar24._8_4_;
            auVar101._8_4_ = auVar286._8_4_ * fVar257;
            fVar316 = auVar24._12_4_;
            auVar101._12_4_ = auVar286._12_4_ * fVar316;
            fVar183 = auVar24._16_4_;
            auVar101._16_4_ = auVar286._16_4_ * fVar183;
            fVar318 = auVar24._20_4_;
            auVar101._20_4_ = auVar286._20_4_ * fVar318;
            fVar186 = auVar24._24_4_;
            auVar101._24_4_ = auVar286._24_4_ * fVar186;
            auVar101._28_4_ = auVar30._28_4_;
            auVar326._8_4_ = 0x3f800000;
            auVar326._0_8_ = 0x3f8000003f800000;
            auVar326._12_4_ = 0x3f800000;
            auVar326._16_4_ = 0x3f800000;
            auVar326._20_4_ = 0x3f800000;
            auVar326._24_4_ = 0x3f800000;
            auVar326._28_4_ = 0x3f800000;
            auVar24 = vsubps_avx(auVar326,auVar101);
            fVar210 = auVar24._0_4_ * fVar210 + fVar210;
            fVar256 = auVar24._4_4_ * fVar256 + fVar256;
            fVar257 = auVar24._8_4_ * fVar257 + fVar257;
            fVar316 = auVar24._12_4_ * fVar316 + fVar316;
            fVar183 = auVar24._16_4_ * fVar183 + fVar183;
            fVar318 = auVar24._20_4_ * fVar318 + fVar318;
            fVar186 = auVar24._24_4_ * fVar186 + fVar186;
            auVar102._4_4_ =
                 (fVar334 * auVar25._4_4_ + auVar31._4_4_ * fVar317 + fVar188 * auVar16._4_4_) *
                 fVar256;
            auVar102._0_4_ =
                 (fVar207 * auVar25._0_4_ + auVar31._0_4_ * fVar204 + fVar160 * auVar16._0_4_) *
                 fVar210;
            auVar102._8_4_ =
                 (fVar181 * auVar25._8_4_ + auVar31._8_4_ * fVar239 + fVar271 * auVar16._8_4_) *
                 fVar257;
            auVar102._12_4_ =
                 (fVar241 * auVar25._12_4_ + auVar31._12_4_ * fVar290 + fVar242 * auVar16._12_4_) *
                 fVar316;
            auVar102._16_4_ =
                 (fVar311 * auVar25._16_4_ +
                 auVar31._16_4_ * fVar309 + auVar321._0_4_ * auVar16._16_4_) * fVar183;
            auVar102._20_4_ =
                 (fVar154 * auVar25._20_4_ + auVar31._20_4_ * fVar152 + fVar191 * auVar16._20_4_) *
                 fVar318;
            auVar102._24_4_ =
                 (fVar238 * auVar25._24_4_ + auVar31._24_4_ * fVar228 + fVar206 * auVar16._24_4_) *
                 fVar186;
            auVar102._28_4_ = auVar26._28_4_ + auVar16._28_4_;
            fVar189 = (ray->super_RayK<1>).tfar;
            auVar220._4_4_ = fVar189;
            auVar220._0_4_ = fVar189;
            auVar220._8_4_ = fVar189;
            auVar220._12_4_ = fVar189;
            auVar220._16_4_ = fVar189;
            auVar220._20_4_ = fVar189;
            auVar220._24_4_ = fVar189;
            auVar220._28_4_ = fVar189;
            auVar109._4_4_ = fStack_3dc;
            auVar109._0_4_ = local_3e0;
            auVar109._8_4_ = fStack_3d8;
            auVar109._12_4_ = fStack_3d4;
            auVar109._16_4_ = fStack_3d0;
            auVar109._20_4_ = fStack_3cc;
            auVar109._24_4_ = fStack_3c8;
            auVar109._28_4_ = fStack_3c4;
            auVar24 = vcmpps_avx(auVar109,auVar102,2);
            auVar26 = vcmpps_avx(auVar102,auVar220,2);
            auVar26 = vandps_avx(auVar24,auVar26);
            auVar25 = auVar143 & auVar26;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar25 >> 0x7f,0) == '\0') &&
                  (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0xbf,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar25[0x1f]) goto LAB_00905225;
            auVar143 = vandps_avx(auVar143,auVar26);
            auVar26 = vcmpps_avx(auVar286,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar25 = auVar143 & auVar26;
            auVar221._8_8_ = local_460[1]._8_8_;
            auVar221._0_8_ = local_460[1]._0_8_;
            auVar221._16_8_ = local_460[1]._16_8_;
            auVar221._24_8_ = local_460[1]._24_8_;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar221 = vandps_avx(auVar26,auVar143);
              auVar103._4_4_ = auVar307._4_4_ * fVar256;
              auVar103._0_4_ = auVar307._0_4_ * fVar210;
              auVar103._8_4_ = auVar307._8_4_ * fVar257;
              auVar103._12_4_ = auVar307._12_4_ * fVar316;
              auVar103._16_4_ = auVar307._16_4_ * fVar183;
              auVar103._20_4_ = auVar307._20_4_ * fVar318;
              auVar103._24_4_ = auVar307._24_4_ * fVar186;
              auVar103._28_4_ = auVar24._28_4_;
              auVar104._4_4_ = auVar146._4_4_ * fVar256;
              auVar104._0_4_ = auVar146._0_4_ * fVar210;
              auVar104._8_4_ = auVar146._8_4_ * fVar257;
              auVar104._12_4_ = auVar146._12_4_ * fVar316;
              auVar104._16_4_ = auVar146._16_4_ * fVar183;
              auVar104._20_4_ = auVar146._20_4_ * fVar318;
              auVar104._24_4_ = auVar146._24_4_ * fVar186;
              auVar104._28_4_ = auVar146._28_4_;
              auVar263._8_4_ = 0x3f800000;
              auVar263._0_8_ = 0x3f8000003f800000;
              auVar263._12_4_ = 0x3f800000;
              auVar263._16_4_ = 0x3f800000;
              auVar263._20_4_ = 0x3f800000;
              auVar263._24_4_ = 0x3f800000;
              auVar263._28_4_ = 0x3f800000;
              auVar143 = vsubps_avx(auVar263,auVar103);
              _local_420 = vblendvps_avx(auVar143,auVar103,auVar275);
              auVar143 = vsubps_avx(auVar263,auVar104);
              _local_320 = vblendvps_avx(auVar143,auVar104,auVar275);
              local_300 = auVar102;
            }
          }
          auVar299 = ZEXT3264(local_6a0);
          auVar287 = ZEXT3264(local_700);
          if ((((((((auVar221 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar221 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar221 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar221 >> 0x7f,0) == '\0') &&
                (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar221 >> 0xbf,0) == '\0') &&
              (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar221[0x1f]) {
LAB_00904f75:
            auVar254 = ZEXT3264(_local_600);
            goto LAB_00904f7e;
          }
          auVar143 = vsubps_avx(auVar341,_local_720);
          local_720._0_4_ = (float)local_720._0_4_ + auVar143._0_4_ * (float)local_420._0_4_;
          local_720._4_4_ = (float)local_720._4_4_ + auVar143._4_4_ * (float)local_420._4_4_;
          fStack_718 = fStack_718 + auVar143._8_4_ * fStack_418;
          fStack_714 = fStack_714 + auVar143._12_4_ * fStack_414;
          fStack_710 = fStack_710 + auVar143._16_4_ * fStack_410;
          fStack_70c = fStack_70c + auVar143._20_4_ * fStack_40c;
          fStack_708 = fStack_708 + auVar143._24_4_ * fStack_408;
          fStack_704 = fStack_704 + auVar143._28_4_;
          fVar189 = local_778->depth_scale;
          auVar105._4_4_ = ((float)local_720._4_4_ + (float)local_720._4_4_) * fVar189;
          auVar105._0_4_ = ((float)local_720._0_4_ + (float)local_720._0_4_) * fVar189;
          auVar105._8_4_ = (fStack_718 + fStack_718) * fVar189;
          auVar105._12_4_ = (fStack_714 + fStack_714) * fVar189;
          auVar105._16_4_ = (fStack_710 + fStack_710) * fVar189;
          auVar105._20_4_ = (fStack_70c + fStack_70c) * fVar189;
          auVar105._24_4_ = (fStack_708 + fStack_708) * fVar189;
          auVar105._28_4_ = fStack_704 + fStack_704;
          auVar143 = vcmpps_avx(local_300,auVar105,6);
          auVar26 = auVar221 & auVar143;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) goto LAB_00904f75;
          local_320._0_4_ = (float)local_320._0_4_ + (float)local_320._0_4_ + -1.0;
          local_320._4_4_ = (float)local_320._4_4_ + (float)local_320._4_4_ + -1.0;
          uStack_318._0_4_ = (float)uStack_318 + (float)uStack_318 + -1.0;
          uStack_318._4_4_ = uStack_318._4_4_ + uStack_318._4_4_ + -1.0;
          uStack_310._0_4_ = (float)uStack_310 + (float)uStack_310 + -1.0;
          uStack_310._4_4_ = uStack_310._4_4_ + uStack_310._4_4_ + -1.0;
          uStack_308._0_4_ = (float)uStack_308 + (float)uStack_308 + -1.0;
          uStack_308._4_4_ = uStack_308._4_4_ + uStack_308._4_4_ + -1.0;
          local_220 = _local_420;
          auVar114 = _local_320;
          auVar26 = _local_320;
          local_200 = (float)local_320._0_4_;
          fStack_1fc = (float)local_320._4_4_;
          fStack_1f8 = (float)uStack_318;
          fStack_1f4 = uStack_318._4_4_;
          fStack_1f0 = (float)uStack_310;
          fStack_1ec = uStack_310._4_4_;
          fStack_1e8 = (float)uStack_308;
          fStack_1e4 = uStack_308._4_4_;
          local_1e0 = local_300;
          local_1bc = uVar123;
          local_1b0 = local_790;
          uStack_1a8 = uStack_788;
          local_1a0 = local_6c0;
          uStack_198 = uStack_6b8;
          local_190 = local_6d0;
          uStack_188 = uStack_6c8;
          local_180 = local_6b0;
          uStack_178 = uStack_6a8;
          pGVar124 = (context->scene->geometries).items[local_7a8].ptr;
          if ((pGVar124->mask & (ray->super_RayK<1>).mask) != 0) {
            auVar143 = vandps_avx(auVar143,auVar221);
            local_460[0] = auVar143;
            auVar196._0_4_ = (float)(int)local_1c0;
            auVar196._4_12_ = auVar310;
            auVar250 = vshufps_avx(auVar196,auVar196,0);
            local_140[0] = (auVar250._0_4_ + (float)local_420._0_4_ + 0.0) * (float)local_2c0._0_4_;
            local_140[1] = (auVar250._4_4_ + (float)local_420._4_4_ + 1.0) * (float)local_2c0._4_4_;
            local_140[2] = (auVar250._8_4_ + fStack_418 + 2.0) * fStack_2b8;
            local_140[3] = (auVar250._12_4_ + fStack_414 + 3.0) * fStack_2b4;
            fStack_130 = (auVar250._0_4_ + fStack_410 + 4.0) * fStack_2b0;
            fStack_12c = (auVar250._4_4_ + fStack_40c + 5.0) * fStack_2ac;
            fStack_128 = (auVar250._8_4_ + fStack_408 + 6.0) * fStack_2a8;
            fStack_124 = auVar250._12_4_ + fStack_404 + 7.0;
            uStack_310 = auVar114._16_8_;
            uStack_308 = auVar26._24_8_;
            local_120 = local_320;
            uStack_118 = uStack_318;
            uStack_110 = uStack_310;
            uStack_108 = uStack_308;
            local_100 = local_300;
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar24 = vblendvps_avx(auVar172,local_300,auVar143);
            auVar25 = vshufps_avx(auVar24,auVar24,0xb1);
            auVar25 = vminps_avx(auVar24,auVar25);
            auVar31 = vshufpd_avx(auVar25,auVar25,5);
            auVar25 = vminps_avx(auVar25,auVar31);
            auVar31 = vperm2f128_avx(auVar25,auVar25,1);
            auVar25 = vminps_avx(auVar25,auVar31);
            auVar24 = vcmpps_avx(auVar24,auVar25,0);
            auVar25 = auVar143 & auVar24;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar143 = vandps_avx(auVar24,auVar143);
            }
            uVar116 = vmovmskps_avx(auVar143);
            uVar119 = 0;
            if (uVar116 != 0) {
              for (; (uVar116 >> uVar119 & 1) == 0; uVar119 = uVar119 + 1) {
              }
            }
            uVar118 = (ulong)uVar119;
            _local_320 = auVar26;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar124->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_660._8_24_ = auVar284._8_24_;
              _local_720 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              local_740._0_8_ = pGVar124;
              do {
                local_5a4 = local_140[uVar118];
                local_5a0 = *(undefined4 *)((long)&local_120 + uVar118 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_100 + uVar118 * 4);
                local_770.context = context->user;
                fVar149 = 1.0 - local_5a4;
                fVar128 = local_5a4 * fVar149 + local_5a4 * fVar149;
                auVar250 = ZEXT416((uint)(local_5a4 * local_5a4 * 3.0));
                auVar250 = vshufps_avx(auVar250,auVar250,0);
                auVar197 = ZEXT416((uint)((fVar128 - local_5a4 * local_5a4) * 3.0));
                auVar197 = vshufps_avx(auVar197,auVar197,0);
                auVar234 = ZEXT416((uint)((fVar149 * fVar149 - fVar128) * 3.0));
                auVar234 = vshufps_avx(auVar234,auVar234,0);
                auVar218 = ZEXT416((uint)(fVar149 * fVar149 * -3.0));
                auVar218 = vshufps_avx(auVar218,auVar218,0);
                auVar199._0_4_ =
                     auVar218._0_4_ * (float)local_790._0_4_ +
                     auVar234._0_4_ * (float)local_6c0._0_4_ +
                     auVar250._0_4_ * (float)local_6b0._0_4_ +
                     auVar197._0_4_ * (float)local_6d0._0_4_;
                auVar199._4_4_ =
                     auVar218._4_4_ * (float)local_790._4_4_ +
                     auVar234._4_4_ * (float)local_6c0._4_4_ +
                     auVar250._4_4_ * (float)local_6b0._4_4_ +
                     auVar197._4_4_ * (float)local_6d0._4_4_;
                auVar199._8_4_ =
                     auVar218._8_4_ * (float)uStack_788 +
                     auVar234._8_4_ * (float)uStack_6b8 +
                     auVar250._8_4_ * (float)uStack_6a8 + auVar197._8_4_ * (float)uStack_6c8;
                auVar199._12_4_ =
                     auVar218._12_4_ * uStack_788._4_4_ +
                     auVar234._12_4_ * uStack_6b8._4_4_ +
                     auVar250._12_4_ * uStack_6a8._4_4_ + auVar197._12_4_ * uStack_6c8._4_4_;
                local_5b0 = vmovlps_avx(auVar199);
                local_5a8 = vextractps_avx(auVar199,2);
                local_59c = (int)local_798;
                local_598 = (int)local_7a8;
                local_594 = (local_770.context)->instID[0];
                local_590 = (local_770.context)->instPrimID[0];
                local_7b4 = -1;
                local_770.valid = &local_7b4;
                local_770.geometryUserPtr = pGVar124->userPtr;
                local_770.ray = (RTCRayN *)ray;
                local_770.hit = (RTCHitN *)&local_5b0;
                local_770.N = 1;
                if (pGVar124->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_009053ce:
                  p_Var15 = context->args->filter;
                  if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar124->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var15)(&local_770);
                    ray = local_7b0;
                    pGVar124 = (Geometry *)local_740._0_8_;
                    if (*local_770.valid == 0) goto LAB_00905461;
                  }
                  (((Vec3f *)((long)local_770.ray + 0x30))->field_0).components[0] =
                       *(float *)local_770.hit;
                  (((Vec3f *)((long)local_770.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_770.hit + 4);
                  (((Vec3f *)((long)local_770.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_770.hit + 8);
                  *(float *)((long)local_770.ray + 0x3c) = *(float *)(local_770.hit + 0xc);
                  *(float *)((long)local_770.ray + 0x40) = *(float *)(local_770.hit + 0x10);
                  *(float *)((long)local_770.ray + 0x44) = *(float *)(local_770.hit + 0x14);
                  *(float *)((long)local_770.ray + 0x48) = *(float *)(local_770.hit + 0x18);
                  *(float *)((long)local_770.ray + 0x4c) = *(float *)(local_770.hit + 0x1c);
                  *(float *)((long)local_770.ray + 0x50) = *(float *)(local_770.hit + 0x20);
                }
                else {
                  (*pGVar124->intersectionFilterN)(&local_770);
                  ray = local_7b0;
                  pGVar124 = (Geometry *)local_740._0_8_;
                  if (*local_770.valid != 0) goto LAB_009053ce;
LAB_00905461:
                  (local_7b0->super_RayK<1>).tfar = (float)local_720._0_4_;
                  ray = local_7b0;
                  pGVar124 = (Geometry *)local_740._0_8_;
                }
                *(undefined4 *)(local_460[0] + uVar118 * 4) = 0;
                auVar24 = local_460[0];
                fVar128 = (ray->super_RayK<1>).tfar;
                auVar147._4_4_ = fVar128;
                auVar147._0_4_ = fVar128;
                auVar147._8_4_ = fVar128;
                auVar147._12_4_ = fVar128;
                auVar147._16_4_ = fVar128;
                auVar147._20_4_ = fVar128;
                auVar147._24_4_ = fVar128;
                auVar147._28_4_ = fVar128;
                auVar26 = vcmpps_avx(local_300,auVar147,2);
                auVar143 = vandps_avx(auVar26,local_460[0]);
                local_460[0] = auVar143;
                auVar24 = auVar24 & auVar26;
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar24 >> 0x7f,0) == '\0') &&
                      (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar24 >> 0xbf,0) == '\0') &&
                    (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar24[0x1f]) goto LAB_00905501;
                auVar173._8_4_ = 0x7f800000;
                auVar173._0_8_ = 0x7f8000007f800000;
                auVar173._12_4_ = 0x7f800000;
                auVar173._16_4_ = 0x7f800000;
                auVar173._20_4_ = 0x7f800000;
                auVar173._24_4_ = 0x7f800000;
                auVar173._28_4_ = 0x7f800000;
                auVar26 = vblendvps_avx(auVar173,local_300,auVar143);
                auVar24 = vshufps_avx(auVar26,auVar26,0xb1);
                auVar24 = vminps_avx(auVar26,auVar24);
                auVar25 = vshufpd_avx(auVar24,auVar24,5);
                auVar24 = vminps_avx(auVar24,auVar25);
                auVar25 = vperm2f128_avx(auVar24,auVar24,1);
                auVar24 = vminps_avx(auVar24,auVar25);
                auVar26 = vcmpps_avx(auVar26,auVar24,0);
                auVar24 = auVar143 & auVar26;
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar24 >> 0x7f,0) != '\0') ||
                      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0xbf,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar24[0x1f] < '\0') {
                  auVar143 = vandps_avx(auVar26,auVar143);
                }
                _local_720 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar116 = vmovmskps_avx(auVar143);
                uVar119 = 0;
                if (uVar116 != 0) {
                  for (; (uVar116 >> uVar119 & 1) == 0; uVar119 = uVar119 + 1) {
                  }
                }
                uVar118 = (ulong)uVar119;
              } while( true );
            }
            fVar128 = local_140[uVar118];
            fVar149 = *(float *)((long)&local_120 + uVar118 * 4);
            fVar153 = 1.0 - fVar128;
            fVar151 = fVar128 * fVar153 + fVar128 * fVar153;
            auVar250 = ZEXT416((uint)(fVar128 * fVar128 * 3.0));
            auVar250 = vshufps_avx(auVar250,auVar250,0);
            auVar197 = ZEXT416((uint)((fVar151 - fVar128 * fVar128) * 3.0));
            auVar197 = vshufps_avx(auVar197,auVar197,0);
            auVar234 = ZEXT416((uint)((fVar153 * fVar153 - fVar151) * 3.0));
            auVar234 = vshufps_avx(auVar234,auVar234,0);
            auVar218 = ZEXT416((uint)(fVar153 * fVar153 * -3.0));
            auVar218 = vshufps_avx(auVar218,auVar218,0);
            auVar198._0_4_ =
                 auVar218._0_4_ * (float)local_790._0_4_ +
                 auVar234._0_4_ * (float)local_6c0._0_4_ +
                 auVar250._0_4_ * (float)local_6b0._0_4_ + auVar197._0_4_ * (float)local_6d0._0_4_;
            auVar198._4_4_ =
                 auVar218._4_4_ * (float)local_790._4_4_ +
                 auVar234._4_4_ * (float)local_6c0._4_4_ +
                 auVar250._4_4_ * (float)local_6b0._4_4_ + auVar197._4_4_ * (float)local_6d0._4_4_;
            auVar198._8_4_ =
                 auVar218._8_4_ * (float)uStack_788 +
                 auVar234._8_4_ * (float)uStack_6b8 +
                 auVar250._8_4_ * (float)uStack_6a8 + auVar197._8_4_ * (float)uStack_6c8;
            auVar198._12_4_ =
                 auVar218._12_4_ * uStack_788._4_4_ +
                 auVar234._12_4_ * uStack_6b8._4_4_ +
                 auVar250._12_4_ * uStack_6a8._4_4_ + auVar197._12_4_ * uStack_6c8._4_4_;
            (ray->super_RayK<1>).tfar = *(float *)(local_100 + uVar118 * 4);
            uVar10 = vmovlps_avx(auVar198);
            *(undefined8 *)&(ray->Ng).field_0 = uVar10;
            fVar151 = (float)vextractps_avx(auVar198,2);
            (ray->Ng).field_0.field_0.z = fVar151;
            ray->u = fVar128;
            ray->v = fVar149;
            ray->primID = (uint)local_798;
            ray->geomID = (uint)local_7a8;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            goto LAB_009051fd;
          }
          goto LAB_00905214;
        }
        auVar287 = ZEXT3264(local_700);
        auVar299 = ZEXT3264(local_6a0);
        auVar254 = ZEXT3264(auVar254._0_32_);
        goto LAB_00904f7e;
      }
    }
    fVar128 = (ray->super_RayK<1>).tfar;
    auVar134._4_4_ = fVar128;
    auVar134._0_4_ = fVar128;
    auVar134._8_4_ = fVar128;
    auVar134._12_4_ = fVar128;
    auVar250 = vcmpps_avx(local_230,auVar134,2);
    uVar119 = vmovmskps_avx(auVar250);
    uVar117 = (ulong)((uint)uVar117 & (uint)uVar117 + 0xf & uVar119);
  } while( true );
LAB_00905501:
  auVar287 = ZEXT3264(local_700);
  auVar299 = ZEXT3264(local_6a0);
  fVar190 = (float)local_620._0_4_;
  fVar205 = (float)local_620._4_4_;
  fVar208 = fStack_618;
  fVar211 = fStack_614;
  fVar213 = fStack_610;
  fVar222 = fStack_60c;
  fVar224 = fStack_608;
  fVar226 = fStack_604;
  fVar162 = (float)local_680._0_4_;
  fVar176 = (float)local_680._4_4_;
  fVar178 = fStack_678;
  fVar180 = fStack_674;
  fVar246 = fStack_670;
  fVar255 = fStack_66c;
  fVar258 = fStack_668;
  fVar214 = (float)local_640._0_4_;
  fVar223 = (float)local_640._4_4_;
  fVar225 = fStack_638;
  fVar227 = fStack_634;
  fVar259 = fStack_630;
  fVar264 = fStack_62c;
  fVar266 = fStack_628;
LAB_009051fd:
  prim = local_780;
LAB_00905214:
  auVar254 = ZEXT3264(_local_600);
  fVar161 = (float)local_5e0._0_4_;
  fVar175 = (float)local_5e0._4_4_;
  fVar177 = fStack_5d8;
  fVar179 = fStack_5d4;
  fVar128 = fStack_5d0;
  fVar149 = fStack_5cc;
  fVar151 = fStack_5c8;
  fVar153 = fStack_5c4;
LAB_00904f7e:
  lVar121 = lVar121 + 8;
  lVar120 = local_660._0_8_;
  fVar312 = (float)local_480._0_4_;
  fVar314 = (float)local_480._4_4_;
  fVar315 = fStack_478;
  fVar129 = fStack_474;
  fVar189 = fStack_470;
  fVar204 = fStack_46c;
  fVar207 = fStack_468;
  fVar210 = fStack_464;
  goto LAB_00904664;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }